

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx512::CurveNiMBIntersectorK<4,16>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::BSplineCurveT,16,8>,embree::avx512::Intersect1KEpilogMU<8,16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  uint uVar7;
  int iVar8;
  undefined4 uVar9;
  __int_type_conflict _Var10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined8 uVar35;
  ulong uVar36;
  long lVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  int iVar73;
  int iVar74;
  int iVar75;
  int iVar76;
  int iVar77;
  int iVar78;
  int iVar79;
  int iVar80;
  int iVar81;
  int iVar82;
  int iVar83;
  int iVar84;
  int iVar85;
  undefined1 auVar86 [32];
  Geometry *pGVar87;
  byte bVar88;
  ulong uVar89;
  uint uVar90;
  uint uVar91;
  long lVar92;
  long lVar93;
  Geometry *pGVar94;
  uint uVar95;
  ulong uVar96;
  byte bVar97;
  ulong uVar98;
  float fVar99;
  float fVar100;
  float fVar153;
  float fVar155;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  float fVar154;
  float fVar156;
  float fVar158;
  float fVar159;
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar111 [16];
  float fVar157;
  float fVar160;
  float fVar161;
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [64];
  float fVar162;
  undefined4 uVar163;
  float fVar180;
  float fVar181;
  vint4 bi_2;
  float fVar182;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [64];
  float fVar183;
  undefined8 uVar184;
  vint4 bi_1;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [32];
  float fVar190;
  float fVar191;
  float fVar203;
  vint4 bi;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  vint4 ai_2;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [64];
  vint4 ai_1;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [64];
  vint4 ai;
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [64];
  float fVar236;
  float fVar237;
  undefined1 auVar234 [16];
  undefined1 auVar235 [64];
  undefined1 auVar238 [16];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar246 [32];
  undefined1 auVar250 [64];
  undefined1 auVar251 [16];
  undefined1 auVar252 [64];
  RTCFilterFunctionNArguments args;
  vint<16> mask;
  undefined8 local_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 local_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  RTCFilterFunctionNArguments local_848;
  Geometry *local_818;
  undefined1 (*local_810) [32];
  LinearSpace3fa *local_808;
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined4 local_7a0;
  undefined4 uStack_79c;
  undefined4 uStack_798;
  undefined4 uStack_794;
  undefined4 uStack_790;
  undefined4 uStack_78c;
  undefined4 uStack_788;
  undefined4 uStack_784;
  undefined1 local_780 [64];
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  undefined4 uStack_724;
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined4 local_5e0;
  int local_5dc;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  float local_580 [4];
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_510 [16];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  undefined1 local_400 [64];
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  undefined1 auVar247 [32];
  
  PVar6 = prim[1];
  uVar89 = (ulong)(byte)PVar6;
  lVar37 = uVar89 * 0x25;
  fVar162 = *(float *)(prim + lVar37 + 0x12);
  auVar101 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           0x10);
  auVar101 = vinsertps_avx(auVar101,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar102 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar102 = vinsertps_avx(auVar102,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar101 = vsubps_avx(auVar101,*(undefined1 (*) [16])(prim + lVar37 + 6));
  auVar204._0_4_ = fVar162 * auVar101._0_4_;
  auVar204._4_4_ = fVar162 * auVar101._4_4_;
  auVar204._8_4_ = fVar162 * auVar101._8_4_;
  auVar204._12_4_ = fVar162 * auVar101._12_4_;
  auVar101 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 * 4 + 6)));
  auVar111._0_4_ = fVar162 * auVar102._0_4_;
  auVar111._4_4_ = fVar162 * auVar102._4_4_;
  auVar111._8_4_ = fVar162 * auVar102._8_4_;
  auVar111._12_4_ = fVar162 * auVar102._12_4_;
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar102 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 * 5 + 6)));
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar108 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 * 6 + 6)));
  auVar27 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 * 0xf + 6)));
  auVar108 = vcvtdq2ps_avx(auVar108);
  auVar27 = vcvtdq2ps_avx(auVar27);
  auVar28 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar28 = vcvtdq2ps_avx(auVar28);
  auVar29 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar89 + 6)));
  auVar29 = vcvtdq2ps_avx(auVar29);
  auVar30 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 * 0x1a + 6)));
  auVar30 = vcvtdq2ps_avx(auVar30);
  auVar31 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 * 0x1b + 6)));
  auVar31 = vcvtdq2ps_avx(auVar31);
  auVar32 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 * 0x1c + 6)));
  auVar32 = vcvtdq2ps_avx(auVar32);
  auVar223._4_4_ = auVar111._0_4_;
  auVar223._0_4_ = auVar111._0_4_;
  auVar223._8_4_ = auVar111._0_4_;
  auVar223._12_4_ = auVar111._0_4_;
  auVar33 = vshufps_avx(auVar111,auVar111,0x55);
  auVar34 = vshufps_avx(auVar111,auVar111,0xaa);
  fVar162 = auVar34._0_4_;
  auVar192._0_4_ = fVar162 * auVar108._0_4_;
  fVar180 = auVar34._4_4_;
  auVar192._4_4_ = fVar180 * auVar108._4_4_;
  fVar181 = auVar34._8_4_;
  auVar192._8_4_ = fVar181 * auVar108._8_4_;
  fVar182 = auVar34._12_4_;
  auVar192._12_4_ = fVar182 * auVar108._12_4_;
  auVar185._0_4_ = auVar29._0_4_ * fVar162;
  auVar185._4_4_ = auVar29._4_4_ * fVar180;
  auVar185._8_4_ = auVar29._8_4_ * fVar181;
  auVar185._12_4_ = auVar29._12_4_ * fVar182;
  auVar164._0_4_ = auVar32._0_4_ * fVar162;
  auVar164._4_4_ = auVar32._4_4_ * fVar180;
  auVar164._8_4_ = auVar32._8_4_ * fVar181;
  auVar164._12_4_ = auVar32._12_4_ * fVar182;
  auVar34 = vfmadd231ps_fma(auVar192,auVar33,auVar102);
  auVar106 = vfmadd231ps_fma(auVar185,auVar33,auVar28);
  auVar33 = vfmadd231ps_fma(auVar164,auVar31,auVar33);
  auVar107 = vfmadd231ps_fma(auVar34,auVar223,auVar101);
  auVar106 = vfmadd231ps_fma(auVar106,auVar223,auVar27);
  auVar109 = vfmadd231ps_fma(auVar33,auVar30,auVar223);
  auVar244._4_4_ = auVar204._0_4_;
  auVar244._0_4_ = auVar204._0_4_;
  auVar244._8_4_ = auVar204._0_4_;
  auVar244._12_4_ = auVar204._0_4_;
  auVar33 = vshufps_avx(auVar204,auVar204,0x55);
  auVar34 = vshufps_avx(auVar204,auVar204,0xaa);
  fVar162 = auVar34._0_4_;
  auVar224._0_4_ = fVar162 * auVar108._0_4_;
  fVar180 = auVar34._4_4_;
  auVar224._4_4_ = fVar180 * auVar108._4_4_;
  fVar181 = auVar34._8_4_;
  auVar224._8_4_ = fVar181 * auVar108._8_4_;
  fVar182 = auVar34._12_4_;
  auVar224._12_4_ = fVar182 * auVar108._12_4_;
  auVar210._0_4_ = auVar29._0_4_ * fVar162;
  auVar210._4_4_ = auVar29._4_4_ * fVar180;
  auVar210._8_4_ = auVar29._8_4_ * fVar181;
  auVar210._12_4_ = auVar29._12_4_ * fVar182;
  auVar205._0_4_ = auVar32._0_4_ * fVar162;
  auVar205._4_4_ = auVar32._4_4_ * fVar180;
  auVar205._8_4_ = auVar32._8_4_ * fVar181;
  auVar205._12_4_ = auVar32._12_4_ * fVar182;
  auVar102 = vfmadd231ps_fma(auVar224,auVar33,auVar102);
  auVar108 = vfmadd231ps_fma(auVar210,auVar33,auVar28);
  auVar28 = vfmadd231ps_fma(auVar205,auVar33,auVar31);
  auVar110 = vfmadd231ps_fma(auVar102,auVar244,auVar101);
  auVar111 = vfmadd231ps_fma(auVar108,auVar244,auVar27);
  auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar252 = ZEXT1664(auVar101);
  auVar164 = vfmadd231ps_fma(auVar28,auVar244,auVar30);
  auVar102 = vandps_avx512vl(auVar107,auVar101);
  auVar231._8_4_ = 0x219392ef;
  auVar231._0_8_ = 0x219392ef219392ef;
  auVar231._12_4_ = 0x219392ef;
  uVar96 = vcmpps_avx512vl(auVar102,auVar231,1);
  bVar13 = (bool)((byte)uVar96 & 1);
  auVar103._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar107._0_4_;
  bVar13 = (bool)((byte)(uVar96 >> 1) & 1);
  auVar103._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar107._4_4_;
  bVar13 = (bool)((byte)(uVar96 >> 2) & 1);
  auVar103._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar107._8_4_;
  bVar13 = (bool)((byte)(uVar96 >> 3) & 1);
  auVar103._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar107._12_4_;
  auVar102 = vandps_avx512vl(auVar106,auVar101);
  uVar96 = vcmpps_avx512vl(auVar102,auVar231,1);
  bVar13 = (bool)((byte)uVar96 & 1);
  auVar104._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar106._0_4_;
  bVar13 = (bool)((byte)(uVar96 >> 1) & 1);
  auVar104._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar106._4_4_;
  bVar13 = (bool)((byte)(uVar96 >> 2) & 1);
  auVar104._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar106._8_4_;
  bVar13 = (bool)((byte)(uVar96 >> 3) & 1);
  auVar104._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar106._12_4_;
  auVar101 = vandps_avx512vl(auVar109,auVar101);
  uVar96 = vcmpps_avx512vl(auVar101,auVar231,1);
  bVar13 = (bool)((byte)uVar96 & 1);
  auVar105._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar109._0_4_;
  bVar13 = (bool)((byte)(uVar96 >> 1) & 1);
  auVar105._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar109._4_4_;
  bVar13 = (bool)((byte)(uVar96 >> 2) & 1);
  auVar105._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar109._8_4_;
  bVar13 = (bool)((byte)(uVar96 >> 3) & 1);
  auVar105._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar109._12_4_;
  auVar102 = vrcp14ps_avx512vl(auVar103);
  auVar232._8_4_ = 0x3f800000;
  auVar232._0_8_ = 0x3f8000003f800000;
  auVar232._12_4_ = 0x3f800000;
  auVar101 = vfnmadd213ps_fma(auVar103,auVar102,auVar232);
  auVar107 = vfmadd132ps_fma(auVar101,auVar102,auVar102);
  auVar102 = vrcp14ps_avx512vl(auVar104);
  auVar101 = vfnmadd213ps_fma(auVar104,auVar102,auVar232);
  auVar109 = vfmadd132ps_fma(auVar101,auVar102,auVar102);
  auVar102 = vrcp14ps_avx512vl(auVar105);
  auVar101 = vfnmadd213ps_fma(auVar105,auVar102,auVar232);
  auVar251 = vfmadd132ps_fma(auVar101,auVar102,auVar102);
  fVar162 = (*(float *)(ray + k * 4 + 0x1c0) - *(float *)(prim + lVar37 + 0x16)) *
            *(float *)(prim + lVar37 + 0x1a);
  auVar229._4_4_ = fVar162;
  auVar229._0_4_ = fVar162;
  auVar229._8_4_ = fVar162;
  auVar229._12_4_ = fVar162;
  auVar101._8_8_ = 0;
  auVar101._0_8_ = *(ulong *)(prim + uVar89 * 7 + 6);
  auVar101 = vpmovsxwd_avx(auVar101);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar102._8_8_ = 0;
  auVar102._0_8_ = *(ulong *)(prim + uVar89 * 0xb + 6);
  auVar102 = vpmovsxwd_avx(auVar102);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar27 = vsubps_avx(auVar102,auVar101);
  auVar108._8_8_ = 0;
  auVar108._0_8_ = *(ulong *)(prim + uVar89 * 9 + 6);
  auVar102 = vpmovsxwd_avx(auVar108);
  auVar108 = vfmadd213ps_fma(auVar27,auVar229,auVar101);
  auVar101 = vcvtdq2ps_avx(auVar102);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + uVar89 * 0xd + 6);
  auVar102 = vpmovsxwd_avx(auVar27);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar102 = vsubps_avx(auVar102,auVar101);
  auVar27 = vfmadd213ps_fma(auVar102,auVar229,auVar101);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + uVar89 * 0x12 + 6);
  auVar101 = vpmovsxwd_avx(auVar28);
  auVar101 = vcvtdq2ps_avx(auVar101);
  uVar96 = (ulong)(uint)((int)(uVar89 * 5) << 2);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + uVar89 * 2 + uVar96 + 6);
  auVar102 = vpmovsxwd_avx(auVar29);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar102 = vsubps_avx(auVar102,auVar101);
  auVar28 = vfmadd213ps_fma(auVar102,auVar229,auVar101);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(prim + uVar96 + 6);
  auVar101 = vpmovsxwd_avx(auVar30);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = *(ulong *)(prim + uVar89 * 0x18 + 6);
  auVar102 = vpmovsxwd_avx(auVar31);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar102 = vsubps_avx(auVar102,auVar101);
  auVar29 = vfmadd213ps_fma(auVar102,auVar229,auVar101);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = *(ulong *)(prim + uVar89 * 0x1d + 6);
  auVar101 = vpmovsxwd_avx(auVar32);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = *(ulong *)(prim + uVar89 + (ulong)(byte)PVar6 * 0x20 + 6);
  auVar102 = vpmovsxwd_avx(auVar33);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar102 = vsubps_avx(auVar102,auVar101);
  auVar30 = vfmadd213ps_fma(auVar102,auVar229,auVar101);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar6 * 0x20 - uVar89) + 6);
  auVar101 = vpmovsxwd_avx(auVar34);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar106._8_8_ = 0;
  auVar106._0_8_ = *(ulong *)(prim + uVar89 * 0x23 + 6);
  auVar102 = vpmovsxwd_avx(auVar106);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar102 = vsubps_avx(auVar102,auVar101);
  auVar102 = vfmadd213ps_fma(auVar102,auVar229,auVar101);
  auVar101 = vsubps_avx(auVar108,auVar110);
  auVar230._0_4_ = auVar107._0_4_ * auVar101._0_4_;
  auVar230._4_4_ = auVar107._4_4_ * auVar101._4_4_;
  auVar230._8_4_ = auVar107._8_4_ * auVar101._8_4_;
  auVar230._12_4_ = auVar107._12_4_ * auVar101._12_4_;
  auVar101 = vsubps_avx(auVar27,auVar110);
  auVar193._0_4_ = auVar107._0_4_ * auVar101._0_4_;
  auVar193._4_4_ = auVar107._4_4_ * auVar101._4_4_;
  auVar193._8_4_ = auVar107._8_4_ * auVar101._8_4_;
  auVar193._12_4_ = auVar107._12_4_ * auVar101._12_4_;
  auVar101 = vsubps_avx(auVar28,auVar111);
  auVar225._0_4_ = auVar109._0_4_ * auVar101._0_4_;
  auVar225._4_4_ = auVar109._4_4_ * auVar101._4_4_;
  auVar225._8_4_ = auVar109._8_4_ * auVar101._8_4_;
  auVar225._12_4_ = auVar109._12_4_ * auVar101._12_4_;
  auVar101 = vsubps_avx(auVar29,auVar111);
  auVar186._0_4_ = auVar109._0_4_ * auVar101._0_4_;
  auVar186._4_4_ = auVar109._4_4_ * auVar101._4_4_;
  auVar186._8_4_ = auVar109._8_4_ * auVar101._8_4_;
  auVar186._12_4_ = auVar109._12_4_ * auVar101._12_4_;
  auVar101 = vsubps_avx(auVar30,auVar164);
  auVar211._0_4_ = auVar251._0_4_ * auVar101._0_4_;
  auVar211._4_4_ = auVar251._4_4_ * auVar101._4_4_;
  auVar211._8_4_ = auVar251._8_4_ * auVar101._8_4_;
  auVar211._12_4_ = auVar251._12_4_ * auVar101._12_4_;
  auVar101 = vsubps_avx(auVar102,auVar164);
  auVar165._0_4_ = auVar251._0_4_ * auVar101._0_4_;
  auVar165._4_4_ = auVar251._4_4_ * auVar101._4_4_;
  auVar165._8_4_ = auVar251._8_4_ * auVar101._8_4_;
  auVar165._12_4_ = auVar251._12_4_ * auVar101._12_4_;
  auVar101 = vpminsd_avx(auVar230,auVar193);
  auVar102 = vpminsd_avx(auVar225,auVar186);
  auVar101 = vmaxps_avx(auVar101,auVar102);
  auVar102 = vpminsd_avx(auVar211,auVar165);
  uVar163 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar107._4_4_ = uVar163;
  auVar107._0_4_ = uVar163;
  auVar107._8_4_ = uVar163;
  auVar107._12_4_ = uVar163;
  auVar102 = vmaxps_avx512vl(auVar102,auVar107);
  auVar101 = vmaxps_avx(auVar101,auVar102);
  auVar109._8_4_ = 0x3f7ffffa;
  auVar109._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar109._12_4_ = 0x3f7ffffa;
  local_510 = vmulps_avx512vl(auVar101,auVar109);
  auVar101 = vpmaxsd_avx(auVar230,auVar193);
  auVar102 = vpmaxsd_avx(auVar225,auVar186);
  auVar101 = vminps_avx(auVar101,auVar102);
  auVar102 = vpmaxsd_avx(auVar211,auVar165);
  uVar163 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar251._4_4_ = uVar163;
  auVar251._0_4_ = uVar163;
  auVar251._8_4_ = uVar163;
  auVar251._12_4_ = uVar163;
  auVar102 = vminps_avx512vl(auVar102,auVar251);
  auVar101 = vminps_avx(auVar101,auVar102);
  auVar110._8_4_ = 0x3f800003;
  auVar110._0_8_ = 0x3f8000033f800003;
  auVar110._12_4_ = 0x3f800003;
  auVar101 = vmulps_avx512vl(auVar101,auVar110);
  auVar102 = vpbroadcastd_avx512vl();
  uVar184 = vcmpps_avx512vl(local_510,auVar101,2);
  uVar96 = vpcmpgtd_avx512vl(auVar102,_DAT_01f7fcf0);
  uVar96 = ((byte)uVar184 & 0xf) & uVar96;
  if ((char)uVar96 != '\0') {
    local_808 = pre->ray_space + k;
    local_810 = (undefined1 (*) [32])local_100;
    auVar179 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_300 = vmovdqa64_avx512f(auVar179);
    auVar179 = ZEXT464(0xbf800000);
    do {
      lVar37 = 0;
      for (uVar89 = uVar96; (uVar89 & 1) == 0; uVar89 = uVar89 >> 1 | 0x8000000000000000) {
        lVar37 = lVar37 + 1;
      }
      uVar95 = *(uint *)(prim + 2);
      uVar7 = *(uint *)(prim + lVar37 * 4 + 6);
      pGVar94 = (context->scene->geometries).items[uVar95].ptr;
      uVar89 = (ulong)*(uint *)(*(long *)&pGVar94->field_0x58 +
                               (ulong)uVar7 *
                               pGVar94[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar162 = (pGVar94->time_range).lower;
      fVar162 = pGVar94->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0x1c0) - fVar162) /
                ((pGVar94->time_range).upper - fVar162));
      auVar101 = vroundss_avx(ZEXT416((uint)fVar162),ZEXT416((uint)fVar162),9);
      auVar102 = vaddss_avx512f(ZEXT416((uint)pGVar94->fnumTimeSegments),auVar179._0_16_);
      auVar101 = vminss_avx(auVar101,auVar102);
      auVar101 = vmaxss_avx(ZEXT816(0) << 0x20,auVar101);
      fVar162 = fVar162 - auVar101._0_4_;
      _Var10 = pGVar94[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar93 = (long)(int)auVar101._0_4_ * 0x38;
      lVar37 = *(long *)(_Var10 + 0x10 + lVar93);
      lVar92 = *(long *)(_Var10 + 0x38 + lVar93);
      lVar11 = *(long *)(_Var10 + 0x48 + lVar93);
      auVar187._4_4_ = fVar162;
      auVar187._0_4_ = fVar162;
      auVar187._8_4_ = fVar162;
      auVar187._12_4_ = fVar162;
      pfVar3 = (float *)(lVar92 + uVar89 * lVar11);
      auVar234._0_4_ = fVar162 * *pfVar3;
      auVar234._4_4_ = fVar162 * pfVar3[1];
      auVar234._8_4_ = fVar162 * pfVar3[2];
      auVar234._12_4_ = fVar162 * pfVar3[3];
      pfVar3 = (float *)(lVar92 + (uVar89 + 1) * lVar11);
      auVar238._0_4_ = fVar162 * *pfVar3;
      auVar238._4_4_ = fVar162 * pfVar3[1];
      auVar238._8_4_ = fVar162 * pfVar3[2];
      auVar238._12_4_ = fVar162 * pfVar3[3];
      auVar101 = vmulps_avx512vl(auVar187,*(undefined1 (*) [16])(lVar92 + (uVar89 + 2) * lVar11));
      auVar102 = vmulps_avx512vl(auVar187,*(undefined1 (*) [16])(lVar92 + lVar11 * (uVar89 + 3)));
      lVar92 = *(long *)(_Var10 + lVar93);
      fVar162 = 1.0 - fVar162;
      auVar166._4_4_ = fVar162;
      auVar166._0_4_ = fVar162;
      auVar166._8_4_ = fVar162;
      auVar166._12_4_ = fVar162;
      auVar27 = vfmadd231ps_fma(auVar234,auVar166,*(undefined1 (*) [16])(lVar92 + lVar37 * uVar89));
      auVar28 = vfmadd231ps_fma(auVar238,auVar166,
                                *(undefined1 (*) [16])(lVar92 + lVar37 * (uVar89 + 1)));
      auVar106 = vfmadd231ps_avx512vl
                           (auVar101,auVar166,*(undefined1 (*) [16])(lVar92 + lVar37 * (uVar89 + 2))
                           );
      auVar107 = vfmadd231ps_avx512vl
                           (auVar102,auVar166,*(undefined1 (*) [16])(lVar92 + lVar37 * (uVar89 + 3))
                           );
      iVar8 = (int)pGVar94[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar101 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x1c);
      lVar37 = (long)iVar8 * 0x44;
      auVar101 = vinsertps_avx(auVar101,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
      auVar108 = vsubps_avx(auVar27,auVar101);
      uVar163 = auVar108._0_4_;
      auVar194._4_4_ = uVar163;
      auVar194._0_4_ = uVar163;
      auVar194._8_4_ = uVar163;
      auVar194._12_4_ = uVar163;
      auVar102 = vshufps_avx(auVar108,auVar108,0x55);
      aVar4 = (local_808->vx).field_0;
      aVar5 = (local_808->vy).field_0;
      fVar162 = (local_808->vz).field_0.m128[0];
      fVar180 = *(float *)((long)&(local_808->vz).field_0 + 4);
      fVar181 = *(float *)((long)&(local_808->vz).field_0 + 8);
      fVar182 = *(float *)((long)&(local_808->vz).field_0 + 0xc);
      auVar108 = vshufps_avx(auVar108,auVar108,0xaa);
      auVar241._0_4_ = fVar162 * auVar108._0_4_;
      auVar241._4_4_ = fVar180 * auVar108._4_4_;
      auVar241._8_4_ = fVar181 * auVar108._8_4_;
      auVar241._12_4_ = fVar182 * auVar108._12_4_;
      auVar102 = vfmadd231ps_fma(auVar241,(undefined1  [16])aVar5,auVar102);
      auVar29 = vfmadd231ps_fma(auVar102,(undefined1  [16])aVar4,auVar194);
      auVar108 = vsubps_avx(auVar28,auVar101);
      uVar163 = auVar108._0_4_;
      auVar195._4_4_ = uVar163;
      auVar195._0_4_ = uVar163;
      auVar195._8_4_ = uVar163;
      auVar195._12_4_ = uVar163;
      auVar102 = vshufps_avx(auVar108,auVar108,0x55);
      auVar108 = vshufps_avx(auVar108,auVar108,0xaa);
      auVar242._0_4_ = fVar162 * auVar108._0_4_;
      auVar242._4_4_ = fVar180 * auVar108._4_4_;
      auVar242._8_4_ = fVar181 * auVar108._8_4_;
      auVar242._12_4_ = fVar182 * auVar108._12_4_;
      auVar102 = vfmadd231ps_fma(auVar242,(undefined1  [16])aVar5,auVar102);
      auVar30 = vfmadd231ps_fma(auVar102,(undefined1  [16])aVar4,auVar195);
      auVar108 = vsubps_avx512vl(auVar106,auVar101);
      uVar163 = auVar108._0_4_;
      auVar196._4_4_ = uVar163;
      auVar196._0_4_ = uVar163;
      auVar196._8_4_ = uVar163;
      auVar196._12_4_ = uVar163;
      auVar102 = vshufps_avx(auVar108,auVar108,0x55);
      auVar108 = vshufps_avx(auVar108,auVar108,0xaa);
      auVar243._0_4_ = fVar162 * auVar108._0_4_;
      auVar243._4_4_ = fVar180 * auVar108._4_4_;
      auVar243._8_4_ = fVar181 * auVar108._8_4_;
      auVar243._12_4_ = fVar182 * auVar108._12_4_;
      auVar102 = vfmadd231ps_fma(auVar243,(undefined1  [16])aVar5,auVar102);
      auVar108 = vfmadd231ps_fma(auVar102,(undefined1  [16])aVar4,auVar196);
      auVar102 = vsubps_avx512vl(auVar107,auVar101);
      uVar163 = auVar102._0_4_;
      auVar188._4_4_ = uVar163;
      auVar188._0_4_ = uVar163;
      auVar188._8_4_ = uVar163;
      auVar188._12_4_ = uVar163;
      auVar101 = vshufps_avx(auVar102,auVar102,0x55);
      auVar102 = vshufps_avx(auVar102,auVar102,0xaa);
      auVar245._0_4_ = fVar162 * auVar102._0_4_;
      auVar245._4_4_ = fVar180 * auVar102._4_4_;
      auVar245._8_4_ = fVar181 * auVar102._8_4_;
      auVar245._12_4_ = fVar182 * auVar102._12_4_;
      auVar101 = vfmadd231ps_fma(auVar245,(undefined1  [16])aVar5,auVar101);
      auVar31 = vfmadd231ps_fma(auVar101,(undefined1  [16])aVar4,auVar188);
      auVar126 = *(undefined1 (*) [32])(bspline_basis0 + lVar37);
      uVar163 = auVar29._0_4_;
      local_660._4_4_ = uVar163;
      local_660._0_4_ = uVar163;
      local_660._8_4_ = uVar163;
      local_660._12_4_ = uVar163;
      local_660._16_4_ = uVar163;
      local_660._20_4_ = uVar163;
      local_660._24_4_ = uVar163;
      local_660._28_4_ = uVar163;
      auVar127 = *(undefined1 (*) [32])(bspline_basis0 + lVar37 + 0x484);
      auVar112._8_4_ = 1;
      auVar112._0_8_ = 0x100000001;
      auVar112._12_4_ = 1;
      auVar112._16_4_ = 1;
      auVar112._20_4_ = 1;
      auVar112._24_4_ = 1;
      auVar112._28_4_ = 1;
      local_680 = vpermps_avx2(auVar112,ZEXT1632(auVar29));
      uVar163 = auVar30._0_4_;
      auVar206._4_4_ = uVar163;
      auVar206._0_4_ = uVar163;
      auVar206._8_4_ = uVar163;
      auVar206._12_4_ = uVar163;
      local_6a0._16_4_ = uVar163;
      local_6a0._0_16_ = auVar206;
      local_6a0._20_4_ = uVar163;
      local_6a0._24_4_ = uVar163;
      local_6a0._28_4_ = uVar163;
      local_6c0 = vpermps_avx512vl(auVar112,ZEXT1632(auVar30));
      auVar125 = *(undefined1 (*) [32])(bspline_basis0 + lVar37 + 0x908);
      local_6e0 = vbroadcastss_avx512vl(auVar108);
      local_700 = vpermps_avx512vl(auVar112,ZEXT1632(auVar108));
      auVar124 = *(undefined1 (*) [32])(bspline_basis0 + lVar37 + 0xd8c);
      uVar163 = auVar31._0_4_;
      local_720._4_4_ = uVar163;
      local_720._0_4_ = uVar163;
      fStack_718 = (float)uVar163;
      fStack_714 = (float)uVar163;
      fStack_710 = (float)uVar163;
      fStack_70c = (float)uVar163;
      fStack_708 = (float)uVar163;
      register0x0000139c = uVar163;
      _local_740 = vpermps_avx512vl(auVar112,ZEXT1632(auVar31));
      auVar112 = vmulps_avx512vl(_local_720,auVar124);
      auVar113 = vmulps_avx512vl(_local_740,auVar124);
      auVar112 = vfmadd231ps_avx512vl(auVar112,auVar125,local_6e0);
      auVar113 = vfmadd231ps_avx512vl(auVar113,auVar125,local_700);
      auVar101 = vfmadd231ps_fma(auVar112,auVar127,local_6a0);
      auVar114 = vfmadd231ps_avx512vl(auVar113,auVar127,local_6c0);
      auVar115 = vfmadd231ps_avx512vl(ZEXT1632(auVar101),auVar126,local_660);
      auVar228 = ZEXT3264(auVar115);
      auVar112 = *(undefined1 (*) [32])(bspline_basis1 + lVar37);
      auVar113 = *(undefined1 (*) [32])(bspline_basis1 + lVar37 + 0x484);
      auVar123 = *(undefined1 (*) [32])(bspline_basis1 + lVar37 + 0x908);
      auVar116 = vfmadd231ps_avx512vl(auVar114,auVar126,local_680);
      auVar222 = ZEXT3264(auVar116);
      auVar114 = *(undefined1 (*) [32])(bspline_basis1 + lVar37 + 0xd8c);
      auVar117 = vmulps_avx512vl(_local_720,auVar114);
      auVar118 = vmulps_avx512vl(_local_740,auVar114);
      auVar117 = vfmadd231ps_avx512vl(auVar117,auVar123,local_6e0);
      auVar118 = vfmadd231ps_avx512vl(auVar118,auVar123,local_700);
      auVar117 = vfmadd231ps_avx512vl(auVar117,auVar113,local_6a0);
      auVar118 = vfmadd231ps_avx512vl(auVar118,auVar113,local_6c0);
      auVar32 = vfmadd231ps_fma(auVar117,auVar112,local_660);
      auVar233 = ZEXT1664(auVar32);
      auVar33 = vfmadd231ps_fma(auVar118,auVar112,local_680);
      auVar118 = vsubps_avx512vl(ZEXT1632(auVar32),auVar115);
      auVar119 = vsubps_avx512vl(ZEXT1632(auVar33),auVar116);
      auVar117 = vmulps_avx512vl(auVar116,auVar118);
      auVar120 = vmulps_avx512vl(auVar115,auVar119);
      auVar117 = vsubps_avx512vl(auVar117,auVar120);
      auVar101 = vshufps_avx(auVar27,auVar27,0xff);
      uVar184 = auVar101._0_8_;
      local_320._8_8_ = uVar184;
      local_320._0_8_ = uVar184;
      local_320._16_8_ = uVar184;
      local_320._24_8_ = uVar184;
      auVar101 = vshufps_avx(auVar28,auVar28,0xff);
      local_340 = vbroadcastsd_avx512vl(auVar101);
      auVar101 = vshufps_avx512vl(auVar106,auVar106,0xff);
      local_360 = vbroadcastsd_avx512vl(auVar101);
      auVar101 = vshufps_avx512vl(auVar107,auVar107,0xff);
      uVar184 = auVar101._0_8_;
      local_380._8_8_ = uVar184;
      local_380._0_8_ = uVar184;
      local_380._16_8_ = uVar184;
      local_380._24_8_ = uVar184;
      auVar120 = vmulps_avx512vl(local_380,auVar124);
      auVar120 = vfmadd231ps_avx512vl(auVar120,auVar125,local_360);
      auVar120 = vfmadd231ps_avx512vl(auVar120,auVar127,local_340);
      auVar120 = vfmadd231ps_avx512vl(auVar120,auVar126,local_320);
      auVar121 = vmulps_avx512vl(local_380,auVar114);
      auVar121 = vfmadd231ps_avx512vl(auVar121,auVar123,local_360);
      auVar121 = vfmadd231ps_avx512vl(auVar121,auVar113,local_340);
      auVar34 = vfmadd231ps_fma(auVar121,auVar112,local_320);
      auVar121 = vmulps_avx512vl(auVar119,auVar119);
      auVar121 = vfmadd231ps_avx512vl(auVar121,auVar118,auVar118);
      auVar122 = vmaxps_avx512vl(auVar120,ZEXT1632(auVar34));
      auVar122 = vmulps_avx512vl(auVar122,auVar122);
      auVar121 = vmulps_avx512vl(auVar122,auVar121);
      auVar117 = vmulps_avx512vl(auVar117,auVar117);
      uVar184 = vcmpps_avx512vl(auVar117,auVar121,2);
      auVar101 = vblendps_avx(auVar29,auVar27,8);
      auVar251 = auVar252._0_16_;
      auVar102 = vandps_avx512vl(auVar101,auVar251);
      auVar101 = vblendps_avx(auVar30,auVar28,8);
      auVar101 = vandps_avx512vl(auVar101,auVar251);
      auVar102 = vmaxps_avx(auVar102,auVar101);
      auVar101 = vblendps_avx(auVar108,auVar106,8);
      auVar109 = vandps_avx512vl(auVar101,auVar251);
      auVar101 = vblendps_avx(auVar31,auVar107,8);
      auVar101 = vandps_avx512vl(auVar101,auVar251);
      auVar101 = vmaxps_avx(auVar109,auVar101);
      auVar101 = vmaxps_avx(auVar102,auVar101);
      auVar102 = vmovshdup_avx(auVar101);
      auVar102 = vmaxss_avx(auVar102,auVar101);
      auVar101 = vshufpd_avx(auVar101,auVar101,1);
      auVar101 = vmaxss_avx(auVar101,auVar102);
      auVar102 = vcvtsi2ss_avx512f(auVar251,iVar8);
      local_480._0_16_ = auVar102;
      auVar122._0_4_ = auVar102._0_4_;
      auVar122._4_4_ = auVar122._0_4_;
      auVar122._8_4_ = auVar122._0_4_;
      auVar122._12_4_ = auVar122._0_4_;
      auVar122._16_4_ = auVar122._0_4_;
      auVar122._20_4_ = auVar122._0_4_;
      auVar122._24_4_ = auVar122._0_4_;
      auVar122._28_4_ = auVar122._0_4_;
      uVar35 = vcmpps_avx512vl(auVar122,_DAT_01faff40,0xe);
      bVar97 = (byte)uVar184 & (byte)uVar35;
      auVar101 = vmulss_avx512f(auVar101,SUB6416(ZEXT464(0x35000000),0));
      local_7e0._0_16_ = auVar101;
      auVar117 = local_7e0;
      auVar121._8_4_ = 2;
      auVar121._0_8_ = 0x200000002;
      auVar121._12_4_ = 2;
      auVar121._16_4_ = 2;
      auVar121._20_4_ = 2;
      auVar121._24_4_ = 2;
      auVar121._28_4_ = 2;
      local_4a0 = vpermps_avx2(auVar121,ZEXT1632(auVar29));
      local_4c0 = vpermps_avx2(auVar121,ZEXT1632(auVar30));
      local_4e0 = vpermps_avx2(auVar121,ZEXT1632(auVar108));
      local_500 = vpermps_avx2(auVar121,ZEXT1632(auVar31));
      local_7a0 = *(undefined4 *)(ray + k * 4 + 0xc0);
      uStack_79c = 0;
      uStack_798 = 0;
      uStack_794 = 0;
      local_860 = auVar27._0_8_;
      uStack_858 = auVar27._8_8_;
      local_870 = auVar28._0_8_;
      uStack_868 = auVar28._8_8_;
      local_880 = auVar106._0_8_;
      uStack_878 = auVar106._8_8_;
      local_890._0_4_ = auVar107._0_4_;
      fVar162 = (float)local_890;
      local_890._4_4_ = auVar107._4_4_;
      fVar180 = local_890._4_4_;
      uStack_888._0_4_ = auVar107._8_4_;
      fVar181 = (float)uStack_888;
      uStack_888._4_4_ = auVar107._12_4_;
      fVar182 = uStack_888._4_4_;
      local_890 = auVar107._0_8_;
      uStack_888 = auVar107._8_8_;
      local_7e0 = auVar117;
      if (bVar97 != 0) {
        auVar114 = vmulps_avx512vl(local_500,auVar114);
        auVar123 = vfmadd213ps_avx512vl(auVar123,local_4e0,auVar114);
        auVar113 = vfmadd213ps_avx512vl(auVar113,local_4c0,auVar123);
        auVar114 = vfmadd213ps_avx512vl(auVar112,local_4a0,auVar113);
        auVar124 = vmulps_avx512vl(local_500,auVar124);
        auVar125 = vfmadd213ps_avx512vl(auVar125,local_4e0,auVar124);
        auVar113 = vfmadd213ps_avx512vl(auVar127,local_4c0,auVar125);
        auVar127 = *(undefined1 (*) [32])(bspline_basis0 + lVar37 + 0x1210);
        auVar125 = *(undefined1 (*) [32])(bspline_basis0 + lVar37 + 0x1694);
        auVar124 = *(undefined1 (*) [32])(bspline_basis0 + lVar37 + 0x1b18);
        auVar112 = *(undefined1 (*) [32])(bspline_basis0 + lVar37 + 0x1f9c);
        auVar117 = vfmadd213ps_avx512vl(auVar126,local_4a0,auVar113);
        auVar126 = vmulps_avx512vl(_local_720,auVar112);
        auVar113 = vmulps_avx512vl(_local_740,auVar112);
        auVar112 = vmulps_avx512vl(local_500,auVar112);
        auVar126 = vfmadd231ps_avx512vl(auVar126,auVar124,local_6e0);
        auVar113 = vfmadd231ps_avx512vl(auVar113,auVar124,local_700);
        auVar124 = vfmadd231ps_avx512vl(auVar112,local_4e0,auVar124);
        auVar126 = vfmadd231ps_avx512vl(auVar126,auVar125,local_6a0);
        auVar112 = vfmadd231ps_avx512vl(auVar113,auVar125,local_6c0);
        auVar113 = vfmadd231ps_avx512vl(auVar124,local_4c0,auVar125);
        auVar102 = vfmadd231ps_fma(auVar126,auVar127,local_660);
        auVar112 = vfmadd231ps_avx512vl(auVar112,auVar127,local_680);
        auVar126 = *(undefined1 (*) [32])(bspline_basis1 + lVar37 + 0x1210);
        auVar125 = *(undefined1 (*) [32])(bspline_basis1 + lVar37 + 0x1b18);
        auVar124 = *(undefined1 (*) [32])(bspline_basis1 + lVar37 + 0x1f9c);
        auVar113 = vfmadd231ps_avx512vl(auVar113,local_4a0,auVar127);
        auVar127 = vmulps_avx512vl(_local_720,auVar124);
        auVar123 = vmulps_avx512vl(_local_740,auVar124);
        auVar124 = vmulps_avx512vl(local_500,auVar124);
        auVar121 = vfmadd231ps_avx512vl(auVar127,auVar125,local_6e0);
        auVar123 = vfmadd231ps_avx512vl(auVar123,auVar125,local_700);
        auVar125 = vfmadd231ps_avx512vl(auVar124,local_4e0,auVar125);
        auVar252 = ZEXT1664(auVar251);
        auVar127 = *(undefined1 (*) [32])(bspline_basis1 + lVar37 + 0x1694);
        auVar124 = vfmadd231ps_avx512vl(auVar121,auVar127,local_6a0);
        auVar123 = vfmadd231ps_avx512vl(auVar123,auVar127,local_6c0);
        auVar127 = vfmadd231ps_avx512vl(auVar125,local_4c0,auVar127);
        auVar179 = ZEXT1664(auVar179._0_16_);
        auVar108 = vfmadd231ps_fma(auVar124,auVar126,local_660);
        auVar125 = vfmadd231ps_avx512vl(auVar123,auVar126,local_680);
        auVar124 = vfmadd231ps_avx512vl(auVar127,local_4a0,auVar126);
        auVar246._8_4_ = 0x7fffffff;
        auVar246._0_8_ = 0x7fffffff7fffffff;
        auVar246._12_4_ = 0x7fffffff;
        auVar246._16_4_ = 0x7fffffff;
        auVar246._20_4_ = 0x7fffffff;
        auVar246._24_4_ = 0x7fffffff;
        auVar246._28_4_ = 0x7fffffff;
        auVar126 = vandps_avx(ZEXT1632(auVar102),auVar246);
        auVar127 = vandps_avx(auVar112,auVar246);
        auVar127 = vmaxps_avx(auVar126,auVar127);
        auVar126 = vandps_avx(auVar113,auVar246);
        auVar126 = vmaxps_avx(auVar127,auVar126);
        local_7e0._0_4_ = auVar101._0_4_;
        auVar239._4_4_ = local_7e0._0_4_;
        auVar239._0_4_ = local_7e0._0_4_;
        auVar239._8_4_ = local_7e0._0_4_;
        auVar239._12_4_ = local_7e0._0_4_;
        auVar239._16_4_ = local_7e0._0_4_;
        auVar239._20_4_ = local_7e0._0_4_;
        auVar239._24_4_ = local_7e0._0_4_;
        auVar239._28_4_ = local_7e0._0_4_;
        uVar89 = vcmpps_avx512vl(auVar126,auVar239,1);
        bVar13 = (bool)((byte)uVar89 & 1);
        auVar128._0_4_ = (float)((uint)bVar13 * auVar118._0_4_ | (uint)!bVar13 * auVar102._0_4_);
        bVar13 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar128._4_4_ = (float)((uint)bVar13 * auVar118._4_4_ | (uint)!bVar13 * auVar102._4_4_);
        bVar13 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar128._8_4_ = (float)((uint)bVar13 * auVar118._8_4_ | (uint)!bVar13 * auVar102._8_4_);
        bVar13 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar128._12_4_ = (float)((uint)bVar13 * auVar118._12_4_ | (uint)!bVar13 * auVar102._12_4_);
        fVar236 = (float)((uint)((byte)(uVar89 >> 4) & 1) * auVar118._16_4_);
        auVar128._16_4_ = fVar236;
        fVar191 = (float)((uint)((byte)(uVar89 >> 5) & 1) * auVar118._20_4_);
        auVar128._20_4_ = fVar191;
        fVar237 = (float)((uint)((byte)(uVar89 >> 6) & 1) * auVar118._24_4_);
        auVar128._24_4_ = fVar237;
        auVar128._28_4_ = (uint)(byte)(uVar89 >> 7) * auVar118._28_4_;
        bVar13 = (bool)((byte)uVar89 & 1);
        auVar129._0_4_ = (float)((uint)bVar13 * auVar119._0_4_ | (uint)!bVar13 * auVar112._0_4_);
        bVar13 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar129._4_4_ = (float)((uint)bVar13 * auVar119._4_4_ | (uint)!bVar13 * auVar112._4_4_);
        bVar13 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar129._8_4_ = (float)((uint)bVar13 * auVar119._8_4_ | (uint)!bVar13 * auVar112._8_4_);
        bVar13 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar129._12_4_ = (float)((uint)bVar13 * auVar119._12_4_ | (uint)!bVar13 * auVar112._12_4_);
        bVar13 = (bool)((byte)(uVar89 >> 4) & 1);
        auVar129._16_4_ = (float)((uint)bVar13 * auVar119._16_4_ | (uint)!bVar13 * auVar112._16_4_);
        bVar13 = (bool)((byte)(uVar89 >> 5) & 1);
        auVar129._20_4_ = (float)((uint)bVar13 * auVar119._20_4_ | (uint)!bVar13 * auVar112._20_4_);
        bVar13 = (bool)((byte)(uVar89 >> 6) & 1);
        auVar129._24_4_ = (float)((uint)bVar13 * auVar119._24_4_ | (uint)!bVar13 * auVar112._24_4_);
        bVar13 = SUB81(uVar89 >> 7,0);
        auVar129._28_4_ = (uint)bVar13 * auVar119._28_4_ | (uint)!bVar13 * auVar112._28_4_;
        auVar126 = vandps_avx(auVar246,ZEXT1632(auVar108));
        auVar127 = vandps_avx(auVar125,auVar246);
        auVar127 = vmaxps_avx(auVar126,auVar127);
        auVar126 = vandps_avx(auVar124,auVar246);
        auVar126 = vmaxps_avx(auVar127,auVar126);
        uVar89 = vcmpps_avx512vl(auVar126,auVar239,1);
        bVar13 = (bool)((byte)uVar89 & 1);
        auVar130._0_4_ = (float)((uint)bVar13 * auVar118._0_4_ | (uint)!bVar13 * auVar108._0_4_);
        bVar13 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar130._4_4_ = (float)((uint)bVar13 * auVar118._4_4_ | (uint)!bVar13 * auVar108._4_4_);
        bVar13 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar130._8_4_ = (float)((uint)bVar13 * auVar118._8_4_ | (uint)!bVar13 * auVar108._8_4_);
        bVar13 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar130._12_4_ = (float)((uint)bVar13 * auVar118._12_4_ | (uint)!bVar13 * auVar108._12_4_);
        fVar203 = (float)((uint)((byte)(uVar89 >> 4) & 1) * auVar118._16_4_);
        auVar130._16_4_ = fVar203;
        fVar183 = (float)((uint)((byte)(uVar89 >> 5) & 1) * auVar118._20_4_);
        auVar130._20_4_ = fVar183;
        fVar190 = (float)((uint)((byte)(uVar89 >> 6) & 1) * auVar118._24_4_);
        auVar130._24_4_ = fVar190;
        uVar90 = (uint)(byte)(uVar89 >> 7) * auVar118._28_4_;
        auVar130._28_4_ = uVar90;
        bVar13 = (bool)((byte)uVar89 & 1);
        auVar131._0_4_ = (float)((uint)bVar13 * auVar119._0_4_ | (uint)!bVar13 * auVar125._0_4_);
        bVar13 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar131._4_4_ = (float)((uint)bVar13 * auVar119._4_4_ | (uint)!bVar13 * auVar125._4_4_);
        bVar13 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar131._8_4_ = (float)((uint)bVar13 * auVar119._8_4_ | (uint)!bVar13 * auVar125._8_4_);
        bVar13 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar131._12_4_ = (float)((uint)bVar13 * auVar119._12_4_ | (uint)!bVar13 * auVar125._12_4_);
        bVar13 = (bool)((byte)(uVar89 >> 4) & 1);
        auVar131._16_4_ = (float)((uint)bVar13 * auVar119._16_4_ | (uint)!bVar13 * auVar125._16_4_);
        bVar13 = (bool)((byte)(uVar89 >> 5) & 1);
        auVar131._20_4_ = (float)((uint)bVar13 * auVar119._20_4_ | (uint)!bVar13 * auVar125._20_4_);
        bVar13 = (bool)((byte)(uVar89 >> 6) & 1);
        auVar131._24_4_ = (float)((uint)bVar13 * auVar119._24_4_ | (uint)!bVar13 * auVar125._24_4_);
        bVar13 = SUB81(uVar89 >> 7,0);
        auVar131._28_4_ = (uint)bVar13 * auVar119._28_4_ | (uint)!bVar13 * auVar125._28_4_;
        auVar110 = vxorps_avx512vl(auVar206,auVar206);
        auVar126 = vfmadd213ps_avx512vl(auVar128,auVar128,ZEXT1632(auVar110));
        auVar101 = vfmadd231ps_fma(auVar126,auVar129,auVar129);
        auVar127 = vrsqrt14ps_avx512vl(ZEXT1632(auVar101));
        fVar99 = auVar127._0_4_;
        fVar100 = auVar127._4_4_;
        fVar153 = auVar127._8_4_;
        fVar154 = auVar127._12_4_;
        fVar155 = auVar127._16_4_;
        fVar156 = auVar127._20_4_;
        fVar158 = auVar127._24_4_;
        auVar126._4_4_ = fVar100 * fVar100 * fVar100 * auVar101._4_4_ * -0.5;
        auVar126._0_4_ = fVar99 * fVar99 * fVar99 * auVar101._0_4_ * -0.5;
        auVar126._8_4_ = fVar153 * fVar153 * fVar153 * auVar101._8_4_ * -0.5;
        auVar126._12_4_ = fVar154 * fVar154 * fVar154 * auVar101._12_4_ * -0.5;
        auVar126._16_4_ = fVar155 * fVar155 * fVar155 * -0.0;
        auVar126._20_4_ = fVar156 * fVar156 * fVar156 * -0.0;
        auVar126._24_4_ = fVar158 * fVar158 * fVar158 * -0.0;
        auVar126._28_4_ = auVar124._28_4_;
        auVar112 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar126 = vfmadd231ps_avx512vl(auVar126,auVar112,auVar127);
        auVar127._4_4_ = auVar129._4_4_ * auVar126._4_4_;
        auVar127._0_4_ = auVar129._0_4_ * auVar126._0_4_;
        auVar127._8_4_ = auVar129._8_4_ * auVar126._8_4_;
        auVar127._12_4_ = auVar129._12_4_ * auVar126._12_4_;
        auVar127._16_4_ = auVar129._16_4_ * auVar126._16_4_;
        auVar127._20_4_ = auVar129._20_4_ * auVar126._20_4_;
        auVar127._24_4_ = auVar129._24_4_ * auVar126._24_4_;
        auVar127._28_4_ = 0;
        auVar125._4_4_ = auVar126._4_4_ * -auVar128._4_4_;
        auVar125._0_4_ = auVar126._0_4_ * -auVar128._0_4_;
        auVar125._8_4_ = auVar126._8_4_ * -auVar128._8_4_;
        auVar125._12_4_ = auVar126._12_4_ * -auVar128._12_4_;
        auVar125._16_4_ = auVar126._16_4_ * -fVar236;
        auVar125._20_4_ = auVar126._20_4_ * -fVar191;
        auVar125._24_4_ = auVar126._24_4_ * -fVar237;
        auVar125._28_4_ = auVar129._28_4_;
        auVar126 = vmulps_avx512vl(auVar126,ZEXT1632(auVar110));
        auVar119 = ZEXT1632(auVar110);
        auVar124 = vfmadd213ps_avx512vl(auVar130,auVar130,auVar119);
        auVar101 = vfmadd231ps_fma(auVar124,auVar131,auVar131);
        auVar123 = vrsqrt14ps_avx512vl(ZEXT1632(auVar101));
        fVar191 = auVar123._0_4_;
        fVar236 = auVar123._4_4_;
        fVar237 = auVar123._8_4_;
        fVar99 = auVar123._12_4_;
        fVar100 = auVar123._16_4_;
        fVar153 = auVar123._20_4_;
        fVar154 = auVar123._24_4_;
        auVar124._4_4_ = fVar236 * fVar236 * fVar236 * auVar101._4_4_ * -0.5;
        auVar124._0_4_ = fVar191 * fVar191 * fVar191 * auVar101._0_4_ * -0.5;
        auVar124._8_4_ = fVar237 * fVar237 * fVar237 * auVar101._8_4_ * -0.5;
        auVar124._12_4_ = fVar99 * fVar99 * fVar99 * auVar101._12_4_ * -0.5;
        auVar124._16_4_ = fVar100 * fVar100 * fVar100 * -0.0;
        auVar124._20_4_ = fVar153 * fVar153 * fVar153 * -0.0;
        auVar124._24_4_ = fVar154 * fVar154 * fVar154 * -0.0;
        auVar124._28_4_ = 0;
        auVar124 = vfmadd231ps_avx512vl(auVar124,auVar112,auVar123);
        auVar113._4_4_ = auVar131._4_4_ * auVar124._4_4_;
        auVar113._0_4_ = auVar131._0_4_ * auVar124._0_4_;
        auVar113._8_4_ = auVar131._8_4_ * auVar124._8_4_;
        auVar113._12_4_ = auVar131._12_4_ * auVar124._12_4_;
        auVar113._16_4_ = auVar131._16_4_ * auVar124._16_4_;
        auVar113._20_4_ = auVar131._20_4_ * auVar124._20_4_;
        auVar113._24_4_ = auVar131._24_4_ * auVar124._24_4_;
        auVar113._28_4_ = auVar123._28_4_;
        auVar123._4_4_ = -auVar130._4_4_ * auVar124._4_4_;
        auVar123._0_4_ = -auVar130._0_4_ * auVar124._0_4_;
        auVar123._8_4_ = -auVar130._8_4_ * auVar124._8_4_;
        auVar123._12_4_ = -auVar130._12_4_ * auVar124._12_4_;
        auVar123._16_4_ = -fVar203 * auVar124._16_4_;
        auVar123._20_4_ = -fVar183 * auVar124._20_4_;
        auVar123._24_4_ = -fVar190 * auVar124._24_4_;
        auVar123._28_4_ = uVar90 ^ 0x80000000;
        auVar124 = vmulps_avx512vl(auVar124,auVar119);
        auVar101 = vfmadd213ps_fma(auVar127,auVar120,auVar115);
        auVar102 = vfmadd213ps_fma(auVar125,auVar120,auVar116);
        auVar112 = vfmadd213ps_avx512vl(auVar126,auVar120,auVar117);
        auVar118 = vfmadd213ps_avx512vl(auVar113,ZEXT1632(auVar34),ZEXT1632(auVar32));
        auVar107 = vfnmadd213ps_fma(auVar127,auVar120,auVar115);
        auVar115 = ZEXT1632(auVar34);
        auVar108 = vfmadd213ps_fma(auVar123,auVar115,ZEXT1632(auVar33));
        auVar109 = vfnmadd213ps_fma(auVar125,auVar120,auVar116);
        auVar29 = vfmadd213ps_fma(auVar124,auVar115,auVar114);
        auVar127 = vfnmadd231ps_avx512vl(auVar117,auVar120,auVar126);
        auVar32 = vfnmadd213ps_fma(auVar113,auVar115,ZEXT1632(auVar32));
        auVar33 = vfnmadd213ps_fma(auVar123,auVar115,ZEXT1632(auVar33));
        auVar251 = vfnmadd231ps_fma(auVar114,ZEXT1632(auVar34),auVar124);
        auVar125 = vsubps_avx512vl(auVar118,ZEXT1632(auVar107));
        auVar126 = vsubps_avx(ZEXT1632(auVar108),ZEXT1632(auVar109));
        auVar124 = vsubps_avx512vl(ZEXT1632(auVar29),auVar127);
        auVar113 = vmulps_avx512vl(auVar126,auVar127);
        auVar30 = vfmsub231ps_fma(auVar113,ZEXT1632(auVar109),auVar124);
        auVar114._4_4_ = auVar107._4_4_ * auVar124._4_4_;
        auVar114._0_4_ = auVar107._0_4_ * auVar124._0_4_;
        auVar114._8_4_ = auVar107._8_4_ * auVar124._8_4_;
        auVar114._12_4_ = auVar107._12_4_ * auVar124._12_4_;
        auVar114._16_4_ = auVar124._16_4_ * 0.0;
        auVar114._20_4_ = auVar124._20_4_ * 0.0;
        auVar114._24_4_ = auVar124._24_4_ * 0.0;
        auVar114._28_4_ = auVar124._28_4_;
        auVar124 = vfmsub231ps_avx512vl(auVar114,auVar127,auVar125);
        auVar117._4_4_ = auVar109._4_4_ * auVar125._4_4_;
        auVar117._0_4_ = auVar109._0_4_ * auVar125._0_4_;
        auVar117._8_4_ = auVar109._8_4_ * auVar125._8_4_;
        auVar117._12_4_ = auVar109._12_4_ * auVar125._12_4_;
        auVar117._16_4_ = auVar125._16_4_ * 0.0;
        auVar117._20_4_ = auVar125._20_4_ * 0.0;
        auVar117._24_4_ = auVar125._24_4_ * 0.0;
        auVar117._28_4_ = auVar125._28_4_;
        auVar31 = vfmsub231ps_fma(auVar117,ZEXT1632(auVar107),auVar126);
        auVar126 = vfmadd231ps_avx512vl(ZEXT1632(auVar31),auVar119,auVar124);
        auVar126 = vfmadd231ps_avx512vl(auVar126,auVar119,ZEXT1632(auVar30));
        auVar121 = ZEXT1632(auVar110);
        uVar89 = vcmpps_avx512vl(auVar126,auVar121,2);
        bVar88 = (byte)uVar89;
        fVar99 = (float)((uint)(bVar88 & 1) * auVar101._0_4_ |
                        (uint)!(bool)(bVar88 & 1) * auVar32._0_4_);
        bVar13 = (bool)((byte)(uVar89 >> 1) & 1);
        fVar153 = (float)((uint)bVar13 * auVar101._4_4_ | (uint)!bVar13 * auVar32._4_4_);
        bVar13 = (bool)((byte)(uVar89 >> 2) & 1);
        fVar155 = (float)((uint)bVar13 * auVar101._8_4_ | (uint)!bVar13 * auVar32._8_4_);
        bVar13 = (bool)((byte)(uVar89 >> 3) & 1);
        fVar158 = (float)((uint)bVar13 * auVar101._12_4_ | (uint)!bVar13 * auVar32._12_4_);
        auVar123 = ZEXT1632(CONCAT412(fVar158,CONCAT48(fVar155,CONCAT44(fVar153,fVar99))));
        fVar100 = (float)((uint)(bVar88 & 1) * auVar102._0_4_ |
                         (uint)!(bool)(bVar88 & 1) * auVar33._0_4_);
        bVar13 = (bool)((byte)(uVar89 >> 1) & 1);
        fVar154 = (float)((uint)bVar13 * auVar102._4_4_ | (uint)!bVar13 * auVar33._4_4_);
        bVar13 = (bool)((byte)(uVar89 >> 2) & 1);
        fVar156 = (float)((uint)bVar13 * auVar102._8_4_ | (uint)!bVar13 * auVar33._8_4_);
        bVar13 = (bool)((byte)(uVar89 >> 3) & 1);
        fVar159 = (float)((uint)bVar13 * auVar102._12_4_ | (uint)!bVar13 * auVar33._12_4_);
        auVar114 = ZEXT1632(CONCAT412(fVar159,CONCAT48(fVar156,CONCAT44(fVar154,fVar100))));
        auVar119._0_4_ =
             (float)((uint)(bVar88 & 1) * auVar112._0_4_ |
                    (uint)!(bool)(bVar88 & 1) * auVar251._0_4_);
        bVar13 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar119._4_4_ = (float)((uint)bVar13 * auVar112._4_4_ | (uint)!bVar13 * auVar251._4_4_);
        bVar13 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar119._8_4_ = (float)((uint)bVar13 * auVar112._8_4_ | (uint)!bVar13 * auVar251._8_4_);
        bVar13 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar119._12_4_ = (float)((uint)bVar13 * auVar112._12_4_ | (uint)!bVar13 * auVar251._12_4_);
        fVar236 = (float)((uint)((byte)(uVar89 >> 4) & 1) * auVar112._16_4_);
        auVar119._16_4_ = fVar236;
        fVar237 = (float)((uint)((byte)(uVar89 >> 5) & 1) * auVar112._20_4_);
        auVar119._20_4_ = fVar237;
        fVar191 = (float)((uint)((byte)(uVar89 >> 6) & 1) * auVar112._24_4_);
        auVar119._24_4_ = fVar191;
        iVar1 = (uint)(byte)(uVar89 >> 7) * auVar112._28_4_;
        auVar119._28_4_ = iVar1;
        auVar125 = vblendmps_avx512vl(ZEXT1632(auVar107),auVar118);
        auVar132._0_4_ =
             (uint)(bVar88 & 1) * auVar125._0_4_ | (uint)!(bool)(bVar88 & 1) * auVar30._0_4_;
        bVar13 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar132._4_4_ = (uint)bVar13 * auVar125._4_4_ | (uint)!bVar13 * auVar30._4_4_;
        bVar13 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar132._8_4_ = (uint)bVar13 * auVar125._8_4_ | (uint)!bVar13 * auVar30._8_4_;
        bVar13 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar132._12_4_ = (uint)bVar13 * auVar125._12_4_ | (uint)!bVar13 * auVar30._12_4_;
        auVar132._16_4_ = (uint)((byte)(uVar89 >> 4) & 1) * auVar125._16_4_;
        auVar132._20_4_ = (uint)((byte)(uVar89 >> 5) & 1) * auVar125._20_4_;
        auVar132._24_4_ = (uint)((byte)(uVar89 >> 6) & 1) * auVar125._24_4_;
        auVar132._28_4_ = (uint)(byte)(uVar89 >> 7) * auVar125._28_4_;
        auVar125 = vblendmps_avx512vl(ZEXT1632(auVar109),ZEXT1632(auVar108));
        auVar133._0_4_ =
             (float)((uint)(bVar88 & 1) * auVar125._0_4_ |
                    (uint)!(bool)(bVar88 & 1) * auVar102._0_4_);
        bVar13 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar133._4_4_ = (float)((uint)bVar13 * auVar125._4_4_ | (uint)!bVar13 * auVar102._4_4_);
        bVar13 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar133._8_4_ = (float)((uint)bVar13 * auVar125._8_4_ | (uint)!bVar13 * auVar102._8_4_);
        bVar13 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar133._12_4_ = (float)((uint)bVar13 * auVar125._12_4_ | (uint)!bVar13 * auVar102._12_4_);
        fVar183 = (float)((uint)((byte)(uVar89 >> 4) & 1) * auVar125._16_4_);
        auVar133._16_4_ = fVar183;
        fVar190 = (float)((uint)((byte)(uVar89 >> 5) & 1) * auVar125._20_4_);
        auVar133._20_4_ = fVar190;
        fVar203 = (float)((uint)((byte)(uVar89 >> 6) & 1) * auVar125._24_4_);
        auVar133._24_4_ = fVar203;
        auVar133._28_4_ = (uint)(byte)(uVar89 >> 7) * auVar125._28_4_;
        auVar125 = vblendmps_avx512vl(auVar127,ZEXT1632(auVar29));
        auVar134._0_4_ =
             (float)((uint)(bVar88 & 1) * auVar125._0_4_ |
                    (uint)!(bool)(bVar88 & 1) * auVar112._0_4_);
        bVar13 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar134._4_4_ = (float)((uint)bVar13 * auVar125._4_4_ | (uint)!bVar13 * auVar112._4_4_);
        bVar13 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar134._8_4_ = (float)((uint)bVar13 * auVar125._8_4_ | (uint)!bVar13 * auVar112._8_4_);
        bVar13 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar134._12_4_ = (float)((uint)bVar13 * auVar125._12_4_ | (uint)!bVar13 * auVar112._12_4_);
        bVar13 = (bool)((byte)(uVar89 >> 4) & 1);
        auVar134._16_4_ = (float)((uint)bVar13 * auVar125._16_4_ | (uint)!bVar13 * auVar112._16_4_);
        bVar13 = (bool)((byte)(uVar89 >> 5) & 1);
        auVar134._20_4_ = (float)((uint)bVar13 * auVar125._20_4_ | (uint)!bVar13 * auVar112._20_4_);
        bVar13 = (bool)((byte)(uVar89 >> 6) & 1);
        auVar134._24_4_ = (float)((uint)bVar13 * auVar125._24_4_ | (uint)!bVar13 * auVar112._24_4_);
        bVar13 = SUB81(uVar89 >> 7,0);
        auVar134._28_4_ = (uint)bVar13 * auVar125._28_4_ | (uint)!bVar13 * auVar112._28_4_;
        auVar135._0_4_ =
             (uint)(bVar88 & 1) * (int)auVar107._0_4_ | (uint)!(bool)(bVar88 & 1) * auVar118._0_4_;
        bVar13 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar135._4_4_ = (uint)bVar13 * (int)auVar107._4_4_ | (uint)!bVar13 * auVar118._4_4_;
        bVar13 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar135._8_4_ = (uint)bVar13 * (int)auVar107._8_4_ | (uint)!bVar13 * auVar118._8_4_;
        bVar13 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar135._12_4_ = (uint)bVar13 * (int)auVar107._12_4_ | (uint)!bVar13 * auVar118._12_4_;
        auVar135._16_4_ = (uint)!(bool)((byte)(uVar89 >> 4) & 1) * auVar118._16_4_;
        auVar135._20_4_ = (uint)!(bool)((byte)(uVar89 >> 5) & 1) * auVar118._20_4_;
        auVar135._24_4_ = (uint)!(bool)((byte)(uVar89 >> 6) & 1) * auVar118._24_4_;
        auVar135._28_4_ = (uint)!SUB81(uVar89 >> 7,0) * auVar118._28_4_;
        bVar13 = (bool)((byte)(uVar89 >> 1) & 1);
        bVar15 = (bool)((byte)(uVar89 >> 2) & 1);
        bVar16 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar136._0_4_ =
             (uint)(bVar88 & 1) * auVar127._0_4_ | (uint)!(bool)(bVar88 & 1) * auVar29._0_4_;
        bVar14 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar136._4_4_ = (uint)bVar14 * auVar127._4_4_ | (uint)!bVar14 * auVar29._4_4_;
        bVar14 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar136._8_4_ = (uint)bVar14 * auVar127._8_4_ | (uint)!bVar14 * auVar29._8_4_;
        bVar14 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar136._12_4_ = (uint)bVar14 * auVar127._12_4_ | (uint)!bVar14 * auVar29._12_4_;
        auVar136._16_4_ = (uint)((byte)(uVar89 >> 4) & 1) * auVar127._16_4_;
        auVar136._20_4_ = (uint)((byte)(uVar89 >> 5) & 1) * auVar127._20_4_;
        auVar136._24_4_ = (uint)((byte)(uVar89 >> 6) & 1) * auVar127._24_4_;
        iVar2 = (uint)(byte)(uVar89 >> 7) * auVar127._28_4_;
        auVar136._28_4_ = iVar2;
        auVar117 = vsubps_avx512vl(auVar135,auVar123);
        auVar127 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar109._12_4_ |
                                                 (uint)!bVar16 * auVar108._12_4_,
                                                 CONCAT48((uint)bVar15 * (int)auVar109._8_4_ |
                                                          (uint)!bVar15 * auVar108._8_4_,
                                                          CONCAT44((uint)bVar13 *
                                                                   (int)auVar109._4_4_ |
                                                                   (uint)!bVar13 * auVar108._4_4_,
                                                                   (uint)(bVar88 & 1) *
                                                                   (int)auVar109._0_4_ |
                                                                   (uint)!(bool)(bVar88 & 1) *
                                                                   auVar108._0_4_)))),auVar114);
        auVar228 = ZEXT3264(auVar127);
        auVar125 = vsubps_avx(auVar136,auVar119);
        auVar124 = vsubps_avx(auVar123,auVar132);
        auVar233 = ZEXT3264(auVar124);
        auVar112 = vsubps_avx(auVar114,auVar133);
        auVar113 = vsubps_avx(auVar119,auVar134);
        auVar115._4_4_ = auVar125._4_4_ * fVar153;
        auVar115._0_4_ = auVar125._0_4_ * fVar99;
        auVar115._8_4_ = auVar125._8_4_ * fVar155;
        auVar115._12_4_ = auVar125._12_4_ * fVar158;
        auVar115._16_4_ = auVar125._16_4_ * 0.0;
        auVar115._20_4_ = auVar125._20_4_ * 0.0;
        auVar115._24_4_ = auVar125._24_4_ * 0.0;
        auVar115._28_4_ = iVar2;
        auVar101 = vfmsub231ps_fma(auVar115,auVar119,auVar117);
        auVar116._4_4_ = fVar154 * auVar117._4_4_;
        auVar116._0_4_ = fVar100 * auVar117._0_4_;
        auVar116._8_4_ = fVar156 * auVar117._8_4_;
        auVar116._12_4_ = fVar159 * auVar117._12_4_;
        auVar116._16_4_ = auVar117._16_4_ * 0.0;
        auVar116._20_4_ = auVar117._20_4_ * 0.0;
        auVar116._24_4_ = auVar117._24_4_ * 0.0;
        auVar116._28_4_ = auVar126._28_4_;
        auVar102 = vfmsub231ps_fma(auVar116,auVar123,auVar127);
        auVar126 = vfmadd231ps_avx512vl(ZEXT1632(auVar102),auVar121,ZEXT1632(auVar101));
        auVar218._0_4_ = auVar127._0_4_ * auVar119._0_4_;
        auVar218._4_4_ = auVar127._4_4_ * auVar119._4_4_;
        auVar218._8_4_ = auVar127._8_4_ * auVar119._8_4_;
        auVar218._12_4_ = auVar127._12_4_ * auVar119._12_4_;
        auVar218._16_4_ = auVar127._16_4_ * fVar236;
        auVar218._20_4_ = auVar127._20_4_ * fVar237;
        auVar218._24_4_ = auVar127._24_4_ * fVar191;
        auVar218._28_4_ = 0;
        auVar101 = vfmsub231ps_fma(auVar218,auVar114,auVar125);
        auVar115 = vfmadd231ps_avx512vl(auVar126,auVar121,ZEXT1632(auVar101));
        auVar126 = vmulps_avx512vl(auVar113,auVar132);
        auVar126 = vfmsub231ps_avx512vl(auVar126,auVar124,auVar134);
        auVar118._4_4_ = auVar112._4_4_ * auVar134._4_4_;
        auVar118._0_4_ = auVar112._0_4_ * auVar134._0_4_;
        auVar118._8_4_ = auVar112._8_4_ * auVar134._8_4_;
        auVar118._12_4_ = auVar112._12_4_ * auVar134._12_4_;
        auVar118._16_4_ = auVar112._16_4_ * auVar134._16_4_;
        auVar118._20_4_ = auVar112._20_4_ * auVar134._20_4_;
        auVar118._24_4_ = auVar112._24_4_ * auVar134._24_4_;
        auVar118._28_4_ = auVar134._28_4_;
        auVar101 = vfmsub231ps_fma(auVar118,auVar133,auVar113);
        auVar219._0_4_ = auVar133._0_4_ * auVar124._0_4_;
        auVar219._4_4_ = auVar133._4_4_ * auVar124._4_4_;
        auVar219._8_4_ = auVar133._8_4_ * auVar124._8_4_;
        auVar219._12_4_ = auVar133._12_4_ * auVar124._12_4_;
        auVar219._16_4_ = fVar183 * auVar124._16_4_;
        auVar219._20_4_ = fVar190 * auVar124._20_4_;
        auVar219._24_4_ = fVar203 * auVar124._24_4_;
        auVar219._28_4_ = 0;
        auVar102 = vfmsub231ps_fma(auVar219,auVar112,auVar132);
        auVar126 = vfmadd231ps_avx512vl(ZEXT1632(auVar102),auVar121,auVar126);
        auVar116 = vfmadd231ps_avx512vl(auVar126,auVar121,ZEXT1632(auVar101));
        auVar222 = ZEXT3264(auVar116);
        auVar126 = vmaxps_avx(auVar115,auVar116);
        uVar184 = vcmpps_avx512vl(auVar126,auVar121,2);
        bVar97 = bVar97 & (byte)uVar184;
        if (bVar97 != 0) {
          uVar163 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar247._4_4_ = uVar163;
          auVar247._0_4_ = uVar163;
          auVar247._8_4_ = uVar163;
          auVar247._12_4_ = uVar163;
          auVar247._16_4_ = uVar163;
          auVar247._20_4_ = uVar163;
          auVar247._24_4_ = uVar163;
          auVar247._28_4_ = uVar163;
          auVar250 = ZEXT3264(auVar247);
          auVar48._4_4_ = auVar113._4_4_ * auVar127._4_4_;
          auVar48._0_4_ = auVar113._0_4_ * auVar127._0_4_;
          auVar48._8_4_ = auVar113._8_4_ * auVar127._8_4_;
          auVar48._12_4_ = auVar113._12_4_ * auVar127._12_4_;
          auVar48._16_4_ = auVar113._16_4_ * auVar127._16_4_;
          auVar48._20_4_ = auVar113._20_4_ * auVar127._20_4_;
          auVar48._24_4_ = auVar113._24_4_ * auVar127._24_4_;
          auVar48._28_4_ = auVar126._28_4_;
          auVar29 = vfmsub231ps_fma(auVar48,auVar112,auVar125);
          auVar49._4_4_ = auVar125._4_4_ * auVar124._4_4_;
          auVar49._0_4_ = auVar125._0_4_ * auVar124._0_4_;
          auVar49._8_4_ = auVar125._8_4_ * auVar124._8_4_;
          auVar49._12_4_ = auVar125._12_4_ * auVar124._12_4_;
          auVar49._16_4_ = auVar125._16_4_ * auVar124._16_4_;
          auVar49._20_4_ = auVar125._20_4_ * auVar124._20_4_;
          auVar49._24_4_ = auVar125._24_4_ * auVar124._24_4_;
          auVar49._28_4_ = auVar125._28_4_;
          auVar108 = vfmsub231ps_fma(auVar49,auVar117,auVar113);
          auVar50._4_4_ = auVar112._4_4_ * auVar117._4_4_;
          auVar50._0_4_ = auVar112._0_4_ * auVar117._0_4_;
          auVar50._8_4_ = auVar112._8_4_ * auVar117._8_4_;
          auVar50._12_4_ = auVar112._12_4_ * auVar117._12_4_;
          auVar50._16_4_ = auVar112._16_4_ * auVar117._16_4_;
          auVar50._20_4_ = auVar112._20_4_ * auVar117._20_4_;
          auVar50._24_4_ = auVar112._24_4_ * auVar117._24_4_;
          auVar50._28_4_ = auVar112._28_4_;
          auVar30 = vfmsub231ps_fma(auVar50,auVar124,auVar127);
          auVar101 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar108),ZEXT1632(auVar30));
          auVar102 = vfmadd231ps_fma(ZEXT1632(auVar101),ZEXT1632(auVar29),
                                     ZEXT1232(ZEXT412(0)) << 0x20);
          auVar126 = vrcp14ps_avx512vl(ZEXT1632(auVar102));
          auVar233 = ZEXT3264(auVar126);
          auVar43._8_4_ = 0x3f800000;
          auVar43._0_8_ = 0x3f8000003f800000;
          auVar43._12_4_ = 0x3f800000;
          auVar43._16_4_ = 0x3f800000;
          auVar43._20_4_ = 0x3f800000;
          auVar43._24_4_ = 0x3f800000;
          auVar43._28_4_ = 0x3f800000;
          auVar127 = vfnmadd213ps_avx512vl(auVar126,ZEXT1632(auVar102),auVar43);
          auVar101 = vfmadd132ps_fma(auVar127,auVar126,auVar126);
          auVar228 = ZEXT1664(auVar101);
          auVar51._4_4_ = auVar30._4_4_ * auVar119._4_4_;
          auVar51._0_4_ = auVar30._0_4_ * auVar119._0_4_;
          auVar51._8_4_ = auVar30._8_4_ * auVar119._8_4_;
          auVar51._12_4_ = auVar30._12_4_ * auVar119._12_4_;
          auVar51._16_4_ = fVar236 * 0.0;
          auVar51._20_4_ = fVar237 * 0.0;
          auVar51._24_4_ = fVar191 * 0.0;
          auVar51._28_4_ = iVar1;
          auVar108 = vfmadd231ps_fma(auVar51,auVar114,ZEXT1632(auVar108));
          auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),auVar123,ZEXT1632(auVar29));
          fVar191 = auVar101._0_4_;
          fVar236 = auVar101._4_4_;
          fVar237 = auVar101._8_4_;
          fVar183 = auVar101._12_4_;
          local_800 = ZEXT1632(CONCAT412(auVar108._12_4_ * fVar183,
                                         CONCAT48(auVar108._8_4_ * fVar237,
                                                  CONCAT44(auVar108._4_4_ * fVar236,
                                                           auVar108._0_4_ * fVar191))));
          auVar235 = ZEXT3264(local_800);
          auVar171._4_4_ = local_7a0;
          auVar171._0_4_ = local_7a0;
          auVar171._8_4_ = local_7a0;
          auVar171._12_4_ = local_7a0;
          auVar171._16_4_ = local_7a0;
          auVar171._20_4_ = local_7a0;
          auVar171._24_4_ = local_7a0;
          auVar171._28_4_ = local_7a0;
          uVar184 = vcmpps_avx512vl(local_800,auVar247,2);
          uVar35 = vcmpps_avx512vl(auVar171,local_800,2);
          bVar97 = (byte)uVar184 & (byte)uVar35 & bVar97;
          if (bVar97 != 0) {
            uVar98 = vcmpps_avx512vl(ZEXT1632(auVar102),ZEXT1232(ZEXT412(0)) << 0x20,4);
            uVar98 = bVar97 & uVar98;
            if ((char)uVar98 != '\0') {
              fVar190 = auVar115._0_4_ * fVar191;
              fVar203 = auVar115._4_4_ * fVar236;
              auVar52._4_4_ = fVar203;
              auVar52._0_4_ = fVar190;
              fVar99 = auVar115._8_4_ * fVar237;
              auVar52._8_4_ = fVar99;
              fVar100 = auVar115._12_4_ * fVar183;
              auVar52._12_4_ = fVar100;
              fVar153 = auVar115._16_4_ * 0.0;
              auVar52._16_4_ = fVar153;
              fVar154 = auVar115._20_4_ * 0.0;
              auVar52._20_4_ = fVar154;
              fVar155 = auVar115._24_4_ * 0.0;
              auVar52._24_4_ = fVar155;
              auVar52._28_4_ = auVar115._28_4_;
              auVar172._8_4_ = 0x3f800000;
              auVar172._0_8_ = 0x3f8000003f800000;
              auVar172._12_4_ = 0x3f800000;
              auVar172._16_4_ = 0x3f800000;
              auVar172._20_4_ = 0x3f800000;
              auVar172._24_4_ = 0x3f800000;
              auVar172._28_4_ = 0x3f800000;
              auVar126 = vsubps_avx(auVar172,auVar52);
              local_640._0_4_ =
                   (float)((uint)(bVar88 & 1) * (int)fVar190 |
                          (uint)!(bool)(bVar88 & 1) * auVar126._0_4_);
              bVar13 = (bool)((byte)(uVar89 >> 1) & 1);
              local_640._4_4_ =
                   (float)((uint)bVar13 * (int)fVar203 | (uint)!bVar13 * auVar126._4_4_);
              bVar13 = (bool)((byte)(uVar89 >> 2) & 1);
              local_640._8_4_ = (float)((uint)bVar13 * (int)fVar99 | (uint)!bVar13 * auVar126._8_4_)
              ;
              bVar13 = (bool)((byte)(uVar89 >> 3) & 1);
              local_640._12_4_ =
                   (float)((uint)bVar13 * (int)fVar100 | (uint)!bVar13 * auVar126._12_4_);
              bVar13 = (bool)((byte)(uVar89 >> 4) & 1);
              local_640._16_4_ =
                   (float)((uint)bVar13 * (int)fVar153 | (uint)!bVar13 * auVar126._16_4_);
              bVar13 = (bool)((byte)(uVar89 >> 5) & 1);
              local_640._20_4_ =
                   (float)((uint)bVar13 * (int)fVar154 | (uint)!bVar13 * auVar126._20_4_);
              bVar13 = (bool)((byte)(uVar89 >> 6) & 1);
              local_640._24_4_ =
                   (float)((uint)bVar13 * (int)fVar155 | (uint)!bVar13 * auVar126._24_4_);
              bVar13 = SUB81(uVar89 >> 7,0);
              local_640._28_4_ =
                   (float)((uint)bVar13 * auVar115._28_4_ | (uint)!bVar13 * auVar126._28_4_);
              auVar126 = vsubps_avx(ZEXT1632(auVar34),auVar120);
              auVar101 = vfmadd213ps_fma(auVar126,local_640,auVar120);
              uVar163 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
              auVar120._4_4_ = uVar163;
              auVar120._0_4_ = uVar163;
              auVar120._8_4_ = uVar163;
              auVar120._12_4_ = uVar163;
              auVar120._16_4_ = uVar163;
              auVar120._20_4_ = uVar163;
              auVar120._24_4_ = uVar163;
              auVar120._28_4_ = uVar163;
              auVar126 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar101._12_4_ + auVar101._12_4_,
                                                            CONCAT48(auVar101._8_4_ + auVar101._8_4_
                                                                     ,CONCAT44(auVar101._4_4_ +
                                                                               auVar101._4_4_,
                                                                               auVar101._0_4_ +
                                                                               auVar101._0_4_)))),
                                         auVar120);
              uVar36 = vcmpps_avx512vl(local_800,auVar126,6);
              uVar98 = uVar98 & uVar36;
              bVar97 = (byte)uVar98;
              if (bVar97 != 0) {
                auVar201._0_4_ = auVar116._0_4_ * fVar191;
                auVar201._4_4_ = auVar116._4_4_ * fVar236;
                auVar201._8_4_ = auVar116._8_4_ * fVar237;
                auVar201._12_4_ = auVar116._12_4_ * fVar183;
                auVar201._16_4_ = auVar116._16_4_ * 0.0;
                auVar201._20_4_ = auVar116._20_4_ * 0.0;
                auVar201._24_4_ = auVar116._24_4_ * 0.0;
                auVar201._28_4_ = 0;
                auVar207._8_4_ = 0x3f800000;
                auVar207._0_8_ = 0x3f8000003f800000;
                auVar207._12_4_ = 0x3f800000;
                auVar207._16_4_ = 0x3f800000;
                auVar207._20_4_ = 0x3f800000;
                auVar207._24_4_ = 0x3f800000;
                auVar207._28_4_ = 0x3f800000;
                auVar126 = vsubps_avx(auVar207,auVar201);
                auVar137._0_4_ =
                     (uint)(bVar88 & 1) * (int)auVar201._0_4_ |
                     (uint)!(bool)(bVar88 & 1) * auVar126._0_4_;
                bVar13 = (bool)((byte)(uVar89 >> 1) & 1);
                auVar137._4_4_ = (uint)bVar13 * (int)auVar201._4_4_ | (uint)!bVar13 * auVar126._4_4_
                ;
                bVar13 = (bool)((byte)(uVar89 >> 2) & 1);
                auVar137._8_4_ = (uint)bVar13 * (int)auVar201._8_4_ | (uint)!bVar13 * auVar126._8_4_
                ;
                bVar13 = (bool)((byte)(uVar89 >> 3) & 1);
                auVar137._12_4_ =
                     (uint)bVar13 * (int)auVar201._12_4_ | (uint)!bVar13 * auVar126._12_4_;
                bVar13 = (bool)((byte)(uVar89 >> 4) & 1);
                auVar137._16_4_ =
                     (uint)bVar13 * (int)auVar201._16_4_ | (uint)!bVar13 * auVar126._16_4_;
                bVar13 = (bool)((byte)(uVar89 >> 5) & 1);
                auVar137._20_4_ =
                     (uint)bVar13 * (int)auVar201._20_4_ | (uint)!bVar13 * auVar126._20_4_;
                bVar13 = (bool)((byte)(uVar89 >> 6) & 1);
                auVar137._24_4_ =
                     (uint)bVar13 * (int)auVar201._24_4_ | (uint)!bVar13 * auVar126._24_4_;
                auVar137._28_4_ = (uint)!SUB81(uVar89 >> 7,0) * auVar126._28_4_;
                auVar44._8_4_ = 0x40000000;
                auVar44._0_8_ = 0x4000000040000000;
                auVar44._12_4_ = 0x40000000;
                auVar44._16_4_ = 0x40000000;
                auVar44._20_4_ = 0x40000000;
                auVar44._24_4_ = 0x40000000;
                auVar44._28_4_ = 0x40000000;
                local_620 = vfmsub132ps_avx512vl(auVar137,auVar207,auVar44);
                local_5e0 = 0;
                local_5d0 = local_860;
                uStack_5c8 = uStack_858;
                local_5c0 = local_870;
                uStack_5b8 = uStack_868;
                local_5b0 = local_880;
                uStack_5a8 = uStack_878;
                local_5a0 = local_890;
                uStack_598 = uStack_888;
                if ((pGVar94->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                  fVar191 = 1.0 / auVar122._0_4_;
                  local_580[0] = fVar191 * (local_640._0_4_ + 0.0);
                  local_580[1] = fVar191 * (local_640._4_4_ + 1.0);
                  local_580[2] = fVar191 * (local_640._8_4_ + 2.0);
                  local_580[3] = fVar191 * (local_640._12_4_ + 3.0);
                  fStack_570 = fVar191 * (local_640._16_4_ + 4.0);
                  fStack_56c = fVar191 * (local_640._20_4_ + 5.0);
                  fStack_568 = fVar191 * (local_640._24_4_ + 6.0);
                  fStack_564 = local_640._28_4_ + 7.0;
                  local_560 = local_620;
                  local_540 = local_800;
                  auVar173._8_4_ = 0x7f800000;
                  auVar173._0_8_ = 0x7f8000007f800000;
                  auVar173._12_4_ = 0x7f800000;
                  auVar173._16_4_ = 0x7f800000;
                  auVar173._20_4_ = 0x7f800000;
                  auVar173._24_4_ = 0x7f800000;
                  auVar173._28_4_ = 0x7f800000;
                  auVar126 = vblendmps_avx512vl(auVar173,local_800);
                  auVar138._0_4_ =
                       (uint)(bVar97 & 1) * auVar126._0_4_ | (uint)!(bool)(bVar97 & 1) * 0x7f800000;
                  bVar13 = (bool)((byte)(uVar98 >> 1) & 1);
                  auVar138._4_4_ = (uint)bVar13 * auVar126._4_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)((byte)(uVar98 >> 2) & 1);
                  auVar138._8_4_ = (uint)bVar13 * auVar126._8_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)((byte)(uVar98 >> 3) & 1);
                  auVar138._12_4_ = (uint)bVar13 * auVar126._12_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)((byte)(uVar98 >> 4) & 1);
                  auVar138._16_4_ = (uint)bVar13 * auVar126._16_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)((byte)(uVar98 >> 5) & 1);
                  auVar138._20_4_ = (uint)bVar13 * auVar126._20_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)((byte)(uVar98 >> 6) & 1);
                  auVar138._24_4_ = (uint)bVar13 * auVar126._24_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = SUB81(uVar98 >> 7,0);
                  auVar138._28_4_ = (uint)bVar13 * auVar126._28_4_ | (uint)!bVar13 * 0x7f800000;
                  auVar126 = vshufps_avx(auVar138,auVar138,0xb1);
                  auVar126 = vminps_avx(auVar138,auVar126);
                  auVar127 = vshufpd_avx(auVar126,auVar126,5);
                  auVar126 = vminps_avx(auVar126,auVar127);
                  auVar127 = vpermpd_avx2(auVar126,0x4e);
                  auVar126 = vminps_avx(auVar126,auVar127);
                  uVar184 = vcmpps_avx512vl(auVar138,auVar126,0);
                  uVar90 = (uint)uVar98;
                  if (((byte)uVar184 & bVar97) != 0) {
                    uVar90 = (uint)((byte)uVar184 & bVar97);
                  }
                  uVar91 = 0;
                  for (; (uVar90 & 1) == 0; uVar90 = uVar90 >> 1 | 0x80000000) {
                    uVar91 = uVar91 + 1;
                  }
                  uVar89 = (ulong)uVar91;
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar94->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar222 = vpbroadcastd_avx512f();
                    local_400 = vmovdqa64_avx512f(auVar222);
                    auVar222 = vpbroadcastd_avx512f();
                    local_440 = vmovdqa64_avx512f(auVar222);
                    local_600 = local_800;
                    local_5dc = iVar8;
                    do {
                      local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_580[uVar89]));
                      local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_560 + uVar89 * 4)));
                      *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_540 + uVar89 * 4)
                      ;
                      local_848.context = context->user;
                      fVar183 = local_200._0_4_;
                      fVar191 = 1.0 - fVar183;
                      auVar42._8_4_ = 0x80000000;
                      auVar42._0_8_ = 0x8000000080000000;
                      auVar42._12_4_ = 0x80000000;
                      auVar108 = vxorps_avx512vl(ZEXT416((uint)fVar191),auVar42);
                      auVar101 = ZEXT416((uint)(fVar183 * fVar191 * 4.0));
                      auVar102 = vfnmsub213ss_fma(local_200._0_16_,local_200._0_16_,auVar101);
                      auVar101 = vfmadd213ss_fma(ZEXT416((uint)fVar191),ZEXT416((uint)fVar191),
                                                 auVar101);
                      auVar233 = ZEXT464(0x3f000000);
                      fVar191 = fVar191 * auVar108._0_4_ * 0.5;
                      fVar236 = auVar102._0_4_ * 0.5;
                      fVar237 = auVar101._0_4_ * 0.5;
                      fVar183 = fVar183 * fVar183 * 0.5;
                      auVar227._0_4_ = fVar183 * fVar162;
                      auVar227._4_4_ = fVar183 * fVar180;
                      auVar227._8_4_ = fVar183 * fVar181;
                      auVar227._12_4_ = fVar183 * fVar182;
                      auVar169._4_4_ = fVar237;
                      auVar169._0_4_ = fVar237;
                      auVar169._8_4_ = fVar237;
                      auVar169._12_4_ = fVar237;
                      auVar101 = vfmadd132ps_fma(auVar169,auVar227,auVar106);
                      auVar217._4_4_ = fVar236;
                      auVar217._0_4_ = fVar236;
                      auVar217._8_4_ = fVar236;
                      auVar217._12_4_ = fVar236;
                      auVar101 = vfmadd132ps_fma(auVar217,auVar101,auVar28);
                      auVar170._4_4_ = fVar191;
                      auVar170._0_4_ = fVar191;
                      auVar170._8_4_ = fVar191;
                      auVar170._12_4_ = fVar191;
                      auVar101 = vfmadd132ps_fma(auVar170,auVar101,auVar27);
                      auVar152 = vbroadcastss_avx512f(auVar101);
                      auVar222 = vbroadcastss_avx512f(ZEXT416(1));
                      auVar222 = vpermps_avx512f(auVar222,ZEXT1664(auVar101));
                      auVar228 = vbroadcastss_avx512f(ZEXT416(2));
                      local_240 = vpermps_avx512f(auVar228,ZEXT1664(auVar101));
                      local_2c0[0] = (RTCHitN)auVar152[0];
                      local_2c0[1] = (RTCHitN)auVar152[1];
                      local_2c0[2] = (RTCHitN)auVar152[2];
                      local_2c0[3] = (RTCHitN)auVar152[3];
                      local_2c0[4] = (RTCHitN)auVar152[4];
                      local_2c0[5] = (RTCHitN)auVar152[5];
                      local_2c0[6] = (RTCHitN)auVar152[6];
                      local_2c0[7] = (RTCHitN)auVar152[7];
                      local_2c0[8] = (RTCHitN)auVar152[8];
                      local_2c0[9] = (RTCHitN)auVar152[9];
                      local_2c0[10] = (RTCHitN)auVar152[10];
                      local_2c0[0xb] = (RTCHitN)auVar152[0xb];
                      local_2c0[0xc] = (RTCHitN)auVar152[0xc];
                      local_2c0[0xd] = (RTCHitN)auVar152[0xd];
                      local_2c0[0xe] = (RTCHitN)auVar152[0xe];
                      local_2c0[0xf] = (RTCHitN)auVar152[0xf];
                      local_2c0[0x10] = (RTCHitN)auVar152[0x10];
                      local_2c0[0x11] = (RTCHitN)auVar152[0x11];
                      local_2c0[0x12] = (RTCHitN)auVar152[0x12];
                      local_2c0[0x13] = (RTCHitN)auVar152[0x13];
                      local_2c0[0x14] = (RTCHitN)auVar152[0x14];
                      local_2c0[0x15] = (RTCHitN)auVar152[0x15];
                      local_2c0[0x16] = (RTCHitN)auVar152[0x16];
                      local_2c0[0x17] = (RTCHitN)auVar152[0x17];
                      local_2c0[0x18] = (RTCHitN)auVar152[0x18];
                      local_2c0[0x19] = (RTCHitN)auVar152[0x19];
                      local_2c0[0x1a] = (RTCHitN)auVar152[0x1a];
                      local_2c0[0x1b] = (RTCHitN)auVar152[0x1b];
                      local_2c0[0x1c] = (RTCHitN)auVar152[0x1c];
                      local_2c0[0x1d] = (RTCHitN)auVar152[0x1d];
                      local_2c0[0x1e] = (RTCHitN)auVar152[0x1e];
                      local_2c0[0x1f] = (RTCHitN)auVar152[0x1f];
                      local_2c0[0x20] = (RTCHitN)auVar152[0x20];
                      local_2c0[0x21] = (RTCHitN)auVar152[0x21];
                      local_2c0[0x22] = (RTCHitN)auVar152[0x22];
                      local_2c0[0x23] = (RTCHitN)auVar152[0x23];
                      local_2c0[0x24] = (RTCHitN)auVar152[0x24];
                      local_2c0[0x25] = (RTCHitN)auVar152[0x25];
                      local_2c0[0x26] = (RTCHitN)auVar152[0x26];
                      local_2c0[0x27] = (RTCHitN)auVar152[0x27];
                      local_2c0[0x28] = (RTCHitN)auVar152[0x28];
                      local_2c0[0x29] = (RTCHitN)auVar152[0x29];
                      local_2c0[0x2a] = (RTCHitN)auVar152[0x2a];
                      local_2c0[0x2b] = (RTCHitN)auVar152[0x2b];
                      local_2c0[0x2c] = (RTCHitN)auVar152[0x2c];
                      local_2c0[0x2d] = (RTCHitN)auVar152[0x2d];
                      local_2c0[0x2e] = (RTCHitN)auVar152[0x2e];
                      local_2c0[0x2f] = (RTCHitN)auVar152[0x2f];
                      local_2c0[0x30] = (RTCHitN)auVar152[0x30];
                      local_2c0[0x31] = (RTCHitN)auVar152[0x31];
                      local_2c0[0x32] = (RTCHitN)auVar152[0x32];
                      local_2c0[0x33] = (RTCHitN)auVar152[0x33];
                      local_2c0[0x34] = (RTCHitN)auVar152[0x34];
                      local_2c0[0x35] = (RTCHitN)auVar152[0x35];
                      local_2c0[0x36] = (RTCHitN)auVar152[0x36];
                      local_2c0[0x37] = (RTCHitN)auVar152[0x37];
                      local_2c0[0x38] = (RTCHitN)auVar152[0x38];
                      local_2c0[0x39] = (RTCHitN)auVar152[0x39];
                      local_2c0[0x3a] = (RTCHitN)auVar152[0x3a];
                      local_2c0[0x3b] = (RTCHitN)auVar152[0x3b];
                      local_2c0[0x3c] = (RTCHitN)auVar152[0x3c];
                      local_2c0[0x3d] = (RTCHitN)auVar152[0x3d];
                      local_2c0[0x3e] = (RTCHitN)auVar152[0x3e];
                      local_2c0[0x3f] = (RTCHitN)auVar152[0x3f];
                      local_280 = auVar222;
                      local_180 = local_440._0_8_;
                      uStack_178 = local_440._8_8_;
                      uStack_170 = local_440._16_8_;
                      uStack_168 = local_440._24_8_;
                      uStack_160 = local_440._32_8_;
                      uStack_158 = local_440._40_8_;
                      uStack_150 = local_440._48_8_;
                      uStack_148 = local_440._56_8_;
                      auVar152 = vmovdqa64_avx512f(local_400);
                      local_140 = vmovdqa64_avx512f(auVar152);
                      auVar126 = vpcmpeqd_avx2(auVar152._0_32_,auVar152._0_32_);
                      local_810[3] = auVar126;
                      local_810[2] = auVar126;
                      local_810[1] = auVar126;
                      *local_810 = auVar126;
                      local_100 = vbroadcastss_avx512f(ZEXT416((local_848.context)->instID[0]));
                      local_c0 = vbroadcastss_avx512f(ZEXT416((local_848.context)->instPrimID[0]));
                      auVar152 = vmovdqa64_avx512f(local_300);
                      local_780 = vmovdqa64_avx512f(auVar152);
                      local_848.valid = (int *)local_780;
                      local_848.geometryUserPtr = pGVar94->userPtr;
                      local_848.hit = local_2c0;
                      local_848.N = 0x10;
                      local_7c0 = auVar250._0_32_;
                      local_848.ray = (RTCRayN *)ray;
                      if (pGVar94->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar222 = ZEXT1664(auVar222._0_16_);
                        auVar228 = ZEXT1664(auVar228._0_16_);
                        auVar233 = ZEXT1664(auVar233._0_16_);
                        (*pGVar94->intersectionFilterN)(&local_848);
                        auVar235 = ZEXT3264(local_800);
                        auVar250 = ZEXT3264(local_7c0);
                        auVar179 = ZEXT464(0xbf800000);
                        auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar252 = ZEXT1664(auVar101);
                        auVar152 = vmovdqa64_avx512f(local_780);
                      }
                      uVar184 = vptestmd_avx512f(auVar152,auVar152);
                      if ((short)uVar184 == 0) {
LAB_01bbd7a3:
                        *(int *)(ray + k * 4 + 0x200) = auVar250._0_4_;
                      }
                      else {
                        p_Var12 = context->args->filter;
                        if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar94->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar222 = ZEXT1664(auVar222._0_16_);
                          auVar228 = ZEXT1664(auVar228._0_16_);
                          auVar233 = ZEXT1664(auVar233._0_16_);
                          (*p_Var12)(&local_848);
                          auVar235 = ZEXT3264(local_800);
                          auVar250 = ZEXT3264(local_7c0);
                          auVar179 = ZEXT464(0xbf800000);
                          auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          auVar252 = ZEXT1664(auVar101);
                          auVar152 = vmovdqa64_avx512f(local_780);
                        }
                        uVar36 = vptestmd_avx512f(auVar152,auVar152);
                        if ((short)uVar36 == 0) goto LAB_01bbd7a3;
                        iVar1 = *(int *)(local_848.hit + 4);
                        iVar2 = *(int *)(local_848.hit + 8);
                        iVar73 = *(int *)(local_848.hit + 0xc);
                        iVar74 = *(int *)(local_848.hit + 0x10);
                        iVar75 = *(int *)(local_848.hit + 0x14);
                        iVar76 = *(int *)(local_848.hit + 0x18);
                        iVar77 = *(int *)(local_848.hit + 0x1c);
                        iVar78 = *(int *)(local_848.hit + 0x20);
                        iVar79 = *(int *)(local_848.hit + 0x24);
                        iVar80 = *(int *)(local_848.hit + 0x28);
                        iVar81 = *(int *)(local_848.hit + 0x2c);
                        iVar82 = *(int *)(local_848.hit + 0x30);
                        iVar83 = *(int *)(local_848.hit + 0x34);
                        iVar84 = *(int *)(local_848.hit + 0x38);
                        iVar85 = *(int *)(local_848.hit + 0x3c);
                        bVar97 = (byte)uVar36;
                        bVar13 = (bool)((byte)(uVar36 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar36 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar36 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar36 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar36 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar36 >> 6) & 1);
                        bVar19 = (bool)((byte)(uVar36 >> 7) & 1);
                        bVar88 = (byte)(uVar36 >> 8);
                        bVar20 = (bool)((byte)(uVar36 >> 9) & 1);
                        bVar21 = (bool)((byte)(uVar36 >> 10) & 1);
                        bVar22 = (bool)((byte)(uVar36 >> 0xb) & 1);
                        bVar23 = (bool)((byte)(uVar36 >> 0xc) & 1);
                        bVar24 = (bool)((byte)(uVar36 >> 0xd) & 1);
                        bVar25 = (bool)((byte)(uVar36 >> 0xe) & 1);
                        bVar26 = SUB81(uVar36 >> 0xf,0);
                        *(uint *)(local_848.ray + 0x300) =
                             (uint)(bVar97 & 1) * *(int *)local_848.hit |
                             (uint)!(bool)(bVar97 & 1) * *(int *)(local_848.ray + 0x300);
                        *(uint *)(local_848.ray + 0x304) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_848.ray + 0x304);
                        *(uint *)(local_848.ray + 0x308) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_848.ray + 0x308);
                        *(uint *)(local_848.ray + 0x30c) =
                             (uint)bVar15 * iVar73 | (uint)!bVar15 * *(int *)(local_848.ray + 0x30c)
                        ;
                        *(uint *)(local_848.ray + 0x310) =
                             (uint)bVar16 * iVar74 | (uint)!bVar16 * *(int *)(local_848.ray + 0x310)
                        ;
                        *(uint *)(local_848.ray + 0x314) =
                             (uint)bVar17 * iVar75 | (uint)!bVar17 * *(int *)(local_848.ray + 0x314)
                        ;
                        *(uint *)(local_848.ray + 0x318) =
                             (uint)bVar18 * iVar76 | (uint)!bVar18 * *(int *)(local_848.ray + 0x318)
                        ;
                        *(uint *)(local_848.ray + 0x31c) =
                             (uint)bVar19 * iVar77 | (uint)!bVar19 * *(int *)(local_848.ray + 0x31c)
                        ;
                        *(uint *)(local_848.ray + 800) =
                             (uint)(bVar88 & 1) * iVar78 |
                             (uint)!(bool)(bVar88 & 1) * *(int *)(local_848.ray + 800);
                        *(uint *)(local_848.ray + 0x324) =
                             (uint)bVar20 * iVar79 | (uint)!bVar20 * *(int *)(local_848.ray + 0x324)
                        ;
                        *(uint *)(local_848.ray + 0x328) =
                             (uint)bVar21 * iVar80 | (uint)!bVar21 * *(int *)(local_848.ray + 0x328)
                        ;
                        *(uint *)(local_848.ray + 0x32c) =
                             (uint)bVar22 * iVar81 | (uint)!bVar22 * *(int *)(local_848.ray + 0x32c)
                        ;
                        *(uint *)(local_848.ray + 0x330) =
                             (uint)bVar23 * iVar82 | (uint)!bVar23 * *(int *)(local_848.ray + 0x330)
                        ;
                        *(uint *)(local_848.ray + 0x334) =
                             (uint)bVar24 * iVar83 | (uint)!bVar24 * *(int *)(local_848.ray + 0x334)
                        ;
                        *(uint *)(local_848.ray + 0x338) =
                             (uint)bVar25 * iVar84 | (uint)!bVar25 * *(int *)(local_848.ray + 0x338)
                        ;
                        *(uint *)(local_848.ray + 0x33c) =
                             (uint)bVar26 * iVar85 | (uint)!bVar26 * *(int *)(local_848.ray + 0x33c)
                        ;
                        iVar1 = *(int *)(local_848.hit + 0x44);
                        iVar2 = *(int *)(local_848.hit + 0x48);
                        iVar73 = *(int *)(local_848.hit + 0x4c);
                        iVar74 = *(int *)(local_848.hit + 0x50);
                        iVar75 = *(int *)(local_848.hit + 0x54);
                        iVar76 = *(int *)(local_848.hit + 0x58);
                        iVar77 = *(int *)(local_848.hit + 0x5c);
                        iVar78 = *(int *)(local_848.hit + 0x60);
                        iVar79 = *(int *)(local_848.hit + 100);
                        iVar80 = *(int *)(local_848.hit + 0x68);
                        iVar81 = *(int *)(local_848.hit + 0x6c);
                        iVar82 = *(int *)(local_848.hit + 0x70);
                        iVar83 = *(int *)(local_848.hit + 0x74);
                        iVar84 = *(int *)(local_848.hit + 0x78);
                        iVar85 = *(int *)(local_848.hit + 0x7c);
                        bVar13 = (bool)((byte)(uVar36 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar36 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar36 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar36 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar36 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar36 >> 6) & 1);
                        bVar19 = (bool)((byte)(uVar36 >> 7) & 1);
                        bVar20 = (bool)((byte)(uVar36 >> 9) & 1);
                        bVar21 = (bool)((byte)(uVar36 >> 10) & 1);
                        bVar22 = (bool)((byte)(uVar36 >> 0xb) & 1);
                        bVar23 = (bool)((byte)(uVar36 >> 0xc) & 1);
                        bVar24 = (bool)((byte)(uVar36 >> 0xd) & 1);
                        bVar25 = (bool)((byte)(uVar36 >> 0xe) & 1);
                        bVar26 = SUB81(uVar36 >> 0xf,0);
                        *(uint *)(local_848.ray + 0x340) =
                             (uint)(bVar97 & 1) * *(int *)(local_848.hit + 0x40) |
                             (uint)!(bool)(bVar97 & 1) * *(int *)(local_848.ray + 0x340);
                        *(uint *)(local_848.ray + 0x344) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_848.ray + 0x344);
                        *(uint *)(local_848.ray + 0x348) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_848.ray + 0x348);
                        *(uint *)(local_848.ray + 0x34c) =
                             (uint)bVar15 * iVar73 | (uint)!bVar15 * *(int *)(local_848.ray + 0x34c)
                        ;
                        *(uint *)(local_848.ray + 0x350) =
                             (uint)bVar16 * iVar74 | (uint)!bVar16 * *(int *)(local_848.ray + 0x350)
                        ;
                        *(uint *)(local_848.ray + 0x354) =
                             (uint)bVar17 * iVar75 | (uint)!bVar17 * *(int *)(local_848.ray + 0x354)
                        ;
                        *(uint *)(local_848.ray + 0x358) =
                             (uint)bVar18 * iVar76 | (uint)!bVar18 * *(int *)(local_848.ray + 0x358)
                        ;
                        *(uint *)(local_848.ray + 0x35c) =
                             (uint)bVar19 * iVar77 | (uint)!bVar19 * *(int *)(local_848.ray + 0x35c)
                        ;
                        *(uint *)(local_848.ray + 0x360) =
                             (uint)(bVar88 & 1) * iVar78 |
                             (uint)!(bool)(bVar88 & 1) * *(int *)(local_848.ray + 0x360);
                        *(uint *)(local_848.ray + 0x364) =
                             (uint)bVar20 * iVar79 | (uint)!bVar20 * *(int *)(local_848.ray + 0x364)
                        ;
                        *(uint *)(local_848.ray + 0x368) =
                             (uint)bVar21 * iVar80 | (uint)!bVar21 * *(int *)(local_848.ray + 0x368)
                        ;
                        *(uint *)(local_848.ray + 0x36c) =
                             (uint)bVar22 * iVar81 | (uint)!bVar22 * *(int *)(local_848.ray + 0x36c)
                        ;
                        *(uint *)(local_848.ray + 0x370) =
                             (uint)bVar23 * iVar82 | (uint)!bVar23 * *(int *)(local_848.ray + 0x370)
                        ;
                        *(uint *)(local_848.ray + 0x374) =
                             (uint)bVar24 * iVar83 | (uint)!bVar24 * *(int *)(local_848.ray + 0x374)
                        ;
                        *(uint *)(local_848.ray + 0x378) =
                             (uint)bVar25 * iVar84 | (uint)!bVar25 * *(int *)(local_848.ray + 0x378)
                        ;
                        *(uint *)(local_848.ray + 0x37c) =
                             (uint)bVar26 * iVar85 | (uint)!bVar26 * *(int *)(local_848.ray + 0x37c)
                        ;
                        iVar1 = *(int *)(local_848.hit + 0x84);
                        iVar2 = *(int *)(local_848.hit + 0x88);
                        iVar73 = *(int *)(local_848.hit + 0x8c);
                        iVar74 = *(int *)(local_848.hit + 0x90);
                        iVar75 = *(int *)(local_848.hit + 0x94);
                        iVar76 = *(int *)(local_848.hit + 0x98);
                        iVar77 = *(int *)(local_848.hit + 0x9c);
                        iVar78 = *(int *)(local_848.hit + 0xa0);
                        iVar79 = *(int *)(local_848.hit + 0xa4);
                        iVar80 = *(int *)(local_848.hit + 0xa8);
                        iVar81 = *(int *)(local_848.hit + 0xac);
                        iVar82 = *(int *)(local_848.hit + 0xb0);
                        iVar83 = *(int *)(local_848.hit + 0xb4);
                        iVar84 = *(int *)(local_848.hit + 0xb8);
                        iVar85 = *(int *)(local_848.hit + 0xbc);
                        bVar13 = (bool)((byte)(uVar36 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar36 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar36 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar36 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar36 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar36 >> 6) & 1);
                        bVar19 = (bool)((byte)(uVar36 >> 7) & 1);
                        bVar20 = (bool)((byte)(uVar36 >> 9) & 1);
                        bVar21 = (bool)((byte)(uVar36 >> 10) & 1);
                        bVar22 = (bool)((byte)(uVar36 >> 0xb) & 1);
                        bVar23 = (bool)((byte)(uVar36 >> 0xc) & 1);
                        bVar24 = (bool)((byte)(uVar36 >> 0xd) & 1);
                        bVar25 = (bool)((byte)(uVar36 >> 0xe) & 1);
                        bVar26 = SUB81(uVar36 >> 0xf,0);
                        *(uint *)(local_848.ray + 0x380) =
                             (uint)(bVar97 & 1) * *(int *)(local_848.hit + 0x80) |
                             (uint)!(bool)(bVar97 & 1) * *(int *)(local_848.ray + 0x380);
                        *(uint *)(local_848.ray + 900) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_848.ray + 900);
                        *(uint *)(local_848.ray + 0x388) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_848.ray + 0x388);
                        *(uint *)(local_848.ray + 0x38c) =
                             (uint)bVar15 * iVar73 | (uint)!bVar15 * *(int *)(local_848.ray + 0x38c)
                        ;
                        *(uint *)(local_848.ray + 0x390) =
                             (uint)bVar16 * iVar74 | (uint)!bVar16 * *(int *)(local_848.ray + 0x390)
                        ;
                        *(uint *)(local_848.ray + 0x394) =
                             (uint)bVar17 * iVar75 | (uint)!bVar17 * *(int *)(local_848.ray + 0x394)
                        ;
                        *(uint *)(local_848.ray + 0x398) =
                             (uint)bVar18 * iVar76 | (uint)!bVar18 * *(int *)(local_848.ray + 0x398)
                        ;
                        *(uint *)(local_848.ray + 0x39c) =
                             (uint)bVar19 * iVar77 | (uint)!bVar19 * *(int *)(local_848.ray + 0x39c)
                        ;
                        *(uint *)(local_848.ray + 0x3a0) =
                             (uint)(bVar88 & 1) * iVar78 |
                             (uint)!(bool)(bVar88 & 1) * *(int *)(local_848.ray + 0x3a0);
                        *(uint *)(local_848.ray + 0x3a4) =
                             (uint)bVar20 * iVar79 | (uint)!bVar20 * *(int *)(local_848.ray + 0x3a4)
                        ;
                        *(uint *)(local_848.ray + 0x3a8) =
                             (uint)bVar21 * iVar80 | (uint)!bVar21 * *(int *)(local_848.ray + 0x3a8)
                        ;
                        *(uint *)(local_848.ray + 0x3ac) =
                             (uint)bVar22 * iVar81 | (uint)!bVar22 * *(int *)(local_848.ray + 0x3ac)
                        ;
                        *(uint *)(local_848.ray + 0x3b0) =
                             (uint)bVar23 * iVar82 | (uint)!bVar23 * *(int *)(local_848.ray + 0x3b0)
                        ;
                        *(uint *)(local_848.ray + 0x3b4) =
                             (uint)bVar24 * iVar83 | (uint)!bVar24 * *(int *)(local_848.ray + 0x3b4)
                        ;
                        *(uint *)(local_848.ray + 0x3b8) =
                             (uint)bVar25 * iVar84 | (uint)!bVar25 * *(int *)(local_848.ray + 0x3b8)
                        ;
                        *(uint *)(local_848.ray + 0x3bc) =
                             (uint)bVar26 * iVar85 | (uint)!bVar26 * *(int *)(local_848.ray + 0x3bc)
                        ;
                        iVar1 = *(int *)(local_848.hit + 0xc4);
                        iVar2 = *(int *)(local_848.hit + 200);
                        iVar73 = *(int *)(local_848.hit + 0xcc);
                        iVar74 = *(int *)(local_848.hit + 0xd0);
                        iVar75 = *(int *)(local_848.hit + 0xd4);
                        iVar76 = *(int *)(local_848.hit + 0xd8);
                        iVar77 = *(int *)(local_848.hit + 0xdc);
                        iVar78 = *(int *)(local_848.hit + 0xe0);
                        iVar79 = *(int *)(local_848.hit + 0xe4);
                        iVar80 = *(int *)(local_848.hit + 0xe8);
                        iVar81 = *(int *)(local_848.hit + 0xec);
                        iVar82 = *(int *)(local_848.hit + 0xf0);
                        iVar83 = *(int *)(local_848.hit + 0xf4);
                        iVar84 = *(int *)(local_848.hit + 0xf8);
                        iVar85 = *(int *)(local_848.hit + 0xfc);
                        bVar13 = (bool)((byte)(uVar36 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar36 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar36 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar36 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar36 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar36 >> 6) & 1);
                        bVar19 = (bool)((byte)(uVar36 >> 7) & 1);
                        bVar20 = (bool)((byte)(uVar36 >> 9) & 1);
                        bVar21 = (bool)((byte)(uVar36 >> 10) & 1);
                        bVar22 = (bool)((byte)(uVar36 >> 0xb) & 1);
                        bVar23 = (bool)((byte)(uVar36 >> 0xc) & 1);
                        bVar24 = (bool)((byte)(uVar36 >> 0xd) & 1);
                        bVar25 = (bool)((byte)(uVar36 >> 0xe) & 1);
                        bVar26 = SUB81(uVar36 >> 0xf,0);
                        *(uint *)(local_848.ray + 0x3c0) =
                             (uint)(bVar97 & 1) * *(int *)(local_848.hit + 0xc0) |
                             (uint)!(bool)(bVar97 & 1) * *(int *)(local_848.ray + 0x3c0);
                        *(uint *)(local_848.ray + 0x3c4) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_848.ray + 0x3c4);
                        *(uint *)(local_848.ray + 0x3c8) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_848.ray + 0x3c8);
                        *(uint *)(local_848.ray + 0x3cc) =
                             (uint)bVar15 * iVar73 | (uint)!bVar15 * *(int *)(local_848.ray + 0x3cc)
                        ;
                        *(uint *)(local_848.ray + 0x3d0) =
                             (uint)bVar16 * iVar74 | (uint)!bVar16 * *(int *)(local_848.ray + 0x3d0)
                        ;
                        *(uint *)(local_848.ray + 0x3d4) =
                             (uint)bVar17 * iVar75 | (uint)!bVar17 * *(int *)(local_848.ray + 0x3d4)
                        ;
                        *(uint *)(local_848.ray + 0x3d8) =
                             (uint)bVar18 * iVar76 | (uint)!bVar18 * *(int *)(local_848.ray + 0x3d8)
                        ;
                        *(uint *)(local_848.ray + 0x3dc) =
                             (uint)bVar19 * iVar77 | (uint)!bVar19 * *(int *)(local_848.ray + 0x3dc)
                        ;
                        *(uint *)(local_848.ray + 0x3e0) =
                             (uint)(bVar88 & 1) * iVar78 |
                             (uint)!(bool)(bVar88 & 1) * *(int *)(local_848.ray + 0x3e0);
                        *(uint *)(local_848.ray + 0x3e4) =
                             (uint)bVar20 * iVar79 | (uint)!bVar20 * *(int *)(local_848.ray + 0x3e4)
                        ;
                        *(uint *)(local_848.ray + 1000) =
                             (uint)bVar21 * iVar80 | (uint)!bVar21 * *(int *)(local_848.ray + 1000);
                        *(uint *)(local_848.ray + 0x3ec) =
                             (uint)bVar22 * iVar81 | (uint)!bVar22 * *(int *)(local_848.ray + 0x3ec)
                        ;
                        *(uint *)(local_848.ray + 0x3f0) =
                             (uint)bVar23 * iVar82 | (uint)!bVar23 * *(int *)(local_848.ray + 0x3f0)
                        ;
                        *(uint *)(local_848.ray + 0x3f4) =
                             (uint)bVar24 * iVar83 | (uint)!bVar24 * *(int *)(local_848.ray + 0x3f4)
                        ;
                        *(uint *)(local_848.ray + 0x3f8) =
                             (uint)bVar25 * iVar84 | (uint)!bVar25 * *(int *)(local_848.ray + 0x3f8)
                        ;
                        *(uint *)(local_848.ray + 0x3fc) =
                             (uint)bVar26 * iVar85 | (uint)!bVar26 * *(int *)(local_848.ray + 0x3fc)
                        ;
                        iVar1 = *(int *)(local_848.hit + 0x104);
                        iVar2 = *(int *)(local_848.hit + 0x108);
                        iVar73 = *(int *)(local_848.hit + 0x10c);
                        iVar74 = *(int *)(local_848.hit + 0x110);
                        iVar75 = *(int *)(local_848.hit + 0x114);
                        iVar76 = *(int *)(local_848.hit + 0x118);
                        iVar77 = *(int *)(local_848.hit + 0x11c);
                        iVar78 = *(int *)(local_848.hit + 0x120);
                        iVar79 = *(int *)(local_848.hit + 0x124);
                        iVar80 = *(int *)(local_848.hit + 0x128);
                        iVar81 = *(int *)(local_848.hit + 300);
                        iVar82 = *(int *)(local_848.hit + 0x130);
                        iVar83 = *(int *)(local_848.hit + 0x134);
                        iVar84 = *(int *)(local_848.hit + 0x138);
                        iVar85 = *(int *)(local_848.hit + 0x13c);
                        bVar13 = (bool)((byte)(uVar36 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar36 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar36 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar36 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar36 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar36 >> 6) & 1);
                        bVar19 = (bool)((byte)(uVar36 >> 7) & 1);
                        bVar20 = (bool)((byte)(uVar36 >> 9) & 1);
                        bVar21 = (bool)((byte)(uVar36 >> 10) & 1);
                        bVar22 = (bool)((byte)(uVar36 >> 0xb) & 1);
                        bVar23 = (bool)((byte)(uVar36 >> 0xc) & 1);
                        bVar24 = (bool)((byte)(uVar36 >> 0xd) & 1);
                        bVar25 = (bool)((byte)(uVar36 >> 0xe) & 1);
                        bVar26 = SUB81(uVar36 >> 0xf,0);
                        *(uint *)(local_848.ray + 0x400) =
                             (uint)(bVar97 & 1) * *(int *)(local_848.hit + 0x100) |
                             (uint)!(bool)(bVar97 & 1) * *(int *)(local_848.ray + 0x400);
                        *(uint *)(local_848.ray + 0x404) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_848.ray + 0x404);
                        *(uint *)(local_848.ray + 0x408) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_848.ray + 0x408);
                        *(uint *)(local_848.ray + 0x40c) =
                             (uint)bVar15 * iVar73 | (uint)!bVar15 * *(int *)(local_848.ray + 0x40c)
                        ;
                        *(uint *)(local_848.ray + 0x410) =
                             (uint)bVar16 * iVar74 | (uint)!bVar16 * *(int *)(local_848.ray + 0x410)
                        ;
                        *(uint *)(local_848.ray + 0x414) =
                             (uint)bVar17 * iVar75 | (uint)!bVar17 * *(int *)(local_848.ray + 0x414)
                        ;
                        *(uint *)(local_848.ray + 0x418) =
                             (uint)bVar18 * iVar76 | (uint)!bVar18 * *(int *)(local_848.ray + 0x418)
                        ;
                        *(uint *)(local_848.ray + 0x41c) =
                             (uint)bVar19 * iVar77 | (uint)!bVar19 * *(int *)(local_848.ray + 0x41c)
                        ;
                        *(uint *)(local_848.ray + 0x420) =
                             (uint)(bVar88 & 1) * iVar78 |
                             (uint)!(bool)(bVar88 & 1) * *(int *)(local_848.ray + 0x420);
                        *(uint *)(local_848.ray + 0x424) =
                             (uint)bVar20 * iVar79 | (uint)!bVar20 * *(int *)(local_848.ray + 0x424)
                        ;
                        *(uint *)(local_848.ray + 0x428) =
                             (uint)bVar21 * iVar80 | (uint)!bVar21 * *(int *)(local_848.ray + 0x428)
                        ;
                        *(uint *)(local_848.ray + 0x42c) =
                             (uint)bVar22 * iVar81 | (uint)!bVar22 * *(int *)(local_848.ray + 0x42c)
                        ;
                        *(uint *)(local_848.ray + 0x430) =
                             (uint)bVar23 * iVar82 | (uint)!bVar23 * *(int *)(local_848.ray + 0x430)
                        ;
                        *(uint *)(local_848.ray + 0x434) =
                             (uint)bVar24 * iVar83 | (uint)!bVar24 * *(int *)(local_848.ray + 0x434)
                        ;
                        *(uint *)(local_848.ray + 0x438) =
                             (uint)bVar25 * iVar84 | (uint)!bVar25 * *(int *)(local_848.ray + 0x438)
                        ;
                        *(uint *)(local_848.ray + 0x43c) =
                             (uint)bVar26 * iVar85 | (uint)!bVar26 * *(int *)(local_848.ray + 0x43c)
                        ;
                        auVar250 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_848.hit + 0x140));
                        auVar250 = vmovdqu32_avx512f(auVar250);
                        *(undefined1 (*) [64])(local_848.ray + 0x440) = auVar250;
                        auVar250 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_848.hit + 0x180));
                        auVar250 = vmovdqu32_avx512f(auVar250);
                        *(undefined1 (*) [64])(local_848.ray + 0x480) = auVar250;
                        auVar250 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_848.hit + 0x1c0));
                        auVar250 = vmovdqa32_avx512f(auVar250);
                        *(undefined1 (*) [64])(local_848.ray + 0x4c0) = auVar250;
                        auVar250 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_848.hit + 0x200));
                        auVar250 = vmovdqa32_avx512f(auVar250);
                        *(undefined1 (*) [64])(local_848.ray + 0x500) = auVar250;
                        auVar250 = ZEXT464(*(uint *)(ray + k * 4 + 0x200));
                      }
                      bVar97 = ~(byte)(1 << ((uint)uVar89 & 0x1f)) & (byte)uVar98;
                      uVar163 = auVar250._0_4_;
                      auVar177._4_4_ = uVar163;
                      auVar177._0_4_ = uVar163;
                      auVar177._8_4_ = uVar163;
                      auVar177._12_4_ = uVar163;
                      auVar177._16_4_ = uVar163;
                      auVar177._20_4_ = uVar163;
                      auVar177._24_4_ = uVar163;
                      auVar177._28_4_ = uVar163;
                      uVar184 = vcmpps_avx512vl(auVar235._0_32_,auVar177,2);
                      if ((bVar97 & (byte)uVar184) == 0) goto LAB_01bbc6a5;
                      bVar97 = bVar97 & (byte)uVar184;
                      uVar98 = (ulong)bVar97;
                      auVar178._8_4_ = 0x7f800000;
                      auVar178._0_8_ = 0x7f8000007f800000;
                      auVar178._12_4_ = 0x7f800000;
                      auVar178._16_4_ = 0x7f800000;
                      auVar178._20_4_ = 0x7f800000;
                      auVar178._24_4_ = 0x7f800000;
                      auVar178._28_4_ = 0x7f800000;
                      auVar126 = vblendmps_avx512vl(auVar178,auVar235._0_32_);
                      auVar151._0_4_ =
                           (uint)(bVar97 & 1) * auVar126._0_4_ |
                           (uint)!(bool)(bVar97 & 1) * 0x7f800000;
                      bVar13 = (bool)(bVar97 >> 1 & 1);
                      auVar151._4_4_ = (uint)bVar13 * auVar126._4_4_ | (uint)!bVar13 * 0x7f800000;
                      bVar13 = (bool)(bVar97 >> 2 & 1);
                      auVar151._8_4_ = (uint)bVar13 * auVar126._8_4_ | (uint)!bVar13 * 0x7f800000;
                      bVar13 = (bool)(bVar97 >> 3 & 1);
                      auVar151._12_4_ = (uint)bVar13 * auVar126._12_4_ | (uint)!bVar13 * 0x7f800000;
                      bVar13 = (bool)(bVar97 >> 4 & 1);
                      auVar151._16_4_ = (uint)bVar13 * auVar126._16_4_ | (uint)!bVar13 * 0x7f800000;
                      bVar13 = (bool)(bVar97 >> 5 & 1);
                      auVar151._20_4_ = (uint)bVar13 * auVar126._20_4_ | (uint)!bVar13 * 0x7f800000;
                      bVar13 = (bool)(bVar97 >> 6 & 1);
                      auVar151._24_4_ = (uint)bVar13 * auVar126._24_4_ | (uint)!bVar13 * 0x7f800000;
                      auVar151._28_4_ =
                           (uint)(bVar97 >> 7) * auVar126._28_4_ |
                           (uint)!(bool)(bVar97 >> 7) * 0x7f800000;
                      auVar126 = vshufps_avx(auVar151,auVar151,0xb1);
                      auVar126 = vminps_avx(auVar151,auVar126);
                      auVar127 = vshufpd_avx(auVar126,auVar126,5);
                      auVar126 = vminps_avx(auVar126,auVar127);
                      auVar127 = vpermpd_avx2(auVar126,0x4e);
                      auVar126 = vminps_avx(auVar126,auVar127);
                      uVar184 = vcmpps_avx512vl(auVar151,auVar126,0);
                      bVar88 = (byte)uVar184 & bVar97;
                      if (bVar88 != 0) {
                        bVar97 = bVar88;
                      }
                      uVar90 = 0;
                      for (uVar91 = (uint)bVar97; (uVar91 & 1) == 0;
                          uVar91 = uVar91 >> 1 | 0x80000000) {
                        uVar90 = uVar90 + 1;
                      }
                      uVar89 = (ulong)uVar90;
                    } while( true );
                  }
                  fVar191 = local_580[uVar89];
                  uVar163 = *(undefined4 *)(local_560 + uVar89 * 4);
                  fVar236 = 1.0 - fVar191;
                  auVar38._8_4_ = 0x80000000;
                  auVar38._0_8_ = 0x8000000080000000;
                  auVar38._12_4_ = 0x80000000;
                  auVar108 = vxorps_avx512vl(ZEXT416((uint)fVar236),auVar38);
                  auVar101 = ZEXT416((uint)(fVar191 * fVar236 * 4.0));
                  auVar102 = vfnmsub213ss_fma(ZEXT416((uint)fVar191),ZEXT416((uint)fVar191),auVar101
                                             );
                  auVar101 = vfmadd213ss_fma(ZEXT416((uint)fVar236),ZEXT416((uint)fVar236),auVar101)
                  ;
                  fVar236 = fVar236 * auVar108._0_4_ * 0.5;
                  fVar237 = auVar102._0_4_ * 0.5;
                  auVar228 = ZEXT464((uint)fVar237);
                  fVar183 = auVar101._0_4_ * 0.5;
                  fVar190 = fVar191 * fVar191 * 0.5;
                  auVar212._0_4_ = fVar190 * fVar162;
                  auVar212._4_4_ = fVar190 * fVar180;
                  auVar212._8_4_ = fVar190 * fVar181;
                  auVar212._12_4_ = fVar190 * fVar182;
                  auVar197._4_4_ = fVar183;
                  auVar197._0_4_ = fVar183;
                  auVar197._8_4_ = fVar183;
                  auVar197._12_4_ = fVar183;
                  auVar101 = vfmadd132ps_fma(auVar197,auVar212,auVar106);
                  auVar213._4_4_ = fVar237;
                  auVar213._0_4_ = fVar237;
                  auVar213._8_4_ = fVar237;
                  auVar213._12_4_ = fVar237;
                  auVar101 = vfmadd132ps_fma(auVar213,auVar101,auVar28);
                  auVar222 = ZEXT1664(auVar101);
                  auVar198._4_4_ = fVar236;
                  auVar198._0_4_ = fVar236;
                  auVar198._8_4_ = fVar236;
                  auVar198._12_4_ = fVar236;
                  auVar101 = vfmadd132ps_fma(auVar198,auVar101,auVar27);
                  *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_540 + uVar89 * 4);
                  *(int *)(ray + k * 4 + 0x300) = auVar101._0_4_;
                  uVar9 = vextractps_avx(auVar101,1);
                  *(undefined4 *)(ray + k * 4 + 0x340) = uVar9;
                  uVar9 = vextractps_avx(auVar101,2);
                  *(undefined4 *)(ray + k * 4 + 0x380) = uVar9;
                  *(float *)(ray + k * 4 + 0x3c0) = fVar191;
                  *(undefined4 *)(ray + k * 4 + 0x400) = uVar163;
                  *(uint *)(ray + k * 4 + 0x440) = uVar7;
                  *(uint *)(ray + k * 4 + 0x480) = uVar95;
                  *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                }
              }
            }
          }
        }
      }
LAB_01bbc6a5:
      auVar235 = local_400;
      if (8 < iVar8) {
        local_7c0 = vpbroadcastd_avx512vl();
        local_400._4_4_ = local_7e0._0_4_;
        local_400._0_4_ = local_7e0._0_4_;
        local_400._8_4_ = local_7e0._0_4_;
        local_400._12_4_ = local_7e0._0_4_;
        local_400._16_4_ = local_7e0._0_4_;
        local_400._20_4_ = local_7e0._0_4_;
        local_400._24_4_ = local_7e0._0_4_;
        local_400._32_32_ = auVar235._32_32_;
        local_400._28_4_ = local_7e0._0_4_;
        uStack_79c = local_7a0;
        uStack_798 = local_7a0;
        uStack_794 = local_7a0;
        uStack_790 = local_7a0;
        uStack_78c = local_7a0;
        uStack_788 = local_7a0;
        uStack_784 = local_7a0;
        local_3a0 = 1.0 / (float)local_480._0_4_;
        fStack_39c = local_3a0;
        fStack_398 = local_3a0;
        fStack_394 = local_3a0;
        fStack_390 = local_3a0;
        fStack_38c = local_3a0;
        fStack_388 = local_3a0;
        fStack_384 = local_3a0;
        auVar235 = vpbroadcastd_avx512f();
        local_480 = vmovdqa64_avx512f(auVar235);
        auVar235 = vpbroadcastd_avx512f();
        local_440 = vmovdqa64_avx512f(auVar235);
        lVar92 = 8;
LAB_01bbc762:
        auVar126 = vpbroadcastd_avx512vl();
        auVar126 = vpor_avx2(auVar126,_DAT_01fe9900);
        uVar35 = vpcmpd_avx512vl(auVar126,local_7c0,1);
        auVar126 = *(undefined1 (*) [32])(bspline_basis0 + lVar92 * 4 + lVar37);
        auVar127 = *(undefined1 (*) [32])(lVar37 + 0x21aefac + lVar92 * 4);
        auVar125 = *(undefined1 (*) [32])(lVar37 + 0x21af430 + lVar92 * 4);
        auVar124 = *(undefined1 (*) [32])(lVar37 + 0x21af8b4 + lVar92 * 4);
        fVar191 = auVar124._0_4_;
        auVar235._0_4_ = fVar191 * (float)local_720._0_4_;
        fVar236 = auVar124._4_4_;
        auVar235._4_4_ = fVar236 * (float)local_720._4_4_;
        fVar237 = auVar124._8_4_;
        auVar235._8_4_ = fVar237 * fStack_718;
        fVar183 = auVar124._12_4_;
        auVar235._12_4_ = fVar183 * fStack_714;
        fVar190 = auVar124._16_4_;
        auVar235._16_4_ = fVar190 * fStack_710;
        fVar203 = auVar124._20_4_;
        auVar235._20_4_ = fVar203 * fStack_70c;
        auVar235._28_36_ = auVar228._28_36_;
        fVar99 = auVar124._24_4_;
        auVar235._24_4_ = fVar99 * fStack_708;
        auVar228._0_4_ = fVar191 * (float)local_740._0_4_;
        auVar228._4_4_ = fVar236 * (float)local_740._4_4_;
        auVar228._8_4_ = fVar237 * fStack_738;
        auVar228._12_4_ = fVar183 * fStack_734;
        auVar228._16_4_ = fVar190 * fStack_730;
        auVar228._20_4_ = fVar203 * fStack_72c;
        auVar228._28_36_ = auVar222._28_36_;
        auVar228._24_4_ = fVar99 * fStack_728;
        auVar112 = vmulps_avx512vl(local_380,auVar124);
        auVar113 = vfmadd231ps_avx512vl(auVar235._0_32_,auVar125,local_6e0);
        auVar123 = vfmadd231ps_avx512vl(auVar228._0_32_,auVar125,local_700);
        auVar112 = vfmadd231ps_avx512vl(auVar112,auVar125,local_360);
        auVar113 = vfmadd231ps_avx512vl(auVar113,auVar127,local_6a0);
        auVar123 = vfmadd231ps_avx512vl(auVar123,auVar127,local_6c0);
        auVar114 = vfmadd231ps_avx512vl(auVar112,auVar127,local_340);
        auVar101 = vfmadd231ps_fma(auVar113,auVar126,local_660);
        auVar228 = ZEXT1664(auVar101);
        auVar102 = vfmadd231ps_fma(auVar123,auVar126,local_680);
        auVar222 = ZEXT1664(auVar102);
        auVar112 = *(undefined1 (*) [32])(bspline_basis1 + lVar92 * 4 + lVar37);
        auVar113 = *(undefined1 (*) [32])(lVar37 + 0x21b13cc + lVar92 * 4);
        auVar115 = vfmadd231ps_avx512vl(auVar114,auVar126,local_320);
        auVar123 = *(undefined1 (*) [32])(lVar37 + 0x21b1850 + lVar92 * 4);
        auVar114 = *(undefined1 (*) [32])(lVar37 + 0x21b1cd4 + lVar92 * 4);
        fVar100 = auVar114._0_4_;
        auVar250._0_4_ = fVar100 * (float)local_720._0_4_;
        fVar153 = auVar114._4_4_;
        auVar250._4_4_ = fVar153 * (float)local_720._4_4_;
        fVar154 = auVar114._8_4_;
        auVar250._8_4_ = fVar154 * fStack_718;
        fVar155 = auVar114._12_4_;
        auVar250._12_4_ = fVar155 * fStack_714;
        fVar156 = auVar114._16_4_;
        auVar250._16_4_ = fVar156 * fStack_710;
        fVar158 = auVar114._20_4_;
        auVar250._20_4_ = fVar158 * fStack_70c;
        auVar250._28_36_ = auVar233._28_36_;
        fVar159 = auVar114._24_4_;
        auVar250._24_4_ = fVar159 * fStack_708;
        auVar53._4_4_ = fVar153 * (float)local_740._4_4_;
        auVar53._0_4_ = fVar100 * (float)local_740._0_4_;
        auVar53._8_4_ = fVar154 * fStack_738;
        auVar53._12_4_ = fVar155 * fStack_734;
        auVar53._16_4_ = fVar156 * fStack_730;
        auVar53._20_4_ = fVar158 * fStack_72c;
        auVar53._24_4_ = fVar159 * fStack_728;
        auVar53._28_4_ = uStack_724;
        auVar117 = vmulps_avx512vl(local_380,auVar114);
        auVar116 = vfmadd231ps_avx512vl(auVar250._0_32_,auVar123,local_6e0);
        auVar118 = vfmadd231ps_avx512vl(auVar53,auVar123,local_700);
        auVar117 = vfmadd231ps_avx512vl(auVar117,auVar123,local_360);
        auVar116 = vfmadd231ps_avx512vl(auVar116,auVar113,local_6a0);
        auVar118 = vfmadd231ps_avx512vl(auVar118,auVar113,local_6c0);
        auVar117 = vfmadd231ps_avx512vl(auVar117,auVar113,local_340);
        auVar108 = vfmadd231ps_fma(auVar116,auVar112,local_660);
        auVar233 = ZEXT1664(auVar108);
        auVar29 = vfmadd231ps_fma(auVar118,auVar112,local_680);
        auVar116 = vfmadd231ps_avx512vl(auVar117,auVar112,local_320);
        auVar118 = vmaxps_avx512vl(auVar115,auVar116);
        auVar117 = vsubps_avx(ZEXT1632(auVar108),ZEXT1632(auVar101));
        auVar119 = vsubps_avx512vl(ZEXT1632(auVar29),ZEXT1632(auVar102));
        auVar120 = vmulps_avx512vl(ZEXT1632(auVar102),auVar117);
        auVar121 = vmulps_avx512vl(ZEXT1632(auVar101),auVar119);
        auVar120 = vsubps_avx512vl(auVar120,auVar121);
        auVar121 = vmulps_avx512vl(auVar119,auVar119);
        auVar121 = vfmadd231ps_avx512vl(auVar121,auVar117,auVar117);
        auVar118 = vmulps_avx512vl(auVar118,auVar118);
        auVar118 = vmulps_avx512vl(auVar118,auVar121);
        auVar120 = vmulps_avx512vl(auVar120,auVar120);
        uVar184 = vcmpps_avx512vl(auVar120,auVar118,2);
        bVar97 = (byte)uVar35 & (byte)uVar184;
        if (bVar97 != 0) {
          fVar157 = local_500._0_4_;
          fVar160 = local_500._4_4_;
          auVar54._4_4_ = fVar160 * fVar153;
          auVar54._0_4_ = fVar157 * fVar100;
          fVar100 = local_500._8_4_;
          auVar54._8_4_ = fVar100 * fVar154;
          fVar153 = local_500._12_4_;
          auVar54._12_4_ = fVar153 * fVar155;
          fVar154 = local_500._16_4_;
          auVar54._16_4_ = fVar154 * fVar156;
          fVar155 = local_500._20_4_;
          auVar54._20_4_ = fVar155 * fVar158;
          fVar156 = local_500._24_4_;
          auVar54._24_4_ = fVar156 * fVar159;
          auVar54._28_4_ = auVar114._28_4_;
          auVar123 = vfmadd213ps_avx512vl(auVar123,local_4e0,auVar54);
          auVar113 = vfmadd213ps_avx512vl(auVar113,local_4c0,auVar123);
          auVar112 = vfmadd213ps_avx512vl(auVar112,local_4a0,auVar113);
          auVar55._4_4_ = fVar160 * fVar236;
          auVar55._0_4_ = fVar157 * fVar191;
          auVar55._8_4_ = fVar100 * fVar237;
          auVar55._12_4_ = fVar153 * fVar183;
          auVar55._16_4_ = fVar154 * fVar190;
          auVar55._20_4_ = fVar155 * fVar203;
          auVar55._24_4_ = fVar156 * fVar99;
          auVar55._28_4_ = auVar124._28_4_;
          auVar125 = vfmadd213ps_avx512vl(auVar125,local_4e0,auVar55);
          auVar127 = vfmadd213ps_avx512vl(auVar127,local_4c0,auVar125);
          auVar113 = vfmadd213ps_avx512vl(auVar126,local_4a0,auVar127);
          auVar126 = *(undefined1 (*) [32])(lVar37 + 0x21afd38 + lVar92 * 4);
          auVar127 = *(undefined1 (*) [32])(lVar37 + 0x21b01bc + lVar92 * 4);
          auVar125 = *(undefined1 (*) [32])(lVar37 + 0x21b0640 + lVar92 * 4);
          auVar124 = *(undefined1 (*) [32])(lVar37 + 0x21b0ac4 + lVar92 * 4);
          auVar123 = vmulps_avx512vl(_local_720,auVar124);
          auVar114 = vmulps_avx512vl(_local_740,auVar124);
          auVar56._4_4_ = fVar160 * auVar124._4_4_;
          auVar56._0_4_ = fVar157 * auVar124._0_4_;
          auVar56._8_4_ = fVar100 * auVar124._8_4_;
          auVar56._12_4_ = fVar153 * auVar124._12_4_;
          auVar56._16_4_ = fVar154 * auVar124._16_4_;
          auVar56._20_4_ = fVar155 * auVar124._20_4_;
          auVar56._24_4_ = fVar156 * auVar124._24_4_;
          auVar56._28_4_ = auVar124._28_4_;
          auVar124 = vfmadd231ps_avx512vl(auVar123,auVar125,local_6e0);
          auVar123 = vfmadd231ps_avx512vl(auVar114,auVar125,local_700);
          auVar125 = vfmadd231ps_avx512vl(auVar56,local_4e0,auVar125);
          auVar124 = vfmadd231ps_avx512vl(auVar124,auVar127,local_6a0);
          auVar123 = vfmadd231ps_avx512vl(auVar123,auVar127,local_6c0);
          auVar127 = vfmadd231ps_avx512vl(auVar125,local_4c0,auVar127);
          auVar124 = vfmadd231ps_avx512vl(auVar124,auVar126,local_660);
          auVar123 = vfmadd231ps_avx512vl(auVar123,auVar126,local_680);
          auVar114 = vfmadd231ps_avx512vl(auVar127,local_4a0,auVar126);
          auVar126 = *(undefined1 (*) [32])(lVar37 + 0x21b2158 + lVar92 * 4);
          auVar127 = *(undefined1 (*) [32])(lVar37 + 0x21b2a60 + lVar92 * 4);
          auVar125 = *(undefined1 (*) [32])(lVar37 + 0x21b2ee4 + lVar92 * 4);
          auVar118 = vmulps_avx512vl(_local_720,auVar125);
          auVar120 = vmulps_avx512vl(_local_740,auVar125);
          auVar125 = vmulps_avx512vl(local_500,auVar125);
          auVar118 = vfmadd231ps_avx512vl(auVar118,auVar127,local_6e0);
          auVar120 = vfmadd231ps_avx512vl(auVar120,auVar127,local_700);
          auVar125 = vfmadd231ps_avx512vl(auVar125,local_4e0,auVar127);
          auVar252 = ZEXT1664(auVar252._0_16_);
          auVar127 = *(undefined1 (*) [32])(lVar37 + 0x21b25dc + lVar92 * 4);
          auVar118 = vfmadd231ps_avx512vl(auVar118,auVar127,local_6a0);
          auVar120 = vfmadd231ps_avx512vl(auVar120,auVar127,local_6c0);
          auVar127 = vfmadd231ps_avx512vl(auVar125,local_4c0,auVar127);
          auVar179 = ZEXT1664(auVar179._0_16_);
          auVar125 = vfmadd231ps_avx512vl(auVar118,auVar126,local_660);
          auVar118 = vfmadd231ps_avx512vl(auVar120,auVar126,local_680);
          auVar127 = vfmadd231ps_avx512vl(auVar127,local_4a0,auVar126);
          auVar120 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar124,auVar120);
          vandps_avx512vl(auVar123,auVar120);
          auVar126 = vmaxps_avx(auVar120,auVar120);
          vandps_avx512vl(auVar114,auVar120);
          auVar126 = vmaxps_avx(auVar126,auVar120);
          uVar89 = vcmpps_avx512vl(auVar126,local_400._0_32_,1);
          bVar13 = (bool)((byte)uVar89 & 1);
          auVar139._0_4_ = (float)((uint)bVar13 * auVar117._0_4_ | (uint)!bVar13 * auVar124._0_4_);
          bVar13 = (bool)((byte)(uVar89 >> 1) & 1);
          auVar139._4_4_ = (float)((uint)bVar13 * auVar117._4_4_ | (uint)!bVar13 * auVar124._4_4_);
          bVar13 = (bool)((byte)(uVar89 >> 2) & 1);
          auVar139._8_4_ = (float)((uint)bVar13 * auVar117._8_4_ | (uint)!bVar13 * auVar124._8_4_);
          bVar13 = (bool)((byte)(uVar89 >> 3) & 1);
          auVar139._12_4_ =
               (float)((uint)bVar13 * auVar117._12_4_ | (uint)!bVar13 * auVar124._12_4_);
          bVar13 = (bool)((byte)(uVar89 >> 4) & 1);
          auVar139._16_4_ =
               (float)((uint)bVar13 * auVar117._16_4_ | (uint)!bVar13 * auVar124._16_4_);
          bVar13 = (bool)((byte)(uVar89 >> 5) & 1);
          auVar139._20_4_ =
               (float)((uint)bVar13 * auVar117._20_4_ | (uint)!bVar13 * auVar124._20_4_);
          bVar13 = (bool)((byte)(uVar89 >> 6) & 1);
          auVar139._24_4_ =
               (float)((uint)bVar13 * auVar117._24_4_ | (uint)!bVar13 * auVar124._24_4_);
          bVar13 = SUB81(uVar89 >> 7,0);
          auVar139._28_4_ = (uint)bVar13 * auVar117._28_4_ | (uint)!bVar13 * auVar124._28_4_;
          bVar13 = (bool)((byte)uVar89 & 1);
          auVar140._0_4_ = (float)((uint)bVar13 * auVar119._0_4_ | (uint)!bVar13 * auVar123._0_4_);
          bVar13 = (bool)((byte)(uVar89 >> 1) & 1);
          auVar140._4_4_ = (float)((uint)bVar13 * auVar119._4_4_ | (uint)!bVar13 * auVar123._4_4_);
          bVar13 = (bool)((byte)(uVar89 >> 2) & 1);
          auVar140._8_4_ = (float)((uint)bVar13 * auVar119._8_4_ | (uint)!bVar13 * auVar123._8_4_);
          bVar13 = (bool)((byte)(uVar89 >> 3) & 1);
          auVar140._12_4_ =
               (float)((uint)bVar13 * auVar119._12_4_ | (uint)!bVar13 * auVar123._12_4_);
          bVar13 = (bool)((byte)(uVar89 >> 4) & 1);
          auVar140._16_4_ =
               (float)((uint)bVar13 * auVar119._16_4_ | (uint)!bVar13 * auVar123._16_4_);
          bVar13 = (bool)((byte)(uVar89 >> 5) & 1);
          auVar140._20_4_ =
               (float)((uint)bVar13 * auVar119._20_4_ | (uint)!bVar13 * auVar123._20_4_);
          bVar13 = (bool)((byte)(uVar89 >> 6) & 1);
          auVar140._24_4_ =
               (float)((uint)bVar13 * auVar119._24_4_ | (uint)!bVar13 * auVar123._24_4_);
          bVar13 = SUB81(uVar89 >> 7,0);
          auVar140._28_4_ = (uint)bVar13 * auVar119._28_4_ | (uint)!bVar13 * auVar123._28_4_;
          vandps_avx512vl(auVar125,auVar120);
          vandps_avx512vl(auVar118,auVar120);
          auVar126 = vmaxps_avx(auVar140,auVar140);
          vandps_avx512vl(auVar127,auVar120);
          auVar126 = vmaxps_avx(auVar126,auVar140);
          uVar89 = vcmpps_avx512vl(auVar126,local_400._0_32_,1);
          bVar13 = (bool)((byte)uVar89 & 1);
          auVar141._0_4_ = (uint)bVar13 * auVar117._0_4_ | (uint)!bVar13 * auVar125._0_4_;
          bVar13 = (bool)((byte)(uVar89 >> 1) & 1);
          auVar141._4_4_ = (uint)bVar13 * auVar117._4_4_ | (uint)!bVar13 * auVar125._4_4_;
          bVar13 = (bool)((byte)(uVar89 >> 2) & 1);
          auVar141._8_4_ = (uint)bVar13 * auVar117._8_4_ | (uint)!bVar13 * auVar125._8_4_;
          bVar13 = (bool)((byte)(uVar89 >> 3) & 1);
          auVar141._12_4_ = (uint)bVar13 * auVar117._12_4_ | (uint)!bVar13 * auVar125._12_4_;
          bVar13 = (bool)((byte)(uVar89 >> 4) & 1);
          auVar141._16_4_ = (uint)bVar13 * auVar117._16_4_ | (uint)!bVar13 * auVar125._16_4_;
          bVar13 = (bool)((byte)(uVar89 >> 5) & 1);
          auVar141._20_4_ = (uint)bVar13 * auVar117._20_4_ | (uint)!bVar13 * auVar125._20_4_;
          bVar13 = (bool)((byte)(uVar89 >> 6) & 1);
          auVar141._24_4_ = (uint)bVar13 * auVar117._24_4_ | (uint)!bVar13 * auVar125._24_4_;
          bVar13 = SUB81(uVar89 >> 7,0);
          auVar141._28_4_ = (uint)bVar13 * auVar117._28_4_ | (uint)!bVar13 * auVar125._28_4_;
          bVar13 = (bool)((byte)uVar89 & 1);
          auVar142._0_4_ = (float)((uint)bVar13 * auVar119._0_4_ | (uint)!bVar13 * auVar118._0_4_);
          bVar13 = (bool)((byte)(uVar89 >> 1) & 1);
          auVar142._4_4_ = (float)((uint)bVar13 * auVar119._4_4_ | (uint)!bVar13 * auVar118._4_4_);
          bVar13 = (bool)((byte)(uVar89 >> 2) & 1);
          auVar142._8_4_ = (float)((uint)bVar13 * auVar119._8_4_ | (uint)!bVar13 * auVar118._8_4_);
          bVar13 = (bool)((byte)(uVar89 >> 3) & 1);
          auVar142._12_4_ =
               (float)((uint)bVar13 * auVar119._12_4_ | (uint)!bVar13 * auVar118._12_4_);
          bVar13 = (bool)((byte)(uVar89 >> 4) & 1);
          auVar142._16_4_ =
               (float)((uint)bVar13 * auVar119._16_4_ | (uint)!bVar13 * auVar118._16_4_);
          bVar13 = (bool)((byte)(uVar89 >> 5) & 1);
          auVar142._20_4_ =
               (float)((uint)bVar13 * auVar119._20_4_ | (uint)!bVar13 * auVar118._20_4_);
          bVar13 = (bool)((byte)(uVar89 >> 6) & 1);
          auVar142._24_4_ =
               (float)((uint)bVar13 * auVar119._24_4_ | (uint)!bVar13 * auVar118._24_4_);
          bVar13 = SUB81(uVar89 >> 7,0);
          auVar142._28_4_ = (uint)bVar13 * auVar119._28_4_ | (uint)!bVar13 * auVar118._28_4_;
          auVar240._8_4_ = 0x80000000;
          auVar240._0_8_ = 0x8000000080000000;
          auVar240._12_4_ = 0x80000000;
          auVar240._16_4_ = 0x80000000;
          auVar240._20_4_ = 0x80000000;
          auVar240._24_4_ = 0x80000000;
          auVar240._28_4_ = 0x80000000;
          auVar126 = vxorps_avx512vl(auVar141,auVar240);
          auVar111 = vxorps_avx512vl(auVar120._0_16_,auVar120._0_16_);
          auVar127 = vfmadd213ps_avx512vl(auVar139,auVar139,ZEXT1632(auVar111));
          auVar30 = vfmadd231ps_fma(auVar127,auVar140,auVar140);
          auVar127 = vrsqrt14ps_avx512vl(ZEXT1632(auVar30));
          auVar248._8_4_ = 0xbf000000;
          auVar248._0_8_ = 0xbf000000bf000000;
          auVar248._12_4_ = 0xbf000000;
          auVar248._16_4_ = 0xbf000000;
          auVar248._20_4_ = 0xbf000000;
          auVar248._24_4_ = 0xbf000000;
          auVar248._28_4_ = 0xbf000000;
          fVar191 = auVar127._0_4_;
          fVar236 = auVar127._4_4_;
          fVar237 = auVar127._8_4_;
          fVar183 = auVar127._12_4_;
          fVar190 = auVar127._16_4_;
          fVar203 = auVar127._20_4_;
          fVar99 = auVar127._24_4_;
          auVar57._4_4_ = fVar236 * fVar236 * fVar236 * auVar30._4_4_ * -0.5;
          auVar57._0_4_ = fVar191 * fVar191 * fVar191 * auVar30._0_4_ * -0.5;
          auVar57._8_4_ = fVar237 * fVar237 * fVar237 * auVar30._8_4_ * -0.5;
          auVar57._12_4_ = fVar183 * fVar183 * fVar183 * auVar30._12_4_ * -0.5;
          auVar57._16_4_ = fVar190 * fVar190 * fVar190 * -0.0;
          auVar57._20_4_ = fVar203 * fVar203 * fVar203 * -0.0;
          auVar57._24_4_ = fVar99 * fVar99 * fVar99 * -0.0;
          auVar57._28_4_ = auVar140._28_4_;
          auVar125 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar127 = vfmadd231ps_avx512vl(auVar57,auVar125,auVar127);
          auVar58._4_4_ = auVar140._4_4_ * auVar127._4_4_;
          auVar58._0_4_ = auVar140._0_4_ * auVar127._0_4_;
          auVar58._8_4_ = auVar140._8_4_ * auVar127._8_4_;
          auVar58._12_4_ = auVar140._12_4_ * auVar127._12_4_;
          auVar58._16_4_ = auVar140._16_4_ * auVar127._16_4_;
          auVar58._20_4_ = auVar140._20_4_ * auVar127._20_4_;
          auVar58._24_4_ = auVar140._24_4_ * auVar127._24_4_;
          auVar58._28_4_ = 0;
          auVar59._4_4_ = auVar127._4_4_ * -auVar139._4_4_;
          auVar59._0_4_ = auVar127._0_4_ * -auVar139._0_4_;
          auVar59._8_4_ = auVar127._8_4_ * -auVar139._8_4_;
          auVar59._12_4_ = auVar127._12_4_ * -auVar139._12_4_;
          auVar59._16_4_ = auVar127._16_4_ * -auVar139._16_4_;
          auVar59._20_4_ = auVar127._20_4_ * -auVar139._20_4_;
          auVar59._24_4_ = auVar127._24_4_ * -auVar139._24_4_;
          auVar59._28_4_ = auVar140._28_4_;
          auVar124 = vmulps_avx512vl(auVar127,ZEXT1632(auVar111));
          auVar114 = ZEXT1632(auVar111);
          auVar127 = vfmadd213ps_avx512vl(auVar141,auVar141,auVar114);
          auVar127 = vfmadd231ps_avx512vl(auVar127,auVar142,auVar142);
          auVar123 = vrsqrt14ps_avx512vl(auVar127);
          auVar127 = vmulps_avx512vl(auVar127,auVar248);
          fVar191 = auVar123._0_4_;
          fVar236 = auVar123._4_4_;
          fVar237 = auVar123._8_4_;
          fVar183 = auVar123._12_4_;
          fVar190 = auVar123._16_4_;
          fVar203 = auVar123._20_4_;
          fVar99 = auVar123._24_4_;
          auVar60._4_4_ = fVar236 * fVar236 * fVar236 * auVar127._4_4_;
          auVar60._0_4_ = fVar191 * fVar191 * fVar191 * auVar127._0_4_;
          auVar60._8_4_ = fVar237 * fVar237 * fVar237 * auVar127._8_4_;
          auVar60._12_4_ = fVar183 * fVar183 * fVar183 * auVar127._12_4_;
          auVar60._16_4_ = fVar190 * fVar190 * fVar190 * auVar127._16_4_;
          auVar60._20_4_ = fVar203 * fVar203 * fVar203 * auVar127._20_4_;
          auVar60._24_4_ = fVar99 * fVar99 * fVar99 * auVar127._24_4_;
          auVar60._28_4_ = auVar127._28_4_;
          auVar127 = vfmadd231ps_avx512vl(auVar60,auVar125,auVar123);
          auVar61._4_4_ = auVar142._4_4_ * auVar127._4_4_;
          auVar61._0_4_ = auVar142._0_4_ * auVar127._0_4_;
          auVar61._8_4_ = auVar142._8_4_ * auVar127._8_4_;
          auVar61._12_4_ = auVar142._12_4_ * auVar127._12_4_;
          auVar61._16_4_ = auVar142._16_4_ * auVar127._16_4_;
          auVar61._20_4_ = auVar142._20_4_ * auVar127._20_4_;
          auVar61._24_4_ = auVar142._24_4_ * auVar127._24_4_;
          auVar61._28_4_ = auVar123._28_4_;
          auVar62._4_4_ = auVar127._4_4_ * auVar126._4_4_;
          auVar62._0_4_ = auVar127._0_4_ * auVar126._0_4_;
          auVar62._8_4_ = auVar127._8_4_ * auVar126._8_4_;
          auVar62._12_4_ = auVar127._12_4_ * auVar126._12_4_;
          auVar62._16_4_ = auVar127._16_4_ * auVar126._16_4_;
          auVar62._20_4_ = auVar127._20_4_ * auVar126._20_4_;
          auVar62._24_4_ = auVar127._24_4_ * auVar126._24_4_;
          auVar62._28_4_ = auVar126._28_4_;
          auVar126 = vmulps_avx512vl(auVar127,auVar114);
          auVar30 = vfmadd213ps_fma(auVar58,auVar115,ZEXT1632(auVar101));
          auVar31 = vfmadd213ps_fma(auVar59,auVar115,ZEXT1632(auVar102));
          auVar125 = vfmadd213ps_avx512vl(auVar124,auVar115,auVar113);
          auVar123 = vfmadd213ps_avx512vl(auVar61,auVar116,ZEXT1632(auVar108));
          auVar33 = vfnmadd213ps_fma(auVar58,auVar115,ZEXT1632(auVar101));
          auVar101 = vfmadd213ps_fma(auVar62,auVar116,ZEXT1632(auVar29));
          auVar34 = vfnmadd213ps_fma(auVar59,auVar115,ZEXT1632(auVar102));
          auVar102 = vfmadd213ps_fma(auVar126,auVar116,auVar112);
          auVar251 = vfnmadd231ps_fma(auVar113,auVar115,auVar124);
          auVar107 = vfnmadd213ps_fma(auVar61,auVar116,ZEXT1632(auVar108));
          auVar109 = vfnmadd213ps_fma(auVar62,auVar116,ZEXT1632(auVar29));
          auVar110 = vfnmadd231ps_fma(auVar112,auVar116,auVar126);
          auVar112 = vsubps_avx512vl(auVar123,ZEXT1632(auVar33));
          auVar126 = vsubps_avx(ZEXT1632(auVar101),ZEXT1632(auVar34));
          auVar127 = vsubps_avx(ZEXT1632(auVar102),ZEXT1632(auVar251));
          auVar63._4_4_ = auVar126._4_4_ * auVar251._4_4_;
          auVar63._0_4_ = auVar126._0_4_ * auVar251._0_4_;
          auVar63._8_4_ = auVar126._8_4_ * auVar251._8_4_;
          auVar63._12_4_ = auVar126._12_4_ * auVar251._12_4_;
          auVar63._16_4_ = auVar126._16_4_ * 0.0;
          auVar63._20_4_ = auVar126._20_4_ * 0.0;
          auVar63._24_4_ = auVar126._24_4_ * 0.0;
          auVar63._28_4_ = auVar124._28_4_;
          auVar108 = vfmsub231ps_fma(auVar63,ZEXT1632(auVar34),auVar127);
          auVar64._4_4_ = auVar127._4_4_ * auVar33._4_4_;
          auVar64._0_4_ = auVar127._0_4_ * auVar33._0_4_;
          auVar64._8_4_ = auVar127._8_4_ * auVar33._8_4_;
          auVar64._12_4_ = auVar127._12_4_ * auVar33._12_4_;
          auVar64._16_4_ = auVar127._16_4_ * 0.0;
          auVar64._20_4_ = auVar127._20_4_ * 0.0;
          auVar64._24_4_ = auVar127._24_4_ * 0.0;
          auVar64._28_4_ = auVar127._28_4_;
          auVar29 = vfmsub231ps_fma(auVar64,ZEXT1632(auVar251),auVar112);
          auVar65._4_4_ = auVar34._4_4_ * auVar112._4_4_;
          auVar65._0_4_ = auVar34._0_4_ * auVar112._0_4_;
          auVar65._8_4_ = auVar34._8_4_ * auVar112._8_4_;
          auVar65._12_4_ = auVar34._12_4_ * auVar112._12_4_;
          auVar65._16_4_ = auVar112._16_4_ * 0.0;
          auVar65._20_4_ = auVar112._20_4_ * 0.0;
          auVar65._24_4_ = auVar112._24_4_ * 0.0;
          auVar65._28_4_ = auVar112._28_4_;
          auVar32 = vfmsub231ps_fma(auVar65,ZEXT1632(auVar33),auVar126);
          auVar126 = vfmadd231ps_avx512vl(ZEXT1632(auVar32),auVar114,ZEXT1632(auVar29));
          auVar126 = vfmadd231ps_avx512vl(auVar126,auVar114,ZEXT1632(auVar108));
          auVar120 = ZEXT1632(auVar111);
          uVar89 = vcmpps_avx512vl(auVar126,auVar120,2);
          bVar88 = (byte)uVar89;
          fVar154 = (float)((uint)(bVar88 & 1) * auVar30._0_4_ |
                           (uint)!(bool)(bVar88 & 1) * auVar107._0_4_);
          bVar13 = (bool)((byte)(uVar89 >> 1) & 1);
          fVar156 = (float)((uint)bVar13 * auVar30._4_4_ | (uint)!bVar13 * auVar107._4_4_);
          bVar13 = (bool)((byte)(uVar89 >> 2) & 1);
          fVar159 = (float)((uint)bVar13 * auVar30._8_4_ | (uint)!bVar13 * auVar107._8_4_);
          bVar13 = (bool)((byte)(uVar89 >> 3) & 1);
          fVar160 = (float)((uint)bVar13 * auVar30._12_4_ | (uint)!bVar13 * auVar107._12_4_);
          auVar114 = ZEXT1632(CONCAT412(fVar160,CONCAT48(fVar159,CONCAT44(fVar156,fVar154))));
          fVar155 = (float)((uint)(bVar88 & 1) * auVar31._0_4_ |
                           (uint)!(bool)(bVar88 & 1) * auVar109._0_4_);
          bVar13 = (bool)((byte)(uVar89 >> 1) & 1);
          fVar158 = (float)((uint)bVar13 * auVar31._4_4_ | (uint)!bVar13 * auVar109._4_4_);
          bVar13 = (bool)((byte)(uVar89 >> 2) & 1);
          fVar157 = (float)((uint)bVar13 * auVar31._8_4_ | (uint)!bVar13 * auVar109._8_4_);
          bVar13 = (bool)((byte)(uVar89 >> 3) & 1);
          fVar161 = (float)((uint)bVar13 * auVar31._12_4_ | (uint)!bVar13 * auVar109._12_4_);
          auVar117 = ZEXT1632(CONCAT412(fVar161,CONCAT48(fVar157,CONCAT44(fVar158,fVar155))));
          auVar143._0_4_ =
               (float)((uint)(bVar88 & 1) * auVar125._0_4_ |
                      (uint)!(bool)(bVar88 & 1) * auVar110._0_4_);
          bVar13 = (bool)((byte)(uVar89 >> 1) & 1);
          auVar143._4_4_ = (float)((uint)bVar13 * auVar125._4_4_ | (uint)!bVar13 * auVar110._4_4_);
          bVar13 = (bool)((byte)(uVar89 >> 2) & 1);
          auVar143._8_4_ = (float)((uint)bVar13 * auVar125._8_4_ | (uint)!bVar13 * auVar110._8_4_);
          bVar13 = (bool)((byte)(uVar89 >> 3) & 1);
          auVar143._12_4_ =
               (float)((uint)bVar13 * auVar125._12_4_ | (uint)!bVar13 * auVar110._12_4_);
          fVar191 = (float)((uint)((byte)(uVar89 >> 4) & 1) * auVar125._16_4_);
          auVar143._16_4_ = fVar191;
          fVar236 = (float)((uint)((byte)(uVar89 >> 5) & 1) * auVar125._20_4_);
          auVar143._20_4_ = fVar236;
          fVar237 = (float)((uint)((byte)(uVar89 >> 6) & 1) * auVar125._24_4_);
          auVar143._24_4_ = fVar237;
          iVar1 = (uint)(byte)(uVar89 >> 7) * auVar125._28_4_;
          auVar143._28_4_ = iVar1;
          auVar126 = vblendmps_avx512vl(ZEXT1632(auVar33),auVar123);
          auVar144._0_4_ =
               (uint)(bVar88 & 1) * auVar126._0_4_ | (uint)!(bool)(bVar88 & 1) * auVar108._0_4_;
          bVar13 = (bool)((byte)(uVar89 >> 1) & 1);
          auVar144._4_4_ = (uint)bVar13 * auVar126._4_4_ | (uint)!bVar13 * auVar108._4_4_;
          bVar13 = (bool)((byte)(uVar89 >> 2) & 1);
          auVar144._8_4_ = (uint)bVar13 * auVar126._8_4_ | (uint)!bVar13 * auVar108._8_4_;
          bVar13 = (bool)((byte)(uVar89 >> 3) & 1);
          auVar144._12_4_ = (uint)bVar13 * auVar126._12_4_ | (uint)!bVar13 * auVar108._12_4_;
          auVar144._16_4_ = (uint)((byte)(uVar89 >> 4) & 1) * auVar126._16_4_;
          auVar144._20_4_ = (uint)((byte)(uVar89 >> 5) & 1) * auVar126._20_4_;
          auVar144._24_4_ = (uint)((byte)(uVar89 >> 6) & 1) * auVar126._24_4_;
          auVar144._28_4_ = (uint)(byte)(uVar89 >> 7) * auVar126._28_4_;
          auVar126 = vblendmps_avx512vl(ZEXT1632(auVar34),ZEXT1632(auVar101));
          auVar145._0_4_ =
               (float)((uint)(bVar88 & 1) * auVar126._0_4_ |
                      (uint)!(bool)(bVar88 & 1) * auVar30._0_4_);
          bVar13 = (bool)((byte)(uVar89 >> 1) & 1);
          auVar145._4_4_ = (float)((uint)bVar13 * auVar126._4_4_ | (uint)!bVar13 * auVar30._4_4_);
          bVar13 = (bool)((byte)(uVar89 >> 2) & 1);
          auVar145._8_4_ = (float)((uint)bVar13 * auVar126._8_4_ | (uint)!bVar13 * auVar30._8_4_);
          bVar13 = (bool)((byte)(uVar89 >> 3) & 1);
          auVar145._12_4_ = (float)((uint)bVar13 * auVar126._12_4_ | (uint)!bVar13 * auVar30._12_4_)
          ;
          fVar203 = (float)((uint)((byte)(uVar89 >> 4) & 1) * auVar126._16_4_);
          auVar145._16_4_ = fVar203;
          fVar190 = (float)((uint)((byte)(uVar89 >> 5) & 1) * auVar126._20_4_);
          auVar145._20_4_ = fVar190;
          fVar183 = (float)((uint)((byte)(uVar89 >> 6) & 1) * auVar126._24_4_);
          auVar145._24_4_ = fVar183;
          auVar145._28_4_ = (uint)(byte)(uVar89 >> 7) * auVar126._28_4_;
          auVar126 = vblendmps_avx512vl(ZEXT1632(auVar251),ZEXT1632(auVar102));
          auVar146._0_4_ =
               (float)((uint)(bVar88 & 1) * auVar126._0_4_ |
                      (uint)!(bool)(bVar88 & 1) * auVar31._0_4_);
          bVar13 = (bool)((byte)(uVar89 >> 1) & 1);
          auVar146._4_4_ = (float)((uint)bVar13 * auVar126._4_4_ | (uint)!bVar13 * auVar31._4_4_);
          bVar13 = (bool)((byte)(uVar89 >> 2) & 1);
          auVar146._8_4_ = (float)((uint)bVar13 * auVar126._8_4_ | (uint)!bVar13 * auVar31._8_4_);
          bVar13 = (bool)((byte)(uVar89 >> 3) & 1);
          auVar146._12_4_ = (float)((uint)bVar13 * auVar126._12_4_ | (uint)!bVar13 * auVar31._12_4_)
          ;
          fVar100 = (float)((uint)((byte)(uVar89 >> 4) & 1) * auVar126._16_4_);
          auVar146._16_4_ = fVar100;
          fVar153 = (float)((uint)((byte)(uVar89 >> 5) & 1) * auVar126._20_4_);
          auVar146._20_4_ = fVar153;
          fVar99 = (float)((uint)((byte)(uVar89 >> 6) & 1) * auVar126._24_4_);
          auVar146._24_4_ = fVar99;
          iVar2 = (uint)(byte)(uVar89 >> 7) * auVar126._28_4_;
          auVar146._28_4_ = iVar2;
          auVar147._0_4_ =
               (uint)(bVar88 & 1) * (int)auVar33._0_4_ | (uint)!(bool)(bVar88 & 1) * auVar123._0_4_;
          bVar13 = (bool)((byte)(uVar89 >> 1) & 1);
          auVar147._4_4_ = (uint)bVar13 * (int)auVar33._4_4_ | (uint)!bVar13 * auVar123._4_4_;
          bVar13 = (bool)((byte)(uVar89 >> 2) & 1);
          auVar147._8_4_ = (uint)bVar13 * (int)auVar33._8_4_ | (uint)!bVar13 * auVar123._8_4_;
          bVar13 = (bool)((byte)(uVar89 >> 3) & 1);
          auVar147._12_4_ = (uint)bVar13 * (int)auVar33._12_4_ | (uint)!bVar13 * auVar123._12_4_;
          auVar147._16_4_ = (uint)!(bool)((byte)(uVar89 >> 4) & 1) * auVar123._16_4_;
          auVar147._20_4_ = (uint)!(bool)((byte)(uVar89 >> 5) & 1) * auVar123._20_4_;
          auVar147._24_4_ = (uint)!(bool)((byte)(uVar89 >> 6) & 1) * auVar123._24_4_;
          auVar147._28_4_ = (uint)!SUB81(uVar89 >> 7,0) * auVar123._28_4_;
          bVar13 = (bool)((byte)(uVar89 >> 1) & 1);
          bVar15 = (bool)((byte)(uVar89 >> 2) & 1);
          bVar17 = (bool)((byte)(uVar89 >> 3) & 1);
          bVar14 = (bool)((byte)(uVar89 >> 1) & 1);
          bVar16 = (bool)((byte)(uVar89 >> 2) & 1);
          bVar18 = (bool)((byte)(uVar89 >> 3) & 1);
          auVar123 = vsubps_avx512vl(auVar147,auVar114);
          auVar127 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar34._12_4_ |
                                                   (uint)!bVar17 * auVar101._12_4_,
                                                   CONCAT48((uint)bVar15 * (int)auVar34._8_4_ |
                                                            (uint)!bVar15 * auVar101._8_4_,
                                                            CONCAT44((uint)bVar13 *
                                                                     (int)auVar34._4_4_ |
                                                                     (uint)!bVar13 * auVar101._4_4_,
                                                                     (uint)(bVar88 & 1) *
                                                                     (int)auVar34._0_4_ |
                                                                     (uint)!(bool)(bVar88 & 1) *
                                                                     auVar101._0_4_)))),auVar117);
          auVar228 = ZEXT3264(auVar127);
          auVar125 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar251._12_4_ |
                                                   (uint)!bVar18 * auVar102._12_4_,
                                                   CONCAT48((uint)bVar16 * (int)auVar251._8_4_ |
                                                            (uint)!bVar16 * auVar102._8_4_,
                                                            CONCAT44((uint)bVar14 *
                                                                     (int)auVar251._4_4_ |
                                                                     (uint)!bVar14 * auVar102._4_4_,
                                                                     (uint)(bVar88 & 1) *
                                                                     (int)auVar251._0_4_ |
                                                                     (uint)!(bool)(bVar88 & 1) *
                                                                     auVar102._0_4_)))),auVar143);
          auVar124 = vsubps_avx(auVar114,auVar144);
          auVar233 = ZEXT3264(auVar124);
          auVar112 = vsubps_avx(auVar117,auVar145);
          auVar113 = vsubps_avx(auVar143,auVar146);
          auVar66._4_4_ = auVar125._4_4_ * fVar156;
          auVar66._0_4_ = auVar125._0_4_ * fVar154;
          auVar66._8_4_ = auVar125._8_4_ * fVar159;
          auVar66._12_4_ = auVar125._12_4_ * fVar160;
          auVar66._16_4_ = auVar125._16_4_ * 0.0;
          auVar66._20_4_ = auVar125._20_4_ * 0.0;
          auVar66._24_4_ = auVar125._24_4_ * 0.0;
          auVar66._28_4_ = 0;
          auVar101 = vfmsub231ps_fma(auVar66,auVar143,auVar123);
          auVar208._0_4_ = fVar155 * auVar123._0_4_;
          auVar208._4_4_ = fVar158 * auVar123._4_4_;
          auVar208._8_4_ = fVar157 * auVar123._8_4_;
          auVar208._12_4_ = fVar161 * auVar123._12_4_;
          auVar208._16_4_ = auVar123._16_4_ * 0.0;
          auVar208._20_4_ = auVar123._20_4_ * 0.0;
          auVar208._24_4_ = auVar123._24_4_ * 0.0;
          auVar208._28_4_ = 0;
          auVar102 = vfmsub231ps_fma(auVar208,auVar114,auVar127);
          auVar126 = vfmadd231ps_avx512vl(ZEXT1632(auVar102),auVar120,ZEXT1632(auVar101));
          auVar220._0_4_ = auVar127._0_4_ * auVar143._0_4_;
          auVar220._4_4_ = auVar127._4_4_ * auVar143._4_4_;
          auVar220._8_4_ = auVar127._8_4_ * auVar143._8_4_;
          auVar220._12_4_ = auVar127._12_4_ * auVar143._12_4_;
          auVar220._16_4_ = auVar127._16_4_ * fVar191;
          auVar220._20_4_ = auVar127._20_4_ * fVar236;
          auVar220._24_4_ = auVar127._24_4_ * fVar237;
          auVar220._28_4_ = 0;
          auVar101 = vfmsub231ps_fma(auVar220,auVar117,auVar125);
          auVar118 = vfmadd231ps_avx512vl(auVar126,auVar120,ZEXT1632(auVar101));
          auVar126 = vmulps_avx512vl(auVar113,auVar144);
          auVar126 = vfmsub231ps_avx512vl(auVar126,auVar124,auVar146);
          auVar67._4_4_ = auVar112._4_4_ * auVar146._4_4_;
          auVar67._0_4_ = auVar112._0_4_ * auVar146._0_4_;
          auVar67._8_4_ = auVar112._8_4_ * auVar146._8_4_;
          auVar67._12_4_ = auVar112._12_4_ * auVar146._12_4_;
          auVar67._16_4_ = auVar112._16_4_ * fVar100;
          auVar67._20_4_ = auVar112._20_4_ * fVar153;
          auVar67._24_4_ = auVar112._24_4_ * fVar99;
          auVar67._28_4_ = iVar2;
          auVar101 = vfmsub231ps_fma(auVar67,auVar145,auVar113);
          auVar221._0_4_ = auVar145._0_4_ * auVar124._0_4_;
          auVar221._4_4_ = auVar145._4_4_ * auVar124._4_4_;
          auVar221._8_4_ = auVar145._8_4_ * auVar124._8_4_;
          auVar221._12_4_ = auVar145._12_4_ * auVar124._12_4_;
          auVar221._16_4_ = fVar203 * auVar124._16_4_;
          auVar221._20_4_ = fVar190 * auVar124._20_4_;
          auVar221._24_4_ = fVar183 * auVar124._24_4_;
          auVar221._28_4_ = 0;
          auVar102 = vfmsub231ps_fma(auVar221,auVar112,auVar144);
          auVar126 = vfmadd231ps_avx512vl(ZEXT1632(auVar102),auVar120,auVar126);
          auVar119 = vfmadd231ps_avx512vl(auVar126,auVar120,ZEXT1632(auVar101));
          auVar222 = ZEXT3264(auVar119);
          auVar126 = vmaxps_avx(auVar118,auVar119);
          uVar184 = vcmpps_avx512vl(auVar126,auVar120,2);
          bVar97 = bVar97 & (byte)uVar184;
          if (bVar97 != 0) {
            uVar163 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar249._4_4_ = uVar163;
            auVar249._0_4_ = uVar163;
            auVar249._8_4_ = uVar163;
            auVar249._12_4_ = uVar163;
            auVar249._16_4_ = uVar163;
            auVar249._20_4_ = uVar163;
            auVar249._24_4_ = uVar163;
            auVar249._28_4_ = uVar163;
            auVar250 = ZEXT3264(auVar249);
            auVar68._4_4_ = auVar113._4_4_ * auVar127._4_4_;
            auVar68._0_4_ = auVar113._0_4_ * auVar127._0_4_;
            auVar68._8_4_ = auVar113._8_4_ * auVar127._8_4_;
            auVar68._12_4_ = auVar113._12_4_ * auVar127._12_4_;
            auVar68._16_4_ = auVar113._16_4_ * auVar127._16_4_;
            auVar68._20_4_ = auVar113._20_4_ * auVar127._20_4_;
            auVar68._24_4_ = auVar113._24_4_ * auVar127._24_4_;
            auVar68._28_4_ = auVar126._28_4_;
            auVar29 = vfmsub231ps_fma(auVar68,auVar112,auVar125);
            auVar69._4_4_ = auVar125._4_4_ * auVar124._4_4_;
            auVar69._0_4_ = auVar125._0_4_ * auVar124._0_4_;
            auVar69._8_4_ = auVar125._8_4_ * auVar124._8_4_;
            auVar69._12_4_ = auVar125._12_4_ * auVar124._12_4_;
            auVar69._16_4_ = auVar125._16_4_ * auVar124._16_4_;
            auVar69._20_4_ = auVar125._20_4_ * auVar124._20_4_;
            auVar69._24_4_ = auVar125._24_4_ * auVar124._24_4_;
            auVar69._28_4_ = auVar125._28_4_;
            auVar108 = vfmsub231ps_fma(auVar69,auVar123,auVar113);
            auVar70._4_4_ = auVar112._4_4_ * auVar123._4_4_;
            auVar70._0_4_ = auVar112._0_4_ * auVar123._0_4_;
            auVar70._8_4_ = auVar112._8_4_ * auVar123._8_4_;
            auVar70._12_4_ = auVar112._12_4_ * auVar123._12_4_;
            auVar70._16_4_ = auVar112._16_4_ * auVar123._16_4_;
            auVar70._20_4_ = auVar112._20_4_ * auVar123._20_4_;
            auVar70._24_4_ = auVar112._24_4_ * auVar123._24_4_;
            auVar70._28_4_ = auVar112._28_4_;
            auVar30 = vfmsub231ps_fma(auVar70,auVar124,auVar127);
            auVar101 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar108),ZEXT1632(auVar30));
            auVar102 = vfmadd231ps_fma(ZEXT1632(auVar101),ZEXT1632(auVar29),
                                       ZEXT1232(ZEXT412(0)) << 0x20);
            auVar126 = vrcp14ps_avx512vl(ZEXT1632(auVar102));
            auVar233 = ZEXT3264(auVar126);
            auVar45._8_4_ = 0x3f800000;
            auVar45._0_8_ = 0x3f8000003f800000;
            auVar45._12_4_ = 0x3f800000;
            auVar45._16_4_ = 0x3f800000;
            auVar45._20_4_ = 0x3f800000;
            auVar45._24_4_ = 0x3f800000;
            auVar45._28_4_ = 0x3f800000;
            auVar127 = vfnmadd213ps_avx512vl(auVar126,ZEXT1632(auVar102),auVar45);
            auVar101 = vfmadd132ps_fma(auVar127,auVar126,auVar126);
            auVar228 = ZEXT1664(auVar101);
            auVar71._4_4_ = auVar30._4_4_ * auVar143._4_4_;
            auVar71._0_4_ = auVar30._0_4_ * auVar143._0_4_;
            auVar71._8_4_ = auVar30._8_4_ * auVar143._8_4_;
            auVar71._12_4_ = auVar30._12_4_ * auVar143._12_4_;
            auVar71._16_4_ = fVar191 * 0.0;
            auVar71._20_4_ = fVar236 * 0.0;
            auVar71._24_4_ = fVar237 * 0.0;
            auVar71._28_4_ = iVar1;
            auVar108 = vfmadd231ps_fma(auVar71,auVar117,ZEXT1632(auVar108));
            auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),auVar114,ZEXT1632(auVar29));
            fVar191 = auVar101._0_4_;
            fVar236 = auVar101._4_4_;
            fVar237 = auVar101._8_4_;
            fVar183 = auVar101._12_4_;
            local_800 = ZEXT1632(CONCAT412(auVar108._12_4_ * fVar183,
                                           CONCAT48(auVar108._8_4_ * fVar237,
                                                    CONCAT44(auVar108._4_4_ * fVar236,
                                                             auVar108._0_4_ * fVar191))));
            auVar235 = ZEXT3264(local_800);
            uVar184 = vcmpps_avx512vl(local_800,auVar249,2);
            auVar86._4_4_ = uStack_79c;
            auVar86._0_4_ = local_7a0;
            auVar86._8_4_ = uStack_798;
            auVar86._12_4_ = uStack_794;
            auVar86._16_4_ = uStack_790;
            auVar86._20_4_ = uStack_78c;
            auVar86._24_4_ = uStack_788;
            auVar86._28_4_ = uStack_784;
            uVar35 = vcmpps_avx512vl(local_800,auVar86,0xd);
            bVar97 = (byte)uVar184 & (byte)uVar35 & bVar97;
            if (bVar97 != 0) {
              uVar98 = vcmpps_avx512vl(ZEXT1632(auVar102),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar98 = bVar97 & uVar98;
              if ((char)uVar98 != '\0') {
                fVar190 = auVar118._0_4_ * fVar191;
                fVar203 = auVar118._4_4_ * fVar236;
                auVar72._4_4_ = fVar203;
                auVar72._0_4_ = fVar190;
                fVar99 = auVar118._8_4_ * fVar237;
                auVar72._8_4_ = fVar99;
                fVar100 = auVar118._12_4_ * fVar183;
                auVar72._12_4_ = fVar100;
                fVar153 = auVar118._16_4_ * 0.0;
                auVar72._16_4_ = fVar153;
                fVar154 = auVar118._20_4_ * 0.0;
                auVar72._20_4_ = fVar154;
                fVar155 = auVar118._24_4_ * 0.0;
                auVar72._24_4_ = fVar155;
                auVar72._28_4_ = auVar118._28_4_;
                auVar202._8_4_ = 0x3f800000;
                auVar202._0_8_ = 0x3f8000003f800000;
                auVar202._12_4_ = 0x3f800000;
                auVar202._16_4_ = 0x3f800000;
                auVar202._20_4_ = 0x3f800000;
                auVar202._24_4_ = 0x3f800000;
                auVar202._28_4_ = 0x3f800000;
                auVar126 = vsubps_avx(auVar202,auVar72);
                local_640._0_4_ =
                     (float)((uint)(bVar88 & 1) * (int)fVar190 |
                            (uint)!(bool)(bVar88 & 1) * auVar126._0_4_);
                bVar13 = (bool)((byte)(uVar89 >> 1) & 1);
                local_640._4_4_ =
                     (float)((uint)bVar13 * (int)fVar203 | (uint)!bVar13 * auVar126._4_4_);
                bVar13 = (bool)((byte)(uVar89 >> 2) & 1);
                local_640._8_4_ =
                     (float)((uint)bVar13 * (int)fVar99 | (uint)!bVar13 * auVar126._8_4_);
                bVar13 = (bool)((byte)(uVar89 >> 3) & 1);
                local_640._12_4_ =
                     (float)((uint)bVar13 * (int)fVar100 | (uint)!bVar13 * auVar126._12_4_);
                bVar13 = (bool)((byte)(uVar89 >> 4) & 1);
                local_640._16_4_ =
                     (float)((uint)bVar13 * (int)fVar153 | (uint)!bVar13 * auVar126._16_4_);
                bVar13 = (bool)((byte)(uVar89 >> 5) & 1);
                local_640._20_4_ =
                     (float)((uint)bVar13 * (int)fVar154 | (uint)!bVar13 * auVar126._20_4_);
                bVar13 = (bool)((byte)(uVar89 >> 6) & 1);
                local_640._24_4_ =
                     (float)((uint)bVar13 * (int)fVar155 | (uint)!bVar13 * auVar126._24_4_);
                bVar13 = SUB81(uVar89 >> 7,0);
                local_640._28_4_ =
                     (float)((uint)bVar13 * auVar118._28_4_ | (uint)!bVar13 * auVar126._28_4_);
                auVar126 = vsubps_avx(auVar116,auVar115);
                auVar101 = vfmadd213ps_fma(auVar126,local_640,auVar115);
                uVar163 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
                auVar46._4_4_ = uVar163;
                auVar46._0_4_ = uVar163;
                auVar46._8_4_ = uVar163;
                auVar46._12_4_ = uVar163;
                auVar46._16_4_ = uVar163;
                auVar46._20_4_ = uVar163;
                auVar46._24_4_ = uVar163;
                auVar46._28_4_ = uVar163;
                auVar126 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar101._12_4_ + auVar101._12_4_,
                                                              CONCAT48(auVar101._8_4_ +
                                                                       auVar101._8_4_,
                                                                       CONCAT44(auVar101._4_4_ +
                                                                                auVar101._4_4_,
                                                                                auVar101._0_4_ +
                                                                                auVar101._0_4_)))),
                                           auVar46);
                uVar36 = vcmpps_avx512vl(local_800,auVar126,6);
                uVar98 = uVar98 & uVar36;
                bVar97 = (byte)uVar98;
                if (bVar97 != 0) {
                  auVar189._0_4_ = auVar119._0_4_ * fVar191;
                  auVar189._4_4_ = auVar119._4_4_ * fVar236;
                  auVar189._8_4_ = auVar119._8_4_ * fVar237;
                  auVar189._12_4_ = auVar119._12_4_ * fVar183;
                  auVar189._16_4_ = auVar119._16_4_ * 0.0;
                  auVar189._20_4_ = auVar119._20_4_ * 0.0;
                  auVar189._24_4_ = auVar119._24_4_ * 0.0;
                  auVar189._28_4_ = 0;
                  auVar209._8_4_ = 0x3f800000;
                  auVar209._0_8_ = 0x3f8000003f800000;
                  auVar209._12_4_ = 0x3f800000;
                  auVar209._16_4_ = 0x3f800000;
                  auVar209._20_4_ = 0x3f800000;
                  auVar209._24_4_ = 0x3f800000;
                  auVar209._28_4_ = 0x3f800000;
                  auVar126 = vsubps_avx(auVar209,auVar189);
                  auVar148._0_4_ =
                       (uint)(bVar88 & 1) * (int)auVar189._0_4_ |
                       (uint)!(bool)(bVar88 & 1) * auVar126._0_4_;
                  bVar13 = (bool)((byte)(uVar89 >> 1) & 1);
                  auVar148._4_4_ =
                       (uint)bVar13 * (int)auVar189._4_4_ | (uint)!bVar13 * auVar126._4_4_;
                  bVar13 = (bool)((byte)(uVar89 >> 2) & 1);
                  auVar148._8_4_ =
                       (uint)bVar13 * (int)auVar189._8_4_ | (uint)!bVar13 * auVar126._8_4_;
                  bVar13 = (bool)((byte)(uVar89 >> 3) & 1);
                  auVar148._12_4_ =
                       (uint)bVar13 * (int)auVar189._12_4_ | (uint)!bVar13 * auVar126._12_4_;
                  bVar13 = (bool)((byte)(uVar89 >> 4) & 1);
                  auVar148._16_4_ =
                       (uint)bVar13 * (int)auVar189._16_4_ | (uint)!bVar13 * auVar126._16_4_;
                  bVar13 = (bool)((byte)(uVar89 >> 5) & 1);
                  auVar148._20_4_ =
                       (uint)bVar13 * (int)auVar189._20_4_ | (uint)!bVar13 * auVar126._20_4_;
                  bVar13 = (bool)((byte)(uVar89 >> 6) & 1);
                  auVar148._24_4_ =
                       (uint)bVar13 * (int)auVar189._24_4_ | (uint)!bVar13 * auVar126._24_4_;
                  auVar148._28_4_ = (uint)!SUB81(uVar89 >> 7,0) * auVar126._28_4_;
                  auVar47._8_4_ = 0x40000000;
                  auVar47._0_8_ = 0x4000000040000000;
                  auVar47._12_4_ = 0x40000000;
                  auVar47._16_4_ = 0x40000000;
                  auVar47._20_4_ = 0x40000000;
                  auVar47._24_4_ = 0x40000000;
                  auVar47._28_4_ = 0x40000000;
                  local_620 = vfmsub132ps_avx512vl(auVar148,auVar209,auVar47);
                  local_5e0 = (undefined4)lVar92;
                  local_5d0 = local_860;
                  uStack_5c8 = uStack_858;
                  local_5c0 = local_870;
                  uStack_5b8 = uStack_868;
                  local_5b0 = local_880;
                  uStack_5a8 = uStack_878;
                  local_5a0 = local_890;
                  uStack_598 = uStack_888;
                  pGVar94 = (context->scene->geometries).items[uVar95].ptr;
                  if ((pGVar94->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                    auVar101 = vcvtsi2ss_avx512f(auVar111,local_5e0);
                    fVar191 = auVar101._0_4_;
                    local_580[0] = (fVar191 + local_640._0_4_ + 0.0) * local_3a0;
                    local_580[1] = (fVar191 + local_640._4_4_ + 1.0) * fStack_39c;
                    local_580[2] = (fVar191 + local_640._8_4_ + 2.0) * fStack_398;
                    local_580[3] = (fVar191 + local_640._12_4_ + 3.0) * fStack_394;
                    fStack_570 = (fVar191 + local_640._16_4_ + 4.0) * fStack_390;
                    fStack_56c = (fVar191 + local_640._20_4_ + 5.0) * fStack_38c;
                    fStack_568 = (fVar191 + local_640._24_4_ + 6.0) * fStack_388;
                    fStack_564 = fVar191 + local_640._28_4_ + 7.0;
                    local_560 = local_620;
                    local_540 = local_800;
                    auVar174._8_4_ = 0x7f800000;
                    auVar174._0_8_ = 0x7f8000007f800000;
                    auVar174._12_4_ = 0x7f800000;
                    auVar174._16_4_ = 0x7f800000;
                    auVar174._20_4_ = 0x7f800000;
                    auVar174._24_4_ = 0x7f800000;
                    auVar174._28_4_ = 0x7f800000;
                    auVar126 = vblendmps_avx512vl(auVar174,local_800);
                    auVar149._0_4_ =
                         (uint)(bVar97 & 1) * auVar126._0_4_ |
                         (uint)!(bool)(bVar97 & 1) * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar98 >> 1) & 1);
                    auVar149._4_4_ = (uint)bVar13 * auVar126._4_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar98 >> 2) & 1);
                    auVar149._8_4_ = (uint)bVar13 * auVar126._8_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar98 >> 3) & 1);
                    auVar149._12_4_ = (uint)bVar13 * auVar126._12_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar98 >> 4) & 1);
                    auVar149._16_4_ = (uint)bVar13 * auVar126._16_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar98 >> 5) & 1);
                    auVar149._20_4_ = (uint)bVar13 * auVar126._20_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar98 >> 6) & 1);
                    auVar149._24_4_ = (uint)bVar13 * auVar126._24_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = SUB81(uVar98 >> 7,0);
                    auVar149._28_4_ = (uint)bVar13 * auVar126._28_4_ | (uint)!bVar13 * 0x7f800000;
                    auVar126 = vshufps_avx(auVar149,auVar149,0xb1);
                    auVar126 = vminps_avx(auVar149,auVar126);
                    auVar127 = vshufpd_avx(auVar126,auVar126,5);
                    auVar126 = vminps_avx(auVar126,auVar127);
                    auVar127 = vpermpd_avx2(auVar126,0x4e);
                    auVar126 = vminps_avx(auVar126,auVar127);
                    uVar184 = vcmpps_avx512vl(auVar149,auVar126,0);
                    uVar90 = (uint)uVar98;
                    if (((byte)uVar184 & bVar97) != 0) {
                      uVar90 = (uint)((byte)uVar184 & bVar97);
                    }
                    uVar91 = 0;
                    for (; (uVar90 & 1) == 0; uVar90 = uVar90 >> 1 | 0x80000000) {
                      uVar91 = uVar91 + 1;
                    }
                    uVar89 = (ulong)uVar91;
                    pGVar87 = pGVar94;
                    local_600 = local_800;
                    local_5dc = iVar8;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar94->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      do {
                        local_818 = pGVar87;
                        local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_580[uVar89]));
                        local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_560 + uVar89 * 4)))
                        ;
                        *(undefined4 *)(ray + k * 4 + 0x200) =
                             *(undefined4 *)(local_540 + uVar89 * 4);
                        local_848.context = context->user;
                        fVar183 = local_200._0_4_;
                        fVar191 = 1.0 - fVar183;
                        auVar41._8_4_ = 0x80000000;
                        auVar41._0_8_ = 0x8000000080000000;
                        auVar41._12_4_ = 0x80000000;
                        auVar108 = vxorps_avx512vl(ZEXT416((uint)fVar191),auVar41);
                        auVar101 = ZEXT416((uint)(fVar183 * fVar191 * 4.0));
                        auVar102 = vfnmsub213ss_fma(local_200._0_16_,local_200._0_16_,auVar101);
                        auVar101 = vfmadd213ss_fma(ZEXT416((uint)fVar191),ZEXT416((uint)fVar191),
                                                   auVar101);
                        auVar233 = ZEXT464(0x3f000000);
                        fVar191 = fVar191 * auVar108._0_4_ * 0.5;
                        fVar236 = auVar102._0_4_ * 0.5;
                        fVar237 = auVar101._0_4_ * 0.5;
                        fVar183 = fVar183 * fVar183 * 0.5;
                        auVar226._0_4_ = fVar183 * fVar162;
                        auVar226._4_4_ = fVar183 * fVar180;
                        auVar226._8_4_ = fVar183 * fVar181;
                        auVar226._12_4_ = fVar183 * fVar182;
                        auVar167._4_4_ = fVar237;
                        auVar167._0_4_ = fVar237;
                        auVar167._8_4_ = fVar237;
                        auVar167._12_4_ = fVar237;
                        auVar101 = vfmadd132ps_fma(auVar167,auVar226,auVar106);
                        auVar216._4_4_ = fVar236;
                        auVar216._0_4_ = fVar236;
                        auVar216._8_4_ = fVar236;
                        auVar216._12_4_ = fVar236;
                        auVar101 = vfmadd132ps_fma(auVar216,auVar101,auVar28);
                        auVar168._4_4_ = fVar191;
                        auVar168._0_4_ = fVar191;
                        auVar168._8_4_ = fVar191;
                        auVar168._12_4_ = fVar191;
                        auVar101 = vfmadd132ps_fma(auVar168,auVar101,auVar27);
                        auVar252 = vbroadcastss_avx512f(auVar101);
                        auVar179 = vbroadcastss_avx512f(ZEXT416(1));
                        auVar222 = vpermps_avx512f(auVar179,ZEXT1664(auVar101));
                        auVar228 = vbroadcastss_avx512f(ZEXT416(2));
                        local_240 = vpermps_avx512f(auVar228,ZEXT1664(auVar101));
                        local_2c0[0] = (RTCHitN)auVar252[0];
                        local_2c0[1] = (RTCHitN)auVar252[1];
                        local_2c0[2] = (RTCHitN)auVar252[2];
                        local_2c0[3] = (RTCHitN)auVar252[3];
                        local_2c0[4] = (RTCHitN)auVar252[4];
                        local_2c0[5] = (RTCHitN)auVar252[5];
                        local_2c0[6] = (RTCHitN)auVar252[6];
                        local_2c0[7] = (RTCHitN)auVar252[7];
                        local_2c0[8] = (RTCHitN)auVar252[8];
                        local_2c0[9] = (RTCHitN)auVar252[9];
                        local_2c0[10] = (RTCHitN)auVar252[10];
                        local_2c0[0xb] = (RTCHitN)auVar252[0xb];
                        local_2c0[0xc] = (RTCHitN)auVar252[0xc];
                        local_2c0[0xd] = (RTCHitN)auVar252[0xd];
                        local_2c0[0xe] = (RTCHitN)auVar252[0xe];
                        local_2c0[0xf] = (RTCHitN)auVar252[0xf];
                        local_2c0[0x10] = (RTCHitN)auVar252[0x10];
                        local_2c0[0x11] = (RTCHitN)auVar252[0x11];
                        local_2c0[0x12] = (RTCHitN)auVar252[0x12];
                        local_2c0[0x13] = (RTCHitN)auVar252[0x13];
                        local_2c0[0x14] = (RTCHitN)auVar252[0x14];
                        local_2c0[0x15] = (RTCHitN)auVar252[0x15];
                        local_2c0[0x16] = (RTCHitN)auVar252[0x16];
                        local_2c0[0x17] = (RTCHitN)auVar252[0x17];
                        local_2c0[0x18] = (RTCHitN)auVar252[0x18];
                        local_2c0[0x19] = (RTCHitN)auVar252[0x19];
                        local_2c0[0x1a] = (RTCHitN)auVar252[0x1a];
                        local_2c0[0x1b] = (RTCHitN)auVar252[0x1b];
                        local_2c0[0x1c] = (RTCHitN)auVar252[0x1c];
                        local_2c0[0x1d] = (RTCHitN)auVar252[0x1d];
                        local_2c0[0x1e] = (RTCHitN)auVar252[0x1e];
                        local_2c0[0x1f] = (RTCHitN)auVar252[0x1f];
                        local_2c0[0x20] = (RTCHitN)auVar252[0x20];
                        local_2c0[0x21] = (RTCHitN)auVar252[0x21];
                        local_2c0[0x22] = (RTCHitN)auVar252[0x22];
                        local_2c0[0x23] = (RTCHitN)auVar252[0x23];
                        local_2c0[0x24] = (RTCHitN)auVar252[0x24];
                        local_2c0[0x25] = (RTCHitN)auVar252[0x25];
                        local_2c0[0x26] = (RTCHitN)auVar252[0x26];
                        local_2c0[0x27] = (RTCHitN)auVar252[0x27];
                        local_2c0[0x28] = (RTCHitN)auVar252[0x28];
                        local_2c0[0x29] = (RTCHitN)auVar252[0x29];
                        local_2c0[0x2a] = (RTCHitN)auVar252[0x2a];
                        local_2c0[0x2b] = (RTCHitN)auVar252[0x2b];
                        local_2c0[0x2c] = (RTCHitN)auVar252[0x2c];
                        local_2c0[0x2d] = (RTCHitN)auVar252[0x2d];
                        local_2c0[0x2e] = (RTCHitN)auVar252[0x2e];
                        local_2c0[0x2f] = (RTCHitN)auVar252[0x2f];
                        local_2c0[0x30] = (RTCHitN)auVar252[0x30];
                        local_2c0[0x31] = (RTCHitN)auVar252[0x31];
                        local_2c0[0x32] = (RTCHitN)auVar252[0x32];
                        local_2c0[0x33] = (RTCHitN)auVar252[0x33];
                        local_2c0[0x34] = (RTCHitN)auVar252[0x34];
                        local_2c0[0x35] = (RTCHitN)auVar252[0x35];
                        local_2c0[0x36] = (RTCHitN)auVar252[0x36];
                        local_2c0[0x37] = (RTCHitN)auVar252[0x37];
                        local_2c0[0x38] = (RTCHitN)auVar252[0x38];
                        local_2c0[0x39] = (RTCHitN)auVar252[0x39];
                        local_2c0[0x3a] = (RTCHitN)auVar252[0x3a];
                        local_2c0[0x3b] = (RTCHitN)auVar252[0x3b];
                        local_2c0[0x3c] = (RTCHitN)auVar252[0x3c];
                        local_2c0[0x3d] = (RTCHitN)auVar252[0x3d];
                        local_2c0[0x3e] = (RTCHitN)auVar252[0x3e];
                        local_2c0[0x3f] = (RTCHitN)auVar252[0x3f];
                        local_280 = auVar222;
                        local_180 = local_440._0_8_;
                        uStack_178 = local_440._8_8_;
                        uStack_170 = local_440._16_8_;
                        uStack_168 = local_440._24_8_;
                        uStack_160 = local_440._32_8_;
                        uStack_158 = local_440._40_8_;
                        uStack_150 = local_440._48_8_;
                        uStack_148 = local_440._56_8_;
                        auVar252 = vmovdqa64_avx512f(local_480);
                        local_140 = vmovdqa64_avx512f(auVar252);
                        auVar126 = vpcmpeqd_avx2(auVar252._0_32_,auVar252._0_32_);
                        local_810[3] = auVar126;
                        local_810[2] = auVar126;
                        local_810[1] = auVar126;
                        *local_810 = auVar126;
                        local_100 = vbroadcastss_avx512f(ZEXT416((local_848.context)->instID[0]));
                        local_c0 = vbroadcastss_avx512f(ZEXT416((local_848.context)->instPrimID[0]))
                        ;
                        auVar252 = vmovdqa64_avx512f(local_300);
                        local_780 = vmovdqa64_avx512f(auVar252);
                        local_848.valid = (int *)local_780;
                        local_848.geometryUserPtr = pGVar94->userPtr;
                        local_848.hit = local_2c0;
                        local_848.N = 0x10;
                        local_7e0 = auVar250._0_32_;
                        local_848.ray = (RTCRayN *)ray;
                        if (pGVar94->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar222 = ZEXT1664(auVar222._0_16_);
                          auVar228 = ZEXT1664(auVar228._0_16_);
                          auVar233 = ZEXT1664(auVar233._0_16_);
                          (*pGVar94->intersectionFilterN)(&local_848);
                          auVar235 = ZEXT3264(local_800);
                          auVar250 = ZEXT3264(local_7e0);
                          auVar252 = vmovdqa64_avx512f(local_780);
                          pGVar94 = local_818;
                        }
                        uVar184 = vptestmd_avx512f(auVar252,auVar252);
                        if ((short)uVar184 == 0) {
LAB_01bbd37d:
                          *(int *)(ray + k * 4 + 0x200) = auVar250._0_4_;
                        }
                        else {
                          p_Var12 = context->args->filter;
                          if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar94->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar222 = ZEXT1664(auVar222._0_16_);
                            auVar228 = ZEXT1664(auVar228._0_16_);
                            auVar233 = ZEXT1664(auVar233._0_16_);
                            (*p_Var12)(&local_848);
                            auVar235 = ZEXT3264(local_800);
                            auVar250 = ZEXT3264(local_7e0);
                            auVar252 = vmovdqa64_avx512f(local_780);
                            pGVar94 = local_818;
                          }
                          uVar36 = vptestmd_avx512f(auVar252,auVar252);
                          if ((short)uVar36 == 0) goto LAB_01bbd37d;
                          iVar1 = *(int *)(local_848.hit + 4);
                          iVar2 = *(int *)(local_848.hit + 8);
                          iVar73 = *(int *)(local_848.hit + 0xc);
                          iVar74 = *(int *)(local_848.hit + 0x10);
                          iVar75 = *(int *)(local_848.hit + 0x14);
                          iVar76 = *(int *)(local_848.hit + 0x18);
                          iVar77 = *(int *)(local_848.hit + 0x1c);
                          iVar78 = *(int *)(local_848.hit + 0x20);
                          iVar79 = *(int *)(local_848.hit + 0x24);
                          iVar80 = *(int *)(local_848.hit + 0x28);
                          iVar81 = *(int *)(local_848.hit + 0x2c);
                          iVar82 = *(int *)(local_848.hit + 0x30);
                          iVar83 = *(int *)(local_848.hit + 0x34);
                          iVar84 = *(int *)(local_848.hit + 0x38);
                          iVar85 = *(int *)(local_848.hit + 0x3c);
                          bVar97 = (byte)uVar36;
                          bVar13 = (bool)((byte)(uVar36 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar36 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar36 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar36 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar36 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar36 >> 6) & 1);
                          bVar19 = (bool)((byte)(uVar36 >> 7) & 1);
                          bVar88 = (byte)(uVar36 >> 8);
                          bVar20 = (bool)((byte)(uVar36 >> 9) & 1);
                          bVar21 = (bool)((byte)(uVar36 >> 10) & 1);
                          bVar22 = (bool)((byte)(uVar36 >> 0xb) & 1);
                          bVar23 = (bool)((byte)(uVar36 >> 0xc) & 1);
                          bVar24 = (bool)((byte)(uVar36 >> 0xd) & 1);
                          bVar25 = (bool)((byte)(uVar36 >> 0xe) & 1);
                          bVar26 = SUB81(uVar36 >> 0xf,0);
                          *(uint *)(local_848.ray + 0x300) =
                               (uint)(bVar97 & 1) * *(int *)local_848.hit |
                               (uint)!(bool)(bVar97 & 1) * *(int *)(local_848.ray + 0x300);
                          *(uint *)(local_848.ray + 0x304) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_848.ray + 0x304);
                          *(uint *)(local_848.ray + 0x308) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_848.ray + 0x308);
                          *(uint *)(local_848.ray + 0x30c) =
                               (uint)bVar15 * iVar73 |
                               (uint)!bVar15 * *(int *)(local_848.ray + 0x30c);
                          *(uint *)(local_848.ray + 0x310) =
                               (uint)bVar16 * iVar74 |
                               (uint)!bVar16 * *(int *)(local_848.ray + 0x310);
                          *(uint *)(local_848.ray + 0x314) =
                               (uint)bVar17 * iVar75 |
                               (uint)!bVar17 * *(int *)(local_848.ray + 0x314);
                          *(uint *)(local_848.ray + 0x318) =
                               (uint)bVar18 * iVar76 |
                               (uint)!bVar18 * *(int *)(local_848.ray + 0x318);
                          *(uint *)(local_848.ray + 0x31c) =
                               (uint)bVar19 * iVar77 |
                               (uint)!bVar19 * *(int *)(local_848.ray + 0x31c);
                          *(uint *)(local_848.ray + 800) =
                               (uint)(bVar88 & 1) * iVar78 |
                               (uint)!(bool)(bVar88 & 1) * *(int *)(local_848.ray + 800);
                          *(uint *)(local_848.ray + 0x324) =
                               (uint)bVar20 * iVar79 |
                               (uint)!bVar20 * *(int *)(local_848.ray + 0x324);
                          *(uint *)(local_848.ray + 0x328) =
                               (uint)bVar21 * iVar80 |
                               (uint)!bVar21 * *(int *)(local_848.ray + 0x328);
                          *(uint *)(local_848.ray + 0x32c) =
                               (uint)bVar22 * iVar81 |
                               (uint)!bVar22 * *(int *)(local_848.ray + 0x32c);
                          *(uint *)(local_848.ray + 0x330) =
                               (uint)bVar23 * iVar82 |
                               (uint)!bVar23 * *(int *)(local_848.ray + 0x330);
                          *(uint *)(local_848.ray + 0x334) =
                               (uint)bVar24 * iVar83 |
                               (uint)!bVar24 * *(int *)(local_848.ray + 0x334);
                          *(uint *)(local_848.ray + 0x338) =
                               (uint)bVar25 * iVar84 |
                               (uint)!bVar25 * *(int *)(local_848.ray + 0x338);
                          *(uint *)(local_848.ray + 0x33c) =
                               (uint)bVar26 * iVar85 |
                               (uint)!bVar26 * *(int *)(local_848.ray + 0x33c);
                          iVar1 = *(int *)(local_848.hit + 0x44);
                          iVar2 = *(int *)(local_848.hit + 0x48);
                          iVar73 = *(int *)(local_848.hit + 0x4c);
                          iVar74 = *(int *)(local_848.hit + 0x50);
                          iVar75 = *(int *)(local_848.hit + 0x54);
                          iVar76 = *(int *)(local_848.hit + 0x58);
                          iVar77 = *(int *)(local_848.hit + 0x5c);
                          iVar78 = *(int *)(local_848.hit + 0x60);
                          iVar79 = *(int *)(local_848.hit + 100);
                          iVar80 = *(int *)(local_848.hit + 0x68);
                          iVar81 = *(int *)(local_848.hit + 0x6c);
                          iVar82 = *(int *)(local_848.hit + 0x70);
                          iVar83 = *(int *)(local_848.hit + 0x74);
                          iVar84 = *(int *)(local_848.hit + 0x78);
                          iVar85 = *(int *)(local_848.hit + 0x7c);
                          bVar13 = (bool)((byte)(uVar36 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar36 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar36 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar36 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar36 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar36 >> 6) & 1);
                          bVar19 = (bool)((byte)(uVar36 >> 7) & 1);
                          bVar20 = (bool)((byte)(uVar36 >> 9) & 1);
                          bVar21 = (bool)((byte)(uVar36 >> 10) & 1);
                          bVar22 = (bool)((byte)(uVar36 >> 0xb) & 1);
                          bVar23 = (bool)((byte)(uVar36 >> 0xc) & 1);
                          bVar24 = (bool)((byte)(uVar36 >> 0xd) & 1);
                          bVar25 = (bool)((byte)(uVar36 >> 0xe) & 1);
                          bVar26 = SUB81(uVar36 >> 0xf,0);
                          *(uint *)(local_848.ray + 0x340) =
                               (uint)(bVar97 & 1) * *(int *)(local_848.hit + 0x40) |
                               (uint)!(bool)(bVar97 & 1) * *(int *)(local_848.ray + 0x340);
                          *(uint *)(local_848.ray + 0x344) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_848.ray + 0x344);
                          *(uint *)(local_848.ray + 0x348) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_848.ray + 0x348);
                          *(uint *)(local_848.ray + 0x34c) =
                               (uint)bVar15 * iVar73 |
                               (uint)!bVar15 * *(int *)(local_848.ray + 0x34c);
                          *(uint *)(local_848.ray + 0x350) =
                               (uint)bVar16 * iVar74 |
                               (uint)!bVar16 * *(int *)(local_848.ray + 0x350);
                          *(uint *)(local_848.ray + 0x354) =
                               (uint)bVar17 * iVar75 |
                               (uint)!bVar17 * *(int *)(local_848.ray + 0x354);
                          *(uint *)(local_848.ray + 0x358) =
                               (uint)bVar18 * iVar76 |
                               (uint)!bVar18 * *(int *)(local_848.ray + 0x358);
                          *(uint *)(local_848.ray + 0x35c) =
                               (uint)bVar19 * iVar77 |
                               (uint)!bVar19 * *(int *)(local_848.ray + 0x35c);
                          *(uint *)(local_848.ray + 0x360) =
                               (uint)(bVar88 & 1) * iVar78 |
                               (uint)!(bool)(bVar88 & 1) * *(int *)(local_848.ray + 0x360);
                          *(uint *)(local_848.ray + 0x364) =
                               (uint)bVar20 * iVar79 |
                               (uint)!bVar20 * *(int *)(local_848.ray + 0x364);
                          *(uint *)(local_848.ray + 0x368) =
                               (uint)bVar21 * iVar80 |
                               (uint)!bVar21 * *(int *)(local_848.ray + 0x368);
                          *(uint *)(local_848.ray + 0x36c) =
                               (uint)bVar22 * iVar81 |
                               (uint)!bVar22 * *(int *)(local_848.ray + 0x36c);
                          *(uint *)(local_848.ray + 0x370) =
                               (uint)bVar23 * iVar82 |
                               (uint)!bVar23 * *(int *)(local_848.ray + 0x370);
                          *(uint *)(local_848.ray + 0x374) =
                               (uint)bVar24 * iVar83 |
                               (uint)!bVar24 * *(int *)(local_848.ray + 0x374);
                          *(uint *)(local_848.ray + 0x378) =
                               (uint)bVar25 * iVar84 |
                               (uint)!bVar25 * *(int *)(local_848.ray + 0x378);
                          *(uint *)(local_848.ray + 0x37c) =
                               (uint)bVar26 * iVar85 |
                               (uint)!bVar26 * *(int *)(local_848.ray + 0x37c);
                          iVar1 = *(int *)(local_848.hit + 0x84);
                          iVar2 = *(int *)(local_848.hit + 0x88);
                          iVar73 = *(int *)(local_848.hit + 0x8c);
                          iVar74 = *(int *)(local_848.hit + 0x90);
                          iVar75 = *(int *)(local_848.hit + 0x94);
                          iVar76 = *(int *)(local_848.hit + 0x98);
                          iVar77 = *(int *)(local_848.hit + 0x9c);
                          iVar78 = *(int *)(local_848.hit + 0xa0);
                          iVar79 = *(int *)(local_848.hit + 0xa4);
                          iVar80 = *(int *)(local_848.hit + 0xa8);
                          iVar81 = *(int *)(local_848.hit + 0xac);
                          iVar82 = *(int *)(local_848.hit + 0xb0);
                          iVar83 = *(int *)(local_848.hit + 0xb4);
                          iVar84 = *(int *)(local_848.hit + 0xb8);
                          iVar85 = *(int *)(local_848.hit + 0xbc);
                          bVar13 = (bool)((byte)(uVar36 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar36 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar36 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar36 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar36 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar36 >> 6) & 1);
                          bVar19 = (bool)((byte)(uVar36 >> 7) & 1);
                          bVar20 = (bool)((byte)(uVar36 >> 9) & 1);
                          bVar21 = (bool)((byte)(uVar36 >> 10) & 1);
                          bVar22 = (bool)((byte)(uVar36 >> 0xb) & 1);
                          bVar23 = (bool)((byte)(uVar36 >> 0xc) & 1);
                          bVar24 = (bool)((byte)(uVar36 >> 0xd) & 1);
                          bVar25 = (bool)((byte)(uVar36 >> 0xe) & 1);
                          bVar26 = SUB81(uVar36 >> 0xf,0);
                          *(uint *)(local_848.ray + 0x380) =
                               (uint)(bVar97 & 1) * *(int *)(local_848.hit + 0x80) |
                               (uint)!(bool)(bVar97 & 1) * *(int *)(local_848.ray + 0x380);
                          *(uint *)(local_848.ray + 900) =
                               (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_848.ray + 900);
                          *(uint *)(local_848.ray + 0x388) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_848.ray + 0x388);
                          *(uint *)(local_848.ray + 0x38c) =
                               (uint)bVar15 * iVar73 |
                               (uint)!bVar15 * *(int *)(local_848.ray + 0x38c);
                          *(uint *)(local_848.ray + 0x390) =
                               (uint)bVar16 * iVar74 |
                               (uint)!bVar16 * *(int *)(local_848.ray + 0x390);
                          *(uint *)(local_848.ray + 0x394) =
                               (uint)bVar17 * iVar75 |
                               (uint)!bVar17 * *(int *)(local_848.ray + 0x394);
                          *(uint *)(local_848.ray + 0x398) =
                               (uint)bVar18 * iVar76 |
                               (uint)!bVar18 * *(int *)(local_848.ray + 0x398);
                          *(uint *)(local_848.ray + 0x39c) =
                               (uint)bVar19 * iVar77 |
                               (uint)!bVar19 * *(int *)(local_848.ray + 0x39c);
                          *(uint *)(local_848.ray + 0x3a0) =
                               (uint)(bVar88 & 1) * iVar78 |
                               (uint)!(bool)(bVar88 & 1) * *(int *)(local_848.ray + 0x3a0);
                          *(uint *)(local_848.ray + 0x3a4) =
                               (uint)bVar20 * iVar79 |
                               (uint)!bVar20 * *(int *)(local_848.ray + 0x3a4);
                          *(uint *)(local_848.ray + 0x3a8) =
                               (uint)bVar21 * iVar80 |
                               (uint)!bVar21 * *(int *)(local_848.ray + 0x3a8);
                          *(uint *)(local_848.ray + 0x3ac) =
                               (uint)bVar22 * iVar81 |
                               (uint)!bVar22 * *(int *)(local_848.ray + 0x3ac);
                          *(uint *)(local_848.ray + 0x3b0) =
                               (uint)bVar23 * iVar82 |
                               (uint)!bVar23 * *(int *)(local_848.ray + 0x3b0);
                          *(uint *)(local_848.ray + 0x3b4) =
                               (uint)bVar24 * iVar83 |
                               (uint)!bVar24 * *(int *)(local_848.ray + 0x3b4);
                          *(uint *)(local_848.ray + 0x3b8) =
                               (uint)bVar25 * iVar84 |
                               (uint)!bVar25 * *(int *)(local_848.ray + 0x3b8);
                          *(uint *)(local_848.ray + 0x3bc) =
                               (uint)bVar26 * iVar85 |
                               (uint)!bVar26 * *(int *)(local_848.ray + 0x3bc);
                          iVar1 = *(int *)(local_848.hit + 0xc4);
                          iVar2 = *(int *)(local_848.hit + 200);
                          iVar73 = *(int *)(local_848.hit + 0xcc);
                          iVar74 = *(int *)(local_848.hit + 0xd0);
                          iVar75 = *(int *)(local_848.hit + 0xd4);
                          iVar76 = *(int *)(local_848.hit + 0xd8);
                          iVar77 = *(int *)(local_848.hit + 0xdc);
                          iVar78 = *(int *)(local_848.hit + 0xe0);
                          iVar79 = *(int *)(local_848.hit + 0xe4);
                          iVar80 = *(int *)(local_848.hit + 0xe8);
                          iVar81 = *(int *)(local_848.hit + 0xec);
                          iVar82 = *(int *)(local_848.hit + 0xf0);
                          iVar83 = *(int *)(local_848.hit + 0xf4);
                          iVar84 = *(int *)(local_848.hit + 0xf8);
                          iVar85 = *(int *)(local_848.hit + 0xfc);
                          bVar13 = (bool)((byte)(uVar36 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar36 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar36 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar36 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar36 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar36 >> 6) & 1);
                          bVar19 = (bool)((byte)(uVar36 >> 7) & 1);
                          bVar20 = (bool)((byte)(uVar36 >> 9) & 1);
                          bVar21 = (bool)((byte)(uVar36 >> 10) & 1);
                          bVar22 = (bool)((byte)(uVar36 >> 0xb) & 1);
                          bVar23 = (bool)((byte)(uVar36 >> 0xc) & 1);
                          bVar24 = (bool)((byte)(uVar36 >> 0xd) & 1);
                          bVar25 = (bool)((byte)(uVar36 >> 0xe) & 1);
                          bVar26 = SUB81(uVar36 >> 0xf,0);
                          *(uint *)(local_848.ray + 0x3c0) =
                               (uint)(bVar97 & 1) * *(int *)(local_848.hit + 0xc0) |
                               (uint)!(bool)(bVar97 & 1) * *(int *)(local_848.ray + 0x3c0);
                          *(uint *)(local_848.ray + 0x3c4) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_848.ray + 0x3c4);
                          *(uint *)(local_848.ray + 0x3c8) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_848.ray + 0x3c8);
                          *(uint *)(local_848.ray + 0x3cc) =
                               (uint)bVar15 * iVar73 |
                               (uint)!bVar15 * *(int *)(local_848.ray + 0x3cc);
                          *(uint *)(local_848.ray + 0x3d0) =
                               (uint)bVar16 * iVar74 |
                               (uint)!bVar16 * *(int *)(local_848.ray + 0x3d0);
                          *(uint *)(local_848.ray + 0x3d4) =
                               (uint)bVar17 * iVar75 |
                               (uint)!bVar17 * *(int *)(local_848.ray + 0x3d4);
                          *(uint *)(local_848.ray + 0x3d8) =
                               (uint)bVar18 * iVar76 |
                               (uint)!bVar18 * *(int *)(local_848.ray + 0x3d8);
                          *(uint *)(local_848.ray + 0x3dc) =
                               (uint)bVar19 * iVar77 |
                               (uint)!bVar19 * *(int *)(local_848.ray + 0x3dc);
                          *(uint *)(local_848.ray + 0x3e0) =
                               (uint)(bVar88 & 1) * iVar78 |
                               (uint)!(bool)(bVar88 & 1) * *(int *)(local_848.ray + 0x3e0);
                          *(uint *)(local_848.ray + 0x3e4) =
                               (uint)bVar20 * iVar79 |
                               (uint)!bVar20 * *(int *)(local_848.ray + 0x3e4);
                          *(uint *)(local_848.ray + 1000) =
                               (uint)bVar21 * iVar80 |
                               (uint)!bVar21 * *(int *)(local_848.ray + 1000);
                          *(uint *)(local_848.ray + 0x3ec) =
                               (uint)bVar22 * iVar81 |
                               (uint)!bVar22 * *(int *)(local_848.ray + 0x3ec);
                          *(uint *)(local_848.ray + 0x3f0) =
                               (uint)bVar23 * iVar82 |
                               (uint)!bVar23 * *(int *)(local_848.ray + 0x3f0);
                          *(uint *)(local_848.ray + 0x3f4) =
                               (uint)bVar24 * iVar83 |
                               (uint)!bVar24 * *(int *)(local_848.ray + 0x3f4);
                          *(uint *)(local_848.ray + 0x3f8) =
                               (uint)bVar25 * iVar84 |
                               (uint)!bVar25 * *(int *)(local_848.ray + 0x3f8);
                          *(uint *)(local_848.ray + 0x3fc) =
                               (uint)bVar26 * iVar85 |
                               (uint)!bVar26 * *(int *)(local_848.ray + 0x3fc);
                          iVar1 = *(int *)(local_848.hit + 0x104);
                          iVar2 = *(int *)(local_848.hit + 0x108);
                          iVar73 = *(int *)(local_848.hit + 0x10c);
                          iVar74 = *(int *)(local_848.hit + 0x110);
                          iVar75 = *(int *)(local_848.hit + 0x114);
                          iVar76 = *(int *)(local_848.hit + 0x118);
                          iVar77 = *(int *)(local_848.hit + 0x11c);
                          iVar78 = *(int *)(local_848.hit + 0x120);
                          iVar79 = *(int *)(local_848.hit + 0x124);
                          iVar80 = *(int *)(local_848.hit + 0x128);
                          iVar81 = *(int *)(local_848.hit + 300);
                          iVar82 = *(int *)(local_848.hit + 0x130);
                          iVar83 = *(int *)(local_848.hit + 0x134);
                          iVar84 = *(int *)(local_848.hit + 0x138);
                          iVar85 = *(int *)(local_848.hit + 0x13c);
                          bVar13 = (bool)((byte)(uVar36 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar36 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar36 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar36 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar36 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar36 >> 6) & 1);
                          bVar19 = (bool)((byte)(uVar36 >> 7) & 1);
                          bVar20 = (bool)((byte)(uVar36 >> 9) & 1);
                          bVar21 = (bool)((byte)(uVar36 >> 10) & 1);
                          bVar22 = (bool)((byte)(uVar36 >> 0xb) & 1);
                          bVar23 = (bool)((byte)(uVar36 >> 0xc) & 1);
                          bVar24 = (bool)((byte)(uVar36 >> 0xd) & 1);
                          bVar25 = (bool)((byte)(uVar36 >> 0xe) & 1);
                          bVar26 = SUB81(uVar36 >> 0xf,0);
                          *(uint *)(local_848.ray + 0x400) =
                               (uint)(bVar97 & 1) * *(int *)(local_848.hit + 0x100) |
                               (uint)!(bool)(bVar97 & 1) * *(int *)(local_848.ray + 0x400);
                          *(uint *)(local_848.ray + 0x404) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_848.ray + 0x404);
                          *(uint *)(local_848.ray + 0x408) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_848.ray + 0x408);
                          *(uint *)(local_848.ray + 0x40c) =
                               (uint)bVar15 * iVar73 |
                               (uint)!bVar15 * *(int *)(local_848.ray + 0x40c);
                          *(uint *)(local_848.ray + 0x410) =
                               (uint)bVar16 * iVar74 |
                               (uint)!bVar16 * *(int *)(local_848.ray + 0x410);
                          *(uint *)(local_848.ray + 0x414) =
                               (uint)bVar17 * iVar75 |
                               (uint)!bVar17 * *(int *)(local_848.ray + 0x414);
                          *(uint *)(local_848.ray + 0x418) =
                               (uint)bVar18 * iVar76 |
                               (uint)!bVar18 * *(int *)(local_848.ray + 0x418);
                          *(uint *)(local_848.ray + 0x41c) =
                               (uint)bVar19 * iVar77 |
                               (uint)!bVar19 * *(int *)(local_848.ray + 0x41c);
                          *(uint *)(local_848.ray + 0x420) =
                               (uint)(bVar88 & 1) * iVar78 |
                               (uint)!(bool)(bVar88 & 1) * *(int *)(local_848.ray + 0x420);
                          *(uint *)(local_848.ray + 0x424) =
                               (uint)bVar20 * iVar79 |
                               (uint)!bVar20 * *(int *)(local_848.ray + 0x424);
                          *(uint *)(local_848.ray + 0x428) =
                               (uint)bVar21 * iVar80 |
                               (uint)!bVar21 * *(int *)(local_848.ray + 0x428);
                          *(uint *)(local_848.ray + 0x42c) =
                               (uint)bVar22 * iVar81 |
                               (uint)!bVar22 * *(int *)(local_848.ray + 0x42c);
                          *(uint *)(local_848.ray + 0x430) =
                               (uint)bVar23 * iVar82 |
                               (uint)!bVar23 * *(int *)(local_848.ray + 0x430);
                          *(uint *)(local_848.ray + 0x434) =
                               (uint)bVar24 * iVar83 |
                               (uint)!bVar24 * *(int *)(local_848.ray + 0x434);
                          *(uint *)(local_848.ray + 0x438) =
                               (uint)bVar25 * iVar84 |
                               (uint)!bVar25 * *(int *)(local_848.ray + 0x438);
                          *(uint *)(local_848.ray + 0x43c) =
                               (uint)bVar26 * iVar85 |
                               (uint)!bVar26 * *(int *)(local_848.ray + 0x43c);
                          auVar252 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_848.hit + 0x140)
                                                      );
                          auVar252 = vmovdqu32_avx512f(auVar252);
                          *(undefined1 (*) [64])(local_848.ray + 0x440) = auVar252;
                          auVar252 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_848.hit + 0x180)
                                                      );
                          auVar252 = vmovdqu32_avx512f(auVar252);
                          *(undefined1 (*) [64])(local_848.ray + 0x480) = auVar252;
                          auVar252 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_848.hit + 0x1c0)
                                                      );
                          auVar252 = vmovdqa32_avx512f(auVar252);
                          *(undefined1 (*) [64])(local_848.ray + 0x4c0) = auVar252;
                          auVar252 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_848.hit + 0x200)
                                                      );
                          auVar252 = vmovdqa32_avx512f(auVar252);
                          *(undefined1 (*) [64])(local_848.ray + 0x500) = auVar252;
                          auVar250 = ZEXT464(*(uint *)(ray + k * 4 + 0x200));
                        }
                        bVar97 = ~(byte)(1 << ((uint)uVar89 & 0x1f)) & (byte)uVar98;
                        uVar163 = auVar250._0_4_;
                        auVar175._4_4_ = uVar163;
                        auVar175._0_4_ = uVar163;
                        auVar175._8_4_ = uVar163;
                        auVar175._12_4_ = uVar163;
                        auVar175._16_4_ = uVar163;
                        auVar175._20_4_ = uVar163;
                        auVar175._24_4_ = uVar163;
                        auVar175._28_4_ = uVar163;
                        uVar184 = vcmpps_avx512vl(auVar235._0_32_,auVar175,2);
                        if ((bVar97 & (byte)uVar184) == 0) goto LAB_01bbd40c;
                        bVar97 = bVar97 & (byte)uVar184;
                        uVar98 = (ulong)bVar97;
                        auVar176._8_4_ = 0x7f800000;
                        auVar176._0_8_ = 0x7f8000007f800000;
                        auVar176._12_4_ = 0x7f800000;
                        auVar176._16_4_ = 0x7f800000;
                        auVar176._20_4_ = 0x7f800000;
                        auVar176._24_4_ = 0x7f800000;
                        auVar176._28_4_ = 0x7f800000;
                        auVar126 = vblendmps_avx512vl(auVar176,auVar235._0_32_);
                        auVar150._0_4_ =
                             (uint)(bVar97 & 1) * auVar126._0_4_ |
                             (uint)!(bool)(bVar97 & 1) * 0x7f800000;
                        bVar13 = (bool)(bVar97 >> 1 & 1);
                        auVar150._4_4_ = (uint)bVar13 * auVar126._4_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar97 >> 2 & 1);
                        auVar150._8_4_ = (uint)bVar13 * auVar126._8_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar97 >> 3 & 1);
                        auVar150._12_4_ =
                             (uint)bVar13 * auVar126._12_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar97 >> 4 & 1);
                        auVar150._16_4_ =
                             (uint)bVar13 * auVar126._16_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar97 >> 5 & 1);
                        auVar150._20_4_ =
                             (uint)bVar13 * auVar126._20_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar97 >> 6 & 1);
                        auVar150._24_4_ =
                             (uint)bVar13 * auVar126._24_4_ | (uint)!bVar13 * 0x7f800000;
                        auVar150._28_4_ =
                             (uint)(bVar97 >> 7) * auVar126._28_4_ |
                             (uint)!(bool)(bVar97 >> 7) * 0x7f800000;
                        auVar126 = vshufps_avx(auVar150,auVar150,0xb1);
                        auVar126 = vminps_avx(auVar150,auVar126);
                        auVar127 = vshufpd_avx(auVar126,auVar126,5);
                        auVar126 = vminps_avx(auVar126,auVar127);
                        auVar127 = vpermpd_avx2(auVar126,0x4e);
                        auVar126 = vminps_avx(auVar126,auVar127);
                        uVar184 = vcmpps_avx512vl(auVar150,auVar126,0);
                        bVar88 = (byte)uVar184 & bVar97;
                        if (bVar88 != 0) {
                          bVar97 = bVar88;
                        }
                        uVar90 = 0;
                        for (uVar91 = (uint)bVar97; (uVar91 & 1) == 0;
                            uVar91 = uVar91 >> 1 | 0x80000000) {
                          uVar90 = uVar90 + 1;
                        }
                        uVar89 = (ulong)uVar90;
                        pGVar87 = local_818;
                      } while( true );
                    }
                    fVar191 = local_580[uVar89];
                    uVar163 = *(undefined4 *)(local_560 + uVar89 * 4);
                    fVar236 = 1.0 - fVar191;
                    auVar40._8_4_ = 0x80000000;
                    auVar40._0_8_ = 0x8000000080000000;
                    auVar40._12_4_ = 0x80000000;
                    auVar108 = vxorps_avx512vl(ZEXT416((uint)fVar236),auVar40);
                    auVar101 = ZEXT416((uint)(fVar191 * fVar236 * 4.0));
                    auVar102 = vfnmsub213ss_fma(ZEXT416((uint)fVar191),ZEXT416((uint)fVar191),
                                                auVar101);
                    auVar101 = vfmadd213ss_fma(ZEXT416((uint)fVar236),ZEXT416((uint)fVar236),
                                               auVar101);
                    fVar236 = fVar236 * auVar108._0_4_ * 0.5;
                    fVar237 = auVar102._0_4_ * 0.5;
                    auVar228 = ZEXT464((uint)fVar237);
                    fVar183 = auVar101._0_4_ * 0.5;
                    fVar190 = fVar191 * fVar191 * 0.5;
                    auVar214._0_4_ = fVar190 * fVar162;
                    auVar214._4_4_ = fVar190 * fVar180;
                    auVar214._8_4_ = fVar190 * fVar181;
                    auVar214._12_4_ = fVar190 * fVar182;
                    auVar199._4_4_ = fVar183;
                    auVar199._0_4_ = fVar183;
                    auVar199._8_4_ = fVar183;
                    auVar199._12_4_ = fVar183;
                    auVar101 = vfmadd132ps_fma(auVar199,auVar214,auVar106);
                    auVar215._4_4_ = fVar237;
                    auVar215._0_4_ = fVar237;
                    auVar215._8_4_ = fVar237;
                    auVar215._12_4_ = fVar237;
                    auVar101 = vfmadd132ps_fma(auVar215,auVar101,auVar28);
                    auVar222 = ZEXT1664(auVar101);
                    auVar200._4_4_ = fVar236;
                    auVar200._0_4_ = fVar236;
                    auVar200._8_4_ = fVar236;
                    auVar200._12_4_ = fVar236;
                    auVar101 = vfmadd132ps_fma(auVar200,auVar101,auVar27);
                    *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_540 + uVar89 * 4);
                    *(int *)(ray + k * 4 + 0x300) = auVar101._0_4_;
                    uVar9 = vextractps_avx(auVar101,1);
                    *(undefined4 *)(ray + k * 4 + 0x340) = uVar9;
                    uVar9 = vextractps_avx(auVar101,2);
                    *(undefined4 *)(ray + k * 4 + 0x380) = uVar9;
                    *(float *)(ray + k * 4 + 0x3c0) = fVar191;
                    *(undefined4 *)(ray + k * 4 + 0x400) = uVar163;
                    *(uint *)(ray + k * 4 + 0x440) = uVar7;
                    *(uint *)(ray + k * 4 + 0x480) = uVar95;
                    *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_01bbd045;
      }
LAB_01bbc6b0:
      uVar163 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar39._4_4_ = uVar163;
      auVar39._0_4_ = uVar163;
      auVar39._8_4_ = uVar163;
      auVar39._12_4_ = uVar163;
      uVar184 = vcmpps_avx512vl(local_510,auVar39,2);
      uVar95 = (uint)uVar96 & (uint)uVar96 + 0xf & (uint)uVar184;
      uVar96 = (ulong)uVar95;
    } while (uVar95 != 0);
  }
  return;
LAB_01bbd40c:
  auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar252 = ZEXT1664(auVar101);
  auVar179 = ZEXT464(0xbf800000);
LAB_01bbd045:
  lVar92 = lVar92 + 8;
  if (iVar8 <= (int)lVar92) goto LAB_01bbc6b0;
  goto LAB_01bbc762;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }